

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersector1<4>::
     intersect_t<embree::avx::RibbonCurve1Intersector1<embree::CatmullRomCurveT,8>,embree::avx::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [28];
  undefined1 (*pauVar10) [32];
  undefined4 uVar11;
  undefined8 uVar12;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar13;
  Primitive PVar14;
  uint uVar15;
  __int_type_conflict _Var16;
  long lVar17;
  RTCFilterFunctionN p_Var18;
  uint uVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [28];
  undefined1 auVar117 [28];
  undefined1 auVar118 [28];
  undefined1 auVar119 [28];
  undefined1 auVar120 [28];
  undefined1 auVar121 [24];
  uint uVar122;
  uint uVar123;
  uint uVar124;
  ulong uVar125;
  uint uVar126;
  long lVar127;
  RayHit *pRVar128;
  long lVar129;
  ulong uVar130;
  Geometry *pGVar131;
  float fVar132;
  float fVar149;
  float fVar151;
  vint4 bi_1;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar154;
  float fVar155;
  float fVar157;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  float fVar150;
  float fVar152;
  float fVar153;
  float fVar156;
  float fVar158;
  float fVar159;
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [64];
  float fVar160;
  float fVar176;
  float fVar178;
  vint4 bi;
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  float fVar180;
  float fVar182;
  float fVar184;
  float fVar186;
  float fVar187;
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  float fVar177;
  float fVar179;
  float fVar181;
  float fVar185;
  undefined1 auVar171 [32];
  float fVar183;
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [64];
  float fVar188;
  float fVar200;
  float fVar201;
  vint4 bi_2;
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar202;
  float fVar203;
  undefined1 auVar199 [32];
  float fVar204;
  float fVar216;
  float fVar219;
  vint4 ai_1;
  undefined1 auVar206 [16];
  float fVar222;
  undefined1 auVar207 [16];
  float fVar205;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar224;
  float fVar225;
  float fVar227;
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  float fVar217;
  float fVar218;
  float fVar220;
  float fVar221;
  float fVar223;
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  float fVar226;
  undefined1 auVar214 [32];
  undefined1 auVar215 [64];
  float fVar228;
  float fVar229;
  float fVar230;
  float fVar240;
  float fVar242;
  vint4 ai_2;
  undefined1 auVar231 [16];
  float fVar243;
  undefined1 auVar232 [16];
  float fVar241;
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  float fVar244;
  float fVar245;
  undefined1 auVar239 [32];
  float fVar246;
  float fVar247;
  float fVar251;
  float fVar253;
  undefined1 auVar248 [16];
  float fVar255;
  undefined1 auVar249 [16];
  float fVar252;
  float fVar254;
  float fVar256;
  undefined1 auVar250 [32];
  float fVar257;
  float fVar265;
  float fVar266;
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  float fVar267;
  float fVar271;
  undefined1 auVar264 [32];
  float fVar272;
  float fVar281;
  vint4 ai;
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  float fVar283;
  undefined1 auVar278 [32];
  float fVar282;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [64];
  undefined1 auVar291 [16];
  float fVar299;
  float fVar300;
  float fVar301;
  undefined1 auVar292 [32];
  float fVar302;
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar303 [16];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  float fVar308;
  undefined1 auVar307 [16];
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar321;
  undefined1 auVar313 [16];
  float fVar324;
  float fVar325;
  undefined1 auVar315 [32];
  float fVar322;
  float fVar323;
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  float fVar326;
  float fVar330;
  float fVar332;
  undefined1 auVar327 [16];
  float fVar331;
  float fVar333;
  float fVar334;
  float fVar335;
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  float fVar336;
  float fVar337;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  undefined1 auVar339 [32];
  float fVar344;
  float fVar345;
  float fVar349;
  float fVar350;
  float fVar351;
  float fVar352;
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::CatmullRomCurveT<embree::Vec3fx>,_8> bhit;
  int local_7bc;
  RayHit *local_7b8;
  ulong local_7b0;
  ulong local_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [8];
  undefined8 uStack_778;
  Primitive *local_770;
  Precalculations *local_768;
  RTCFilterFunctionNArguments local_760;
  undefined1 local_730 [8];
  undefined8 uStack_728;
  undefined1 local_720 [8];
  undefined8 uStack_718;
  undefined1 local_710 [8];
  undefined8 uStack_708;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [48];
  undefined8 local_670;
  undefined4 local_668;
  float local_664;
  undefined4 local_660;
  undefined4 local_65c;
  undefined4 local_658;
  uint local_654;
  uint local_650;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined1 local_580 [32];
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  undefined1 auStack_550 [8];
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  undefined1 auStack_4d0 [8];
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [2] [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  float local_420;
  float fStack_41c;
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [32];
  undefined1 local_300 [8];
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  uint local_220;
  uint local_21c;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined1 local_1e0 [16];
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [8];
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float fStack_64;
  undefined1 auVar233 [16];
  undefined1 auVar314 [16];
  undefined1 auVar338 [16];
  undefined1 auVar346 [16];
  
  local_768 = pre;
  PVar14 = prim[1];
  uVar125 = (ulong)(byte)PVar14;
  lVar20 = uVar125 * 0x25;
  fVar272 = *(float *)(prim + lVar20 + 0x12);
  auVar166 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar20 + 6));
  auVar161._0_4_ = fVar272 * auVar166._0_4_;
  auVar161._4_4_ = fVar272 * auVar166._4_4_;
  auVar161._8_4_ = fVar272 * auVar166._8_4_;
  auVar161._12_4_ = fVar272 * auVar166._12_4_;
  auVar273._0_4_ = fVar272 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar273._4_4_ = fVar272 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar273._8_4_ = fVar272 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar273._12_4_ = fVar272 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar166 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 4 + 6)));
  auVar166 = vcvtdq2ps_avx(auVar166);
  auVar195 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 5 + 6)));
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar196 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 6 + 6)));
  auVar196 = vcvtdq2ps_avx(auVar196);
  auVar208 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0xf + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar14 * 0x10 + 6)));
  auVar208 = vcvtdq2ps_avx(auVar208);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar14 * 0x10 + uVar125 + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x1a + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar24 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x1b + 6)));
  auVar24 = vcvtdq2ps_avx(auVar24);
  auVar25 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar125 * 0x1c + 6)));
  auVar25 = vcvtdq2ps_avx(auVar25);
  auVar26 = vshufps_avx(auVar273,auVar273,0);
  auVar27 = vshufps_avx(auVar273,auVar273,0x55);
  auVar28 = vshufps_avx(auVar273,auVar273,0xaa);
  fVar272 = auVar28._0_4_;
  fVar176 = auVar28._4_4_;
  fVar178 = auVar28._8_4_;
  fVar322 = auVar28._12_4_;
  fVar228 = auVar27._0_4_;
  fVar240 = auVar27._4_4_;
  fVar242 = auVar27._8_4_;
  fVar243 = auVar27._12_4_;
  fVar204 = auVar26._0_4_;
  fVar216 = auVar26._4_4_;
  fVar219 = auVar26._8_4_;
  fVar222 = auVar26._12_4_;
  auVar313._0_4_ = fVar204 * auVar166._0_4_ + fVar228 * auVar195._0_4_ + fVar272 * auVar196._0_4_;
  auVar313._4_4_ = fVar216 * auVar166._4_4_ + fVar240 * auVar195._4_4_ + fVar176 * auVar196._4_4_;
  auVar313._8_4_ = fVar219 * auVar166._8_4_ + fVar242 * auVar195._8_4_ + fVar178 * auVar196._8_4_;
  auVar313._12_4_ =
       fVar222 * auVar166._12_4_ + fVar243 * auVar195._12_4_ + fVar322 * auVar196._12_4_;
  auVar327._0_4_ = fVar204 * auVar208._0_4_ + fVar228 * auVar21._0_4_ + auVar22._0_4_ * fVar272;
  auVar327._4_4_ = fVar216 * auVar208._4_4_ + fVar240 * auVar21._4_4_ + auVar22._4_4_ * fVar176;
  auVar327._8_4_ = fVar219 * auVar208._8_4_ + fVar242 * auVar21._8_4_ + auVar22._8_4_ * fVar178;
  auVar327._12_4_ = fVar222 * auVar208._12_4_ + fVar243 * auVar21._12_4_ + auVar22._12_4_ * fVar322;
  auVar274._0_4_ = fVar204 * auVar23._0_4_ + fVar228 * auVar24._0_4_ + auVar25._0_4_ * fVar272;
  auVar274._4_4_ = fVar216 * auVar23._4_4_ + fVar240 * auVar24._4_4_ + auVar25._4_4_ * fVar176;
  auVar274._8_4_ = fVar219 * auVar23._8_4_ + fVar242 * auVar24._8_4_ + auVar25._8_4_ * fVar178;
  auVar274._12_4_ = fVar222 * auVar23._12_4_ + fVar243 * auVar24._12_4_ + auVar25._12_4_ * fVar322;
  auVar26 = vshufps_avx(auVar161,auVar161,0);
  auVar27 = vshufps_avx(auVar161,auVar161,0x55);
  auVar28 = vshufps_avx(auVar161,auVar161,0xaa);
  fVar272 = auVar28._0_4_;
  fVar176 = auVar28._4_4_;
  fVar178 = auVar28._8_4_;
  fVar322 = auVar28._12_4_;
  fVar228 = auVar27._0_4_;
  fVar240 = auVar27._4_4_;
  fVar242 = auVar27._8_4_;
  fVar243 = auVar27._12_4_;
  fVar204 = auVar26._0_4_;
  fVar216 = auVar26._4_4_;
  fVar219 = auVar26._8_4_;
  fVar222 = auVar26._12_4_;
  auVar162._0_4_ = fVar204 * auVar166._0_4_ + fVar228 * auVar195._0_4_ + fVar272 * auVar196._0_4_;
  auVar162._4_4_ = fVar216 * auVar166._4_4_ + fVar240 * auVar195._4_4_ + fVar176 * auVar196._4_4_;
  auVar162._8_4_ = fVar219 * auVar166._8_4_ + fVar242 * auVar195._8_4_ + fVar178 * auVar196._8_4_;
  auVar162._12_4_ =
       fVar222 * auVar166._12_4_ + fVar243 * auVar195._12_4_ + fVar322 * auVar196._12_4_;
  auVar133._0_4_ = fVar204 * auVar208._0_4_ + auVar22._0_4_ * fVar272 + fVar228 * auVar21._0_4_;
  auVar133._4_4_ = fVar216 * auVar208._4_4_ + auVar22._4_4_ * fVar176 + fVar240 * auVar21._4_4_;
  auVar133._8_4_ = fVar219 * auVar208._8_4_ + auVar22._8_4_ * fVar178 + fVar242 * auVar21._8_4_;
  auVar133._12_4_ = fVar222 * auVar208._12_4_ + auVar22._12_4_ * fVar322 + fVar243 * auVar21._12_4_;
  auVar284._8_4_ = 0x7fffffff;
  auVar284._0_8_ = 0x7fffffff7fffffff;
  auVar284._12_4_ = 0x7fffffff;
  auVar166 = vandps_avx(auVar313,auVar284);
  auVar231._8_4_ = 0x219392ef;
  auVar231._0_8_ = 0x219392ef219392ef;
  auVar231._12_4_ = 0x219392ef;
  auVar166 = vcmpps_avx(auVar166,auVar231,1);
  auVar195 = vblendvps_avx(auVar313,auVar231,auVar166);
  auVar166 = vandps_avx(auVar327,auVar284);
  auVar166 = vcmpps_avx(auVar166,auVar231,1);
  auVar196 = vblendvps_avx(auVar327,auVar231,auVar166);
  auVar166 = vandps_avx(auVar284,auVar274);
  auVar166 = vcmpps_avx(auVar166,auVar231,1);
  auVar166 = vblendvps_avx(auVar274,auVar231,auVar166);
  auVar189._0_4_ = fVar204 * auVar23._0_4_ + fVar228 * auVar24._0_4_ + auVar25._0_4_ * fVar272;
  auVar189._4_4_ = fVar216 * auVar23._4_4_ + fVar240 * auVar24._4_4_ + auVar25._4_4_ * fVar176;
  auVar189._8_4_ = fVar219 * auVar23._8_4_ + fVar242 * auVar24._8_4_ + auVar25._8_4_ * fVar178;
  auVar189._12_4_ = fVar222 * auVar23._12_4_ + fVar243 * auVar24._12_4_ + auVar25._12_4_ * fVar322;
  auVar208 = vrcpps_avx(auVar195);
  fVar204 = auVar208._0_4_;
  auVar206._0_4_ = fVar204 * auVar195._0_4_;
  fVar216 = auVar208._4_4_;
  auVar206._4_4_ = fVar216 * auVar195._4_4_;
  fVar219 = auVar208._8_4_;
  auVar206._8_4_ = fVar219 * auVar195._8_4_;
  fVar222 = auVar208._12_4_;
  auVar206._12_4_ = fVar222 * auVar195._12_4_;
  auVar258._8_4_ = 0x3f800000;
  auVar258._0_8_ = 0x3f8000003f800000;
  auVar258._12_4_ = 0x3f800000;
  auVar195 = vsubps_avx(auVar258,auVar206);
  fVar204 = fVar204 + fVar204 * auVar195._0_4_;
  fVar216 = fVar216 + fVar216 * auVar195._4_4_;
  fVar219 = fVar219 + fVar219 * auVar195._8_4_;
  fVar222 = fVar222 + fVar222 * auVar195._12_4_;
  auVar195 = vrcpps_avx(auVar196);
  fVar228 = auVar195._0_4_;
  auVar248._0_4_ = fVar228 * auVar196._0_4_;
  fVar240 = auVar195._4_4_;
  auVar248._4_4_ = fVar240 * auVar196._4_4_;
  fVar242 = auVar195._8_4_;
  auVar248._8_4_ = fVar242 * auVar196._8_4_;
  fVar243 = auVar195._12_4_;
  auVar248._12_4_ = fVar243 * auVar196._12_4_;
  auVar195 = vsubps_avx(auVar258,auVar248);
  fVar228 = fVar228 + fVar228 * auVar195._0_4_;
  fVar240 = fVar240 + fVar240 * auVar195._4_4_;
  fVar242 = fVar242 + fVar242 * auVar195._8_4_;
  fVar243 = fVar243 + fVar243 * auVar195._12_4_;
  auVar195 = vrcpps_avx(auVar166);
  fVar246 = auVar195._0_4_;
  auVar275._0_4_ = fVar246 * auVar166._0_4_;
  fVar251 = auVar195._4_4_;
  auVar275._4_4_ = fVar251 * auVar166._4_4_;
  fVar253 = auVar195._8_4_;
  auVar275._8_4_ = fVar253 * auVar166._8_4_;
  fVar255 = auVar195._12_4_;
  auVar275._12_4_ = fVar255 * auVar166._12_4_;
  auVar166 = vsubps_avx(auVar258,auVar275);
  fVar246 = fVar246 + fVar246 * auVar166._0_4_;
  fVar251 = fVar251 + fVar251 * auVar166._4_4_;
  fVar253 = fVar253 + fVar253 * auVar166._8_4_;
  fVar255 = fVar255 + fVar255 * auVar166._12_4_;
  auVar166 = ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                            *(float *)(prim + lVar20 + 0x16)) * *(float *)(prim + lVar20 + 0x1a)));
  auVar196 = vshufps_avx(auVar166,auVar166,0);
  auVar166._8_8_ = 0;
  auVar166._0_8_ = *(ulong *)(prim + uVar125 * 7 + 6);
  auVar166 = vpmovsxwd_avx(auVar166);
  auVar166 = vcvtdq2ps_avx(auVar166);
  auVar195._8_8_ = 0;
  auVar195._0_8_ = *(ulong *)(prim + uVar125 * 0xb + 6);
  auVar195 = vpmovsxwd_avx(auVar195);
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar208 = vsubps_avx(auVar195,auVar166);
  fVar272 = auVar196._0_4_;
  fVar176 = auVar196._4_4_;
  fVar178 = auVar196._8_4_;
  fVar322 = auVar196._12_4_;
  auVar196._8_8_ = 0;
  auVar196._0_8_ = *(ulong *)(prim + uVar125 * 9 + 6);
  auVar195 = vpmovsxwd_avx(auVar196);
  auVar276._0_4_ = auVar208._0_4_ * fVar272 + auVar166._0_4_;
  auVar276._4_4_ = auVar208._4_4_ * fVar176 + auVar166._4_4_;
  auVar276._8_4_ = auVar208._8_4_ * fVar178 + auVar166._8_4_;
  auVar276._12_4_ = auVar208._12_4_ * fVar322 + auVar166._12_4_;
  auVar208._8_8_ = 0;
  auVar208._0_8_ = *(ulong *)(prim + uVar125 * 0xd + 6);
  auVar196 = vpmovsxwd_avx(auVar208);
  auVar166 = vcvtdq2ps_avx(auVar195);
  auVar195 = vcvtdq2ps_avx(auVar196);
  auVar195 = vsubps_avx(auVar195,auVar166);
  auVar285._0_4_ = auVar195._0_4_ * fVar272 + auVar166._0_4_;
  auVar285._4_4_ = auVar195._4_4_ * fVar176 + auVar166._4_4_;
  auVar285._8_4_ = auVar195._8_4_ * fVar178 + auVar166._8_4_;
  auVar285._12_4_ = auVar195._12_4_ * fVar322 + auVar166._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar125 * 0x12 + 6);
  auVar166 = vpmovsxwd_avx(auVar21);
  uVar130 = (ulong)(uint)((int)(uVar125 * 5) << 2);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar125 * 2 + uVar130 + 6);
  auVar195 = vpmovsxwd_avx(auVar22);
  auVar166 = vcvtdq2ps_avx(auVar166);
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar195 = vsubps_avx(auVar195,auVar166);
  auVar291._0_4_ = auVar195._0_4_ * fVar272 + auVar166._0_4_;
  auVar291._4_4_ = auVar195._4_4_ * fVar176 + auVar166._4_4_;
  auVar291._8_4_ = auVar195._8_4_ * fVar178 + auVar166._8_4_;
  auVar291._12_4_ = auVar195._12_4_ * fVar322 + auVar166._12_4_;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar130 + 6);
  auVar166 = vpmovsxwd_avx(auVar23);
  auVar166 = vcvtdq2ps_avx(auVar166);
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar125 * 0x18 + 6);
  auVar195 = vpmovsxwd_avx(auVar24);
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar196 = vsubps_avx(auVar195,auVar166);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + uVar125 * 0x1d + 6);
  auVar195 = vpmovsxwd_avx(auVar25);
  auVar303._0_4_ = auVar196._0_4_ * fVar272 + auVar166._0_4_;
  auVar303._4_4_ = auVar196._4_4_ * fVar176 + auVar166._4_4_;
  auVar303._8_4_ = auVar196._8_4_ * fVar178 + auVar166._8_4_;
  auVar303._12_4_ = auVar196._12_4_ * fVar322 + auVar166._12_4_;
  auVar166 = vcvtdq2ps_avx(auVar195);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + uVar125 + (ulong)(byte)PVar14 * 0x20 + 6);
  auVar195 = vpmovsxwd_avx(auVar26);
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar195 = vsubps_avx(auVar195,auVar166);
  auVar307._0_4_ = auVar195._0_4_ * fVar272 + auVar166._0_4_;
  auVar307._4_4_ = auVar195._4_4_ * fVar176 + auVar166._4_4_;
  auVar307._8_4_ = auVar195._8_4_ * fVar178 + auVar166._8_4_;
  auVar307._12_4_ = auVar195._12_4_ * fVar322 + auVar166._12_4_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar14 * 0x20 - uVar125) + 6);
  auVar166 = vpmovsxwd_avx(auVar27);
  auVar166 = vcvtdq2ps_avx(auVar166);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + uVar125 * 0x23 + 6);
  auVar195 = vpmovsxwd_avx(auVar28);
  auVar195 = vcvtdq2ps_avx(auVar195);
  auVar195 = vsubps_avx(auVar195,auVar166);
  auVar259._0_4_ = auVar166._0_4_ + auVar195._0_4_ * fVar272;
  auVar259._4_4_ = auVar166._4_4_ + auVar195._4_4_ * fVar176;
  auVar259._8_4_ = auVar166._8_4_ + auVar195._8_4_ * fVar178;
  auVar259._12_4_ = auVar166._12_4_ + auVar195._12_4_ * fVar322;
  auVar166 = vsubps_avx(auVar276,auVar162);
  auVar277._0_4_ = fVar204 * auVar166._0_4_;
  auVar277._4_4_ = fVar216 * auVar166._4_4_;
  auVar277._8_4_ = fVar219 * auVar166._8_4_;
  auVar277._12_4_ = fVar222 * auVar166._12_4_;
  auVar166 = vsubps_avx(auVar285,auVar162);
  auVar163._0_4_ = fVar204 * auVar166._0_4_;
  auVar163._4_4_ = fVar216 * auVar166._4_4_;
  auVar163._8_4_ = fVar219 * auVar166._8_4_;
  auVar163._12_4_ = fVar222 * auVar166._12_4_;
  auVar166 = vsubps_avx(auVar291,auVar133);
  auVar207._0_4_ = fVar228 * auVar166._0_4_;
  auVar207._4_4_ = fVar240 * auVar166._4_4_;
  auVar207._8_4_ = fVar242 * auVar166._8_4_;
  auVar207._12_4_ = fVar243 * auVar166._12_4_;
  auVar166 = vsubps_avx(auVar303,auVar133);
  auVar134._0_4_ = fVar228 * auVar166._0_4_;
  auVar134._4_4_ = fVar240 * auVar166._4_4_;
  auVar134._8_4_ = fVar242 * auVar166._8_4_;
  auVar134._12_4_ = fVar243 * auVar166._12_4_;
  auVar166 = vsubps_avx(auVar307,auVar189);
  auVar232._0_4_ = fVar246 * auVar166._0_4_;
  auVar232._4_4_ = fVar251 * auVar166._4_4_;
  auVar232._8_4_ = fVar253 * auVar166._8_4_;
  auVar232._12_4_ = fVar255 * auVar166._12_4_;
  auVar166 = vsubps_avx(auVar259,auVar189);
  auVar190._0_4_ = fVar246 * auVar166._0_4_;
  auVar190._4_4_ = fVar251 * auVar166._4_4_;
  auVar190._8_4_ = fVar253 * auVar166._8_4_;
  auVar190._12_4_ = fVar255 * auVar166._12_4_;
  auVar166 = vpminsd_avx(auVar277,auVar163);
  auVar195 = vpminsd_avx(auVar207,auVar134);
  auVar166 = vmaxps_avx(auVar166,auVar195);
  auVar195 = vpminsd_avx(auVar232,auVar190);
  uVar11 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar286._4_4_ = uVar11;
  auVar286._0_4_ = uVar11;
  auVar286._8_4_ = uVar11;
  auVar286._12_4_ = uVar11;
  auVar195 = vmaxps_avx(auVar195,auVar286);
  auVar166 = vmaxps_avx(auVar166,auVar195);
  local_290._0_4_ = auVar166._0_4_ * 0.99999964;
  local_290._4_4_ = auVar166._4_4_ * 0.99999964;
  local_290._8_4_ = auVar166._8_4_ * 0.99999964;
  local_290._12_4_ = auVar166._12_4_ * 0.99999964;
  auVar166 = vpmaxsd_avx(auVar277,auVar163);
  auVar195 = vpmaxsd_avx(auVar207,auVar134);
  auVar166 = vminps_avx(auVar166,auVar195);
  auVar195 = vpmaxsd_avx(auVar232,auVar190);
  fVar272 = (ray->super_RayK<1>).tfar;
  auVar191._4_4_ = fVar272;
  auVar191._0_4_ = fVar272;
  auVar191._8_4_ = fVar272;
  auVar191._12_4_ = fVar272;
  auVar195 = vminps_avx(auVar195,auVar191);
  auVar166 = vminps_avx(auVar166,auVar195);
  auVar135._0_4_ = auVar166._0_4_ * 1.0000004;
  auVar135._4_4_ = auVar166._4_4_ * 1.0000004;
  auVar135._8_4_ = auVar166._8_4_ * 1.0000004;
  auVar135._12_4_ = auVar166._12_4_ * 1.0000004;
  auVar166 = vpshufd_avx(ZEXT116((byte)PVar14),0);
  auVar195 = vpcmpgtd_avx(auVar166,_DAT_01f7fcf0);
  auVar166 = vcmpps_avx(local_290,auVar135,2);
  auVar166 = vandps_avx(auVar166,auVar195);
  uVar122 = vmovmskps_avx(auVar166);
  if (uVar122 != 0) {
    uVar122 = uVar122 & 0xff;
    local_4a0[1]._0_8_ = mm_lookupmask_ps._16_8_;
    local_4a0[1]._8_8_ = mm_lookupmask_ps._24_8_;
    local_4a0[1]._16_8_ = mm_lookupmask_ps._16_8_;
    local_4a0[1]._24_8_ = mm_lookupmask_ps._24_8_;
    local_770 = prim;
    local_7b8 = ray;
    do {
      lVar20 = 0;
      if (uVar122 != 0) {
        for (; (uVar122 >> lVar20 & 1) == 0; lVar20 = lVar20 + 1) {
        }
      }
      uVar126 = *(uint *)(prim + 2);
      uVar124 = *(uint *)(prim + lVar20 * 4 + 6);
      local_7b0 = (ulong)uVar126;
      pGVar131 = (context->scene->geometries).items[uVar126].ptr;
      local_7a8 = (ulong)uVar124;
      uVar125 = (ulong)*(uint *)(*(long *)&pGVar131->field_0x58 +
                                (ulong)uVar124 *
                                pGVar131[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar272 = (pGVar131->time_range).lower;
      fVar272 = pGVar131->fnumTimeSegments *
                (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar272) /
                ((pGVar131->time_range).upper - fVar272));
      auVar166 = vroundss_avx(ZEXT416((uint)fVar272),ZEXT416((uint)fVar272),9);
      auVar166 = vminss_avx(auVar166,ZEXT416((uint)(pGVar131->fnumTimeSegments + -1.0)));
      auVar166 = vmaxss_avx(ZEXT816(0) << 0x20,auVar166);
      fVar272 = fVar272 - auVar166._0_4_;
      _Var16 = pGVar131[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar129 = (long)(int)auVar166._0_4_ * 0x38;
      lVar20 = *(long *)(_Var16 + 0x10 + lVar129);
      lVar127 = *(long *)(_Var16 + 0x38 + lVar129);
      lVar17 = *(long *)(_Var16 + 0x48 + lVar129);
      auVar166 = vshufps_avx(ZEXT416((uint)fVar272),ZEXT416((uint)fVar272),0);
      pfVar1 = (float *)(lVar127 + uVar125 * lVar17);
      fVar176 = auVar166._0_4_;
      fVar178 = auVar166._4_4_;
      fVar322 = auVar166._8_4_;
      fVar204 = auVar166._12_4_;
      pfVar2 = (float *)(lVar127 + (uVar125 + 1) * lVar17);
      pfVar3 = (float *)(lVar127 + (uVar125 + 2) * lVar17);
      pfVar4 = (float *)(lVar127 + lVar17 * (uVar125 + 3));
      lVar127 = *(long *)(_Var16 + lVar129);
      auVar166 = vshufps_avx(ZEXT416((uint)(1.0 - fVar272)),ZEXT416((uint)(1.0 - fVar272)),0);
      pfVar5 = (float *)(lVar127 + lVar20 * uVar125);
      fVar272 = auVar166._0_4_;
      fVar216 = auVar166._4_4_;
      fVar219 = auVar166._8_4_;
      fVar222 = auVar166._12_4_;
      pfVar6 = (float *)(lVar127 + lVar20 * (uVar125 + 1));
      pfVar7 = (float *)(lVar127 + lVar20 * (uVar125 + 2));
      pfVar8 = (float *)(lVar127 + lVar20 * (uVar125 + 3));
      uVar15 = (uint)pGVar131[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar20 = (long)(int)uVar15 * 0x44;
      fVar229 = fVar176 * *pfVar1 + fVar272 * *pfVar5;
      fVar241 = fVar178 * pfVar1[1] + fVar216 * pfVar5[1];
      auVar233._0_8_ = CONCAT44(fVar241,fVar229);
      auVar233._8_4_ = fVar322 * pfVar1[2] + fVar219 * pfVar5[2];
      auVar233._12_4_ = fVar204 * pfVar1[3] + fVar222 * pfVar5[3];
      fVar312 = fVar272 * *pfVar6 + fVar176 * *pfVar2;
      fVar321 = fVar216 * pfVar6[1] + fVar178 * pfVar2[1];
      auVar314._0_8_ = CONCAT44(fVar321,fVar312);
      auVar314._8_4_ = fVar219 * pfVar6[2] + fVar322 * pfVar2[2];
      auVar314._12_4_ = fVar222 * pfVar6[3] + fVar204 * pfVar2[3];
      fVar336 = fVar272 * *pfVar7 + fVar176 * *pfVar3;
      fVar340 = fVar216 * pfVar7[1] + fVar178 * pfVar3[1];
      auVar338._0_8_ = CONCAT44(fVar340,fVar336);
      auVar338._8_4_ = fVar219 * pfVar7[2] + fVar322 * pfVar3[2];
      auVar338._12_4_ = fVar222 * pfVar7[3] + fVar204 * pfVar3[3];
      fVar344 = fVar272 * *pfVar8 + fVar176 * *pfVar4;
      fVar349 = fVar216 * pfVar8[1] + fVar178 * pfVar4[1];
      auVar346._0_8_ = CONCAT44(fVar349,fVar344);
      auVar346._8_4_ = fVar219 * pfVar8[2] + fVar322 * pfVar4[2];
      auVar346._12_4_ = fVar222 * pfVar8[3] + fVar204 * pfVar4[3];
      aVar13 = (local_7b8->super_RayK<1>).org.field_0;
      auVar196 = vsubps_avx(auVar233,(undefined1  [16])aVar13);
      _local_780 = auVar233;
      auVar166 = vshufps_avx(auVar196,auVar196,0);
      auVar195 = vshufps_avx(auVar196,auVar196,0x55);
      auVar196 = vshufps_avx(auVar196,auVar196,0xaa);
      fVar272 = (local_768->ray_space).vx.field_0.m128[0];
      fVar176 = (local_768->ray_space).vx.field_0.m128[1];
      fVar178 = (local_768->ray_space).vx.field_0.m128[2];
      fVar322 = (local_768->ray_space).vx.field_0.m128[3];
      fVar204 = (local_768->ray_space).vy.field_0.m128[0];
      fVar216 = (local_768->ray_space).vy.field_0.m128[1];
      fVar219 = (local_768->ray_space).vy.field_0.m128[2];
      fVar222 = (local_768->ray_space).vy.field_0.m128[3];
      fVar228 = (local_768->ray_space).vz.field_0.m128[0];
      fVar240 = (local_768->ray_space).vz.field_0.m128[1];
      fVar242 = (local_768->ray_space).vz.field_0.m128[2];
      fVar243 = (local_768->ray_space).vz.field_0.m128[3];
      auVar192._0_4_ =
           auVar166._0_4_ * fVar272 + auVar196._0_4_ * fVar228 + auVar195._0_4_ * fVar204;
      auVar192._4_4_ =
           auVar166._4_4_ * fVar176 + auVar196._4_4_ * fVar240 + auVar195._4_4_ * fVar216;
      auVar192._8_4_ =
           auVar166._8_4_ * fVar178 + auVar196._8_4_ * fVar242 + auVar195._8_4_ * fVar219;
      auVar192._12_4_ =
           auVar166._12_4_ * fVar322 + auVar196._12_4_ * fVar243 + auVar195._12_4_ * fVar222;
      auVar166 = vblendps_avx(auVar192,auVar233,8);
      auVar208 = vsubps_avx(auVar314,(undefined1  [16])aVar13);
      auVar195 = vshufps_avx(auVar208,auVar208,0);
      auVar196 = vshufps_avx(auVar208,auVar208,0x55);
      auVar208 = vshufps_avx(auVar208,auVar208,0xaa);
      auVar249._0_4_ =
           auVar195._0_4_ * fVar272 + auVar208._0_4_ * fVar228 + auVar196._0_4_ * fVar204;
      auVar249._4_4_ =
           auVar195._4_4_ * fVar176 + auVar208._4_4_ * fVar240 + auVar196._4_4_ * fVar216;
      auVar249._8_4_ =
           auVar195._8_4_ * fVar178 + auVar208._8_4_ * fVar242 + auVar196._8_4_ * fVar219;
      auVar249._12_4_ =
           auVar195._12_4_ * fVar322 + auVar208._12_4_ * fVar243 + auVar196._12_4_ * fVar222;
      auVar195 = vblendps_avx(auVar249,auVar314,8);
      auVar21 = vsubps_avx(auVar338,(undefined1  [16])aVar13);
      auVar196 = vshufps_avx(auVar21,auVar21,0);
      auVar208 = vshufps_avx(auVar21,auVar21,0x55);
      auVar21 = vshufps_avx(auVar21,auVar21,0xaa);
      auVar234._0_4_ = auVar196._0_4_ * fVar272 + auVar208._0_4_ * fVar204 + auVar21._0_4_ * fVar228
      ;
      auVar234._4_4_ = auVar196._4_4_ * fVar176 + auVar208._4_4_ * fVar216 + auVar21._4_4_ * fVar240
      ;
      auVar234._8_4_ = auVar196._8_4_ * fVar178 + auVar208._8_4_ * fVar219 + auVar21._8_4_ * fVar242
      ;
      auVar234._12_4_ =
           auVar196._12_4_ * fVar322 + auVar208._12_4_ * fVar222 + auVar21._12_4_ * fVar243;
      auVar196 = vblendps_avx(auVar234,auVar338,8);
      local_3a0._0_16_ = (undefined1  [16])aVar13;
      auVar22 = vsubps_avx(auVar346,(undefined1  [16])aVar13);
      auVar208 = vshufps_avx(auVar22,auVar22,0xaa);
      auVar21 = vshufps_avx(auVar22,auVar22,0);
      auVar22 = vshufps_avx(auVar22,auVar22,0x55);
      auVar164._0_4_ = auVar21._0_4_ * fVar272 + auVar208._0_4_ * fVar228 + auVar22._0_4_ * fVar204;
      auVar164._4_4_ = auVar21._4_4_ * fVar176 + auVar208._4_4_ * fVar240 + auVar22._4_4_ * fVar216;
      auVar164._8_4_ = auVar21._8_4_ * fVar178 + auVar208._8_4_ * fVar242 + auVar22._8_4_ * fVar219;
      auVar164._12_4_ =
           auVar21._12_4_ * fVar322 + auVar208._12_4_ * fVar243 + auVar22._12_4_ * fVar222;
      auVar208 = vblendps_avx(auVar164,auVar346,8);
      auVar235._8_4_ = 0x7fffffff;
      auVar235._0_8_ = 0x7fffffff7fffffff;
      auVar235._12_4_ = 0x7fffffff;
      auVar166 = vandps_avx(auVar166,auVar235);
      auVar195 = vandps_avx(auVar195,auVar235);
      auVar21 = vmaxps_avx(auVar166,auVar195);
      auVar166 = vandps_avx(auVar196,auVar235);
      auVar195 = vandps_avx(auVar208,auVar235);
      auVar166 = vmaxps_avx(auVar166,auVar195);
      auVar166 = vmaxps_avx(auVar21,auVar166);
      auVar195 = vmovshdup_avx(auVar166);
      auVar195 = vmaxss_avx(auVar195,auVar166);
      auVar166 = vshufpd_avx(auVar166,auVar166,1);
      auVar166 = vmaxss_avx(auVar166,auVar195);
      fVar218 = *(float *)(catmullrom_basis0 + lVar20 + 0x908);
      fVar281 = *(float *)(catmullrom_basis0 + lVar20 + 0x90c);
      fVar324 = *(float *)(catmullrom_basis0 + lVar20 + 0x910);
      fVar184 = *(float *)(catmullrom_basis0 + lVar20 + 0x914);
      fVar221 = *(float *)(catmullrom_basis0 + lVar20 + 0x918);
      fVar282 = *(float *)(catmullrom_basis0 + lVar20 + 0x91c);
      fVar186 = *(float *)(catmullrom_basis0 + lVar20 + 0x920);
      auVar195 = vshufps_avx(auVar234,auVar234,0);
      register0x00001250 = auVar195;
      _local_5e0 = auVar195;
      fVar222 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar20 + 0xd8c);
      fVar228 = *(float *)(catmullrom_basis0 + lVar20 + 0xd90);
      fVar242 = *(float *)(catmullrom_basis0 + lVar20 + 0xd94);
      fVar243 = *(float *)(catmullrom_basis0 + lVar20 + 0xd98);
      fVar246 = *(float *)(catmullrom_basis0 + lVar20 + 0xd9c);
      fVar251 = *(float *)(catmullrom_basis0 + lVar20 + 0xda0);
      fVar253 = *(float *)(catmullrom_basis0 + lVar20 + 0xda4);
      auVar116 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar20 + 0xd8c);
      auVar196 = vshufps_avx(auVar164,auVar164,0);
      register0x00001210 = auVar196;
      _local_3e0 = auVar196;
      fVar272 = auVar196._0_4_;
      fVar322 = auVar196._4_4_;
      fVar219 = auVar196._8_4_;
      fVar240 = auVar196._12_4_;
      fVar245 = auVar195._0_4_;
      fVar244 = auVar195._4_4_;
      fVar271 = auVar195._8_4_;
      fVar180 = auVar195._12_4_;
      auVar195 = vshufps_avx(auVar234,auVar234,0x55);
      register0x00001290 = auVar195;
      _local_6c0 = auVar195;
      auVar196 = vshufps_avx(auVar164,auVar164,0x55);
      register0x000014d0 = auVar196;
      _local_5a0 = auVar196;
      fVar179 = auVar196._0_4_;
      fVar181 = auVar196._4_4_;
      fVar182 = auVar196._8_4_;
      fVar185 = auVar196._12_4_;
      fVar188 = auVar195._0_4_;
      fVar200 = auVar195._4_4_;
      fVar201 = auVar195._8_4_;
      fVar202 = auVar195._12_4_;
      _local_720 = auVar338;
      auVar195 = vshufps_avx(auVar338,auVar338,0xff);
      register0x00001410 = auVar195;
      _local_100 = auVar195;
      _local_730 = auVar346;
      auVar196 = vshufps_avx(auVar346,auVar346,0xff);
      register0x000013d0 = auVar196;
      _local_80 = auVar196;
      fVar176 = auVar196._0_4_;
      fVar178 = auVar196._4_4_;
      fVar204 = auVar196._8_4_;
      fVar216 = auVar196._12_4_;
      fVar154 = auVar195._0_4_;
      fVar156 = auVar195._4_4_;
      fVar158 = auVar195._8_4_;
      auVar196 = vshufps_avx(auVar249,auVar249,0);
      register0x00001550 = auVar196;
      _local_700 = auVar196;
      pauVar10 = (undefined1 (*) [32])(catmullrom_basis0 + lVar20 + 0x484);
      fVar255 = *(float *)*pauVar10;
      fVar323 = *(float *)(catmullrom_basis0 + lVar20 + 0x488);
      fVar203 = *(float *)(catmullrom_basis0 + lVar20 + 0x48c);
      fVar325 = *(float *)(catmullrom_basis0 + lVar20 + 0x490);
      fVar308 = *(float *)(catmullrom_basis0 + lVar20 + 0x494);
      fVar226 = *(float *)(catmullrom_basis0 + lVar20 + 0x498);
      fVar309 = *(float *)(catmullrom_basis0 + lVar20 + 0x49c);
      auVar117 = *(undefined1 (*) [28])*pauVar10;
      fVar183 = *(float *)(catmullrom_basis0 + lVar20 + 0x4a0);
      _auStack_550 = SUB3216(*pauVar10,0x10);
      fVar326 = auVar196._0_4_;
      fVar330 = auVar196._4_4_;
      fVar332 = auVar196._8_4_;
      fVar334 = auVar196._12_4_;
      auVar196 = vshufps_avx(auVar249,auVar249,0x55);
      register0x00001350 = auVar196;
      _local_6e0 = auVar196;
      fVar247 = auVar196._0_4_;
      fVar252 = auVar196._4_4_;
      fVar254 = auVar196._8_4_;
      fVar256 = auVar196._12_4_;
      _local_710 = auVar314;
      auVar196 = vshufps_avx(auVar314,auVar314,0xff);
      register0x00001590 = auVar196;
      _local_a0 = auVar196;
      fVar299 = auVar196._0_4_;
      fVar300 = auVar196._4_4_;
      fVar301 = auVar196._8_4_;
      fVar331 = auVar196._12_4_;
      auVar196 = vshufps_avx(auVar192,auVar192,0);
      register0x000015d0 = auVar196;
      _local_360 = auVar196;
      fVar310 = *(float *)*(undefined1 (*) [28])(catmullrom_basis0 + lVar20);
      fVar283 = *(float *)(catmullrom_basis0 + lVar20 + 4);
      fVar311 = *(float *)(catmullrom_basis0 + lVar20 + 8);
      fVar257 = *(float *)(catmullrom_basis0 + lVar20 + 0xc);
      fVar265 = *(float *)(catmullrom_basis0 + lVar20 + 0x10);
      fVar266 = *(float *)(catmullrom_basis0 + lVar20 + 0x14);
      fVar267 = *(float *)(catmullrom_basis0 + lVar20 + 0x18);
      auVar118 = *(undefined1 (*) [28])(catmullrom_basis0 + lVar20);
      fVar345 = auVar196._0_4_;
      fVar350 = auVar196._4_4_;
      fVar351 = auVar196._8_4_;
      fVar352 = auVar196._12_4_;
      auVar292._0_4_ = fVar345 * fVar310 + fVar326 * fVar255 + fVar245 * fVar218 + fVar222 * fVar272
      ;
      auVar292._4_4_ = fVar350 * fVar283 + fVar330 * fVar323 + fVar244 * fVar281 + fVar228 * fVar322
      ;
      auVar292._8_4_ = fVar351 * fVar311 + fVar332 * fVar203 + fVar271 * fVar324 + fVar242 * fVar219
      ;
      auVar292._12_4_ =
           fVar352 * fVar257 + fVar334 * fVar325 + fVar180 * fVar184 + fVar243 * fVar240;
      auVar292._16_4_ =
           fVar345 * fVar265 + fVar326 * fVar308 + fVar245 * fVar221 + fVar246 * fVar272;
      auVar292._20_4_ =
           fVar350 * fVar266 + fVar330 * fVar226 + fVar244 * fVar282 + fVar251 * fVar322;
      auVar292._24_4_ =
           fVar351 * fVar267 + fVar332 * fVar309 + fVar271 * fVar186 + fVar253 * fVar219;
      auVar292._28_4_ = fVar183 + fVar180 + fVar240 + 0.0;
      auVar196 = vshufps_avx(auVar192,auVar192,0x55);
      register0x00001310 = auVar196;
      _local_380 = auVar196;
      fVar230 = auVar196._0_4_;
      fVar150 = auVar196._4_4_;
      fVar152 = auVar196._8_4_;
      fVar153 = auVar196._12_4_;
      auVar315._0_4_ = fVar230 * fVar310 + fVar247 * fVar255 + fVar188 * fVar218 + fVar179 * fVar222
      ;
      auVar315._4_4_ = fVar150 * fVar283 + fVar252 * fVar323 + fVar200 * fVar281 + fVar181 * fVar228
      ;
      auVar315._8_4_ = fVar152 * fVar311 + fVar254 * fVar203 + fVar201 * fVar324 + fVar182 * fVar242
      ;
      auVar315._12_4_ =
           fVar153 * fVar257 + fVar256 * fVar325 + fVar202 * fVar184 + fVar185 * fVar243;
      auVar315._16_4_ =
           fVar230 * fVar265 + fVar247 * fVar308 + fVar188 * fVar221 + fVar179 * fVar246;
      auVar315._20_4_ =
           fVar150 * fVar266 + fVar252 * fVar226 + fVar200 * fVar282 + fVar181 * fVar251;
      auVar315._24_4_ =
           fVar152 * fVar267 + fVar254 * fVar309 + fVar201 * fVar186 + fVar182 * fVar253;
      auVar315._28_4_ = fVar202 + 0.0 + 0.0 + 0.0;
      auVar196 = vpermilps_avx(auVar233,0xff);
      register0x00001490 = auVar196;
      _local_120 = auVar196;
      fVar159 = auVar196._0_4_;
      fVar160 = auVar196._4_4_;
      fVar177 = auVar196._8_4_;
      local_7a0._0_4_ =
           fVar159 * fVar310 + fVar299 * fVar255 + fVar154 * fVar218 + fVar222 * fVar176;
      local_7a0._4_4_ =
           fVar160 * fVar283 + fVar300 * fVar323 + fVar156 * fVar281 + fVar228 * fVar178;
      fStack_798 = fVar177 * fVar311 + fVar301 * fVar203 + fVar158 * fVar324 + fVar242 * fVar204;
      fStack_794 = auVar196._12_4_ * fVar257 +
                   fVar331 * fVar325 + auVar195._12_4_ * fVar184 + fVar243 * fVar216;
      fStack_790 = fVar159 * fVar265 + fVar299 * fVar308 + fVar154 * fVar221 + fVar246 * fVar176;
      fStack_78c = fVar160 * fVar266 + fVar300 * fVar226 + fVar156 * fVar282 + fVar251 * fVar178;
      fStack_788 = fVar177 * fVar267 + fVar301 * fVar309 + fVar158 * fVar186 + fVar253 * fVar204;
      fStack_784 = *(float *)(catmullrom_basis0 + lVar20 + 0x924) + 0.0 + 0.0 + 0.0;
      fVar325 = *(float *)(catmullrom_basis1 + lVar20 + 0x908);
      fVar308 = *(float *)(catmullrom_basis1 + lVar20 + 0x90c);
      fVar226 = *(float *)(catmullrom_basis1 + lVar20 + 0x910);
      fVar309 = *(float *)(catmullrom_basis1 + lVar20 + 0x914);
      fVar310 = *(float *)(catmullrom_basis1 + lVar20 + 0x918);
      fVar283 = *(float *)(catmullrom_basis1 + lVar20 + 0x91c);
      fVar311 = *(float *)(catmullrom_basis1 + lVar20 + 0x920);
      fVar257 = *(float *)(catmullrom_basis1 + lVar20 + 0xd8c);
      fVar265 = *(float *)(catmullrom_basis1 + lVar20 + 0xd90);
      fVar266 = *(float *)(catmullrom_basis1 + lVar20 + 0xd94);
      fVar267 = *(float *)(catmullrom_basis1 + lVar20 + 0xd98);
      fVar268 = *(float *)(catmullrom_basis1 + lVar20 + 0xd9c);
      fVar269 = *(float *)(catmullrom_basis1 + lVar20 + 0xda0);
      fVar270 = *(float *)(catmullrom_basis1 + lVar20 + 0xda4);
      fVar132 = *(float *)(catmullrom_basis1 + lVar20 + 0x484);
      fVar149 = *(float *)(catmullrom_basis1 + lVar20 + 0x488);
      fVar151 = *(float *)(catmullrom_basis1 + lVar20 + 0x48c);
      fVar187 = *(float *)(catmullrom_basis1 + lVar20 + 0x490);
      fVar302 = *(float *)(catmullrom_basis1 + lVar20 + 0x494);
      fVar155 = *(float *)(catmullrom_basis1 + lVar20 + 0x498);
      fVar157 = *(float *)(catmullrom_basis1 + lVar20 + 0x49c);
      fVar228 = fVar334 + fVar183 + 0.0;
      fVar205 = *(float *)(catmullrom_basis1 + lVar20);
      fVar217 = *(float *)(catmullrom_basis1 + lVar20 + 4);
      fVar220 = *(float *)(catmullrom_basis1 + lVar20 + 8);
      fVar223 = *(float *)(catmullrom_basis1 + lVar20 + 0xc);
      fVar224 = *(float *)(catmullrom_basis1 + lVar20 + 0x10);
      fVar225 = *(float *)(catmullrom_basis1 + lVar20 + 0x14);
      fVar227 = *(float *)(catmullrom_basis1 + lVar20 + 0x18);
      auVar287._0_4_ = fVar345 * fVar205 + fVar326 * fVar132 + fVar325 * fVar245 + fVar257 * fVar272
      ;
      auVar287._4_4_ = fVar350 * fVar217 + fVar330 * fVar149 + fVar308 * fVar244 + fVar265 * fVar322
      ;
      auVar287._8_4_ = fVar351 * fVar220 + fVar332 * fVar151 + fVar226 * fVar271 + fVar266 * fVar219
      ;
      auVar287._12_4_ =
           fVar352 * fVar223 + fVar334 * fVar187 + fVar309 * fVar180 + fVar267 * fVar240;
      auVar287._16_4_ =
           fVar345 * fVar224 + fVar326 * fVar302 + fVar310 * fVar245 + fVar268 * fVar272;
      auVar287._20_4_ =
           fVar350 * fVar225 + fVar330 * fVar155 + fVar283 * fVar244 + fVar269 * fVar322;
      auVar287._24_4_ =
           fVar351 * fVar227 + fVar332 * fVar157 + fVar311 * fVar271 + fVar270 * fVar219;
      auVar287._28_4_ = fVar331 + fVar228;
      auVar210._0_4_ = fVar230 * fVar205 + fVar247 * fVar132 + fVar325 * fVar188 + fVar179 * fVar257
      ;
      auVar210._4_4_ = fVar150 * fVar217 + fVar252 * fVar149 + fVar308 * fVar200 + fVar181 * fVar265
      ;
      auVar210._8_4_ = fVar152 * fVar220 + fVar254 * fVar151 + fVar226 * fVar201 + fVar182 * fVar266
      ;
      auVar210._12_4_ =
           fVar153 * fVar223 + fVar256 * fVar187 + fVar309 * fVar202 + fVar185 * fVar267;
      auVar210._16_4_ =
           fVar230 * fVar224 + fVar247 * fVar302 + fVar310 * fVar188 + fVar179 * fVar268;
      auVar210._20_4_ =
           fVar150 * fVar225 + fVar252 * fVar155 + fVar283 * fVar200 + fVar181 * fVar269;
      auVar210._24_4_ =
           fVar152 * fVar227 + fVar254 * fVar157 + fVar311 * fVar201 + fVar182 * fVar270;
      auVar210._28_4_ = fVar228 + fVar334 + fVar183 + 0.0;
      local_580._0_4_ =
           fVar299 * fVar132 + fVar154 * fVar325 + fVar176 * fVar257 + fVar159 * fVar205;
      local_580._4_4_ =
           fVar300 * fVar149 + fVar156 * fVar308 + fVar178 * fVar265 + fVar160 * fVar217;
      local_580._8_4_ =
           fVar301 * fVar151 + fVar158 * fVar226 + fVar204 * fVar266 + fVar177 * fVar220;
      local_580._12_4_ =
           fVar331 * fVar187 + auVar195._12_4_ * fVar309 + fVar216 * fVar267 +
           auVar196._12_4_ * fVar223;
      local_580._16_4_ =
           fVar299 * fVar302 + fVar154 * fVar310 + fVar176 * fVar268 + fVar159 * fVar224;
      local_580._20_4_ =
           fVar300 * fVar155 + fVar156 * fVar283 + fVar178 * fVar269 + fVar160 * fVar225;
      local_580._24_4_ =
           fVar301 * fVar157 + fVar158 * fVar311 + fVar204 * fVar270 + fVar177 * fVar227;
      local_580._28_4_ = fVar334 + fVar216 + fVar183 + fVar228;
      auVar29 = vsubps_avx(auVar287,auVar292);
      auVar30 = vsubps_avx(auVar210,auVar315);
      fVar176 = auVar29._0_4_;
      fVar204 = auVar29._4_4_;
      auVar142._4_4_ = auVar315._4_4_ * fVar204;
      auVar142._0_4_ = auVar315._0_4_ * fVar176;
      fVar222 = auVar29._8_4_;
      auVar142._8_4_ = auVar315._8_4_ * fVar222;
      fVar242 = auVar29._12_4_;
      auVar142._12_4_ = auVar315._12_4_ * fVar242;
      fVar246 = auVar29._16_4_;
      auVar142._16_4_ = auVar315._16_4_ * fVar246;
      fVar253 = auVar29._20_4_;
      auVar142._20_4_ = auVar315._20_4_ * fVar253;
      fVar323 = auVar29._24_4_;
      auVar142._24_4_ = auVar315._24_4_ * fVar323;
      auVar142._28_4_ = fVar228;
      fVar178 = auVar30._0_4_;
      fVar216 = auVar30._4_4_;
      auVar31._4_4_ = auVar292._4_4_ * fVar216;
      auVar31._0_4_ = auVar292._0_4_ * fVar178;
      fVar228 = auVar30._8_4_;
      auVar31._8_4_ = auVar292._8_4_ * fVar228;
      fVar243 = auVar30._12_4_;
      auVar31._12_4_ = auVar292._12_4_ * fVar243;
      fVar251 = auVar30._16_4_;
      auVar31._16_4_ = auVar292._16_4_ * fVar251;
      fVar255 = auVar30._20_4_;
      auVar31._20_4_ = auVar292._20_4_ * fVar255;
      fVar203 = auVar30._24_4_;
      auVar31._24_4_ = auVar292._24_4_ * fVar203;
      auVar31._28_4_ = auVar210._28_4_;
      auVar31 = vsubps_avx(auVar142,auVar31);
      auVar142 = vmaxps_avx(_local_7a0,local_580);
      auVar34._4_4_ = auVar142._4_4_ * auVar142._4_4_ * (fVar204 * fVar204 + fVar216 * fVar216);
      auVar34._0_4_ = auVar142._0_4_ * auVar142._0_4_ * (fVar176 * fVar176 + fVar178 * fVar178);
      auVar34._8_4_ = auVar142._8_4_ * auVar142._8_4_ * (fVar222 * fVar222 + fVar228 * fVar228);
      auVar34._12_4_ = auVar142._12_4_ * auVar142._12_4_ * (fVar242 * fVar242 + fVar243 * fVar243);
      auVar34._16_4_ = auVar142._16_4_ * auVar142._16_4_ * (fVar246 * fVar246 + fVar251 * fVar251);
      auVar34._20_4_ = auVar142._20_4_ * auVar142._20_4_ * (fVar253 * fVar253 + fVar255 * fVar255);
      auVar34._24_4_ = auVar142._24_4_ * auVar142._24_4_ * (fVar323 * fVar323 + fVar203 * fVar203);
      auVar34._28_4_ = auVar30._28_4_ + auVar210._28_4_;
      auVar295._4_4_ = auVar31._4_4_ * auVar31._4_4_;
      auVar295._0_4_ = auVar31._0_4_ * auVar31._0_4_;
      auVar295._8_4_ = auVar31._8_4_ * auVar31._8_4_;
      auVar295._12_4_ = auVar31._12_4_ * auVar31._12_4_;
      auVar295._16_4_ = auVar31._16_4_ * auVar31._16_4_;
      auVar295._20_4_ = auVar31._20_4_ * auVar31._20_4_;
      auVar295._24_4_ = auVar31._24_4_ * auVar31._24_4_;
      auVar295._28_4_ = auVar31._28_4_;
      auVar142 = vcmpps_avx(auVar295,auVar34,2);
      local_3c0 = (float)(int)uVar15;
      fStack_3bc = 0.0;
      fStack_3b8 = 0.0;
      fStack_3b4 = 0.0;
      auVar195 = vshufps_avx(ZEXT416((uint)local_3c0),ZEXT416((uint)local_3c0),0);
      auVar211._16_16_ = auVar195;
      auVar211._0_16_ = auVar195;
      auVar31 = vcmpps_avx(_DAT_01faff40,auVar211,1);
      auVar215 = ZEXT3264(auVar31);
      auVar195 = vpermilps_avx(auVar192,0xaa);
      auVar304._16_16_ = auVar195;
      auVar304._0_16_ = auVar195;
      auVar196 = vpermilps_avx(auVar249,0xaa);
      register0x00001550 = auVar196;
      _local_340 = auVar196;
      auVar208 = vpermilps_avx(auVar234,0xaa);
      register0x00001590 = auVar208;
      _local_2c0 = auVar208;
      auVar21 = vpermilps_avx(auVar164,0xaa);
      register0x000014d0 = auVar21;
      _local_600 = auVar21;
      auVar34 = auVar31 & auVar142;
      auVar166 = ZEXT416((uint)(auVar166._0_4_ * 4.7683716e-07));
      local_6a0._0_16_ = auVar166;
      ray = local_7b8;
      auVar295 = local_4c0;
      fVar176 = fVar247;
      fVar178 = fVar252;
      fVar204 = fVar254;
      fVar216 = fVar326;
      fVar222 = fVar330;
      fVar228 = fVar332;
      fVar242 = fVar334;
      fVar243 = fVar188;
      fVar246 = fVar200;
      fVar251 = fVar201;
      fVar253 = fVar202;
      if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar34 >> 0x7f,0) != '\0') ||
            (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar34 >> 0xbf,0) != '\0') ||
          (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar34[0x1f] < '\0') {
        local_2e0 = vandps_avx(auVar142,auVar31);
        fVar154 = auVar195._0_4_;
        fVar156 = auVar195._4_4_;
        fVar158 = auVar195._8_4_;
        fVar159 = auVar195._12_4_;
        fVar301 = auVar196._0_4_;
        fVar331 = auVar196._4_4_;
        fVar333 = auVar196._8_4_;
        fVar335 = auVar196._12_4_;
        fVar337 = auVar208._0_4_;
        fVar341 = auVar208._4_4_;
        fVar342 = auVar208._8_4_;
        fVar343 = auVar208._12_4_;
        fVar160 = auVar21._0_4_;
        fVar177 = auVar21._4_4_;
        fVar299 = auVar21._8_4_;
        fVar300 = auVar21._12_4_;
        local_420 = fVar154 * fVar205 + fVar301 * fVar132 + fVar337 * fVar325 + fVar160 * fVar257;
        fStack_41c = fVar156 * fVar217 + fVar331 * fVar149 + fVar341 * fVar308 + fVar177 * fVar265;
        fStack_418 = fVar158 * fVar220 + fVar333 * fVar151 + fVar342 * fVar226 + fVar299 * fVar266;
        fStack_414 = fVar159 * fVar223 + fVar335 * fVar187 + fVar343 * fVar309 + fVar300 * fVar267;
        fStack_410 = fVar154 * fVar224 + fVar301 * fVar302 + fVar337 * fVar310 + fVar160 * fVar268;
        fStack_40c = fVar156 * fVar225 + fVar331 * fVar155 + fVar341 * fVar283 + fVar177 * fVar269;
        fStack_408 = fVar158 * fVar227 + fVar333 * fVar157 + fVar342 * fVar311 + fVar299 * fVar270;
        fStack_404 = local_2e0._28_4_ +
                     auVar31._28_4_ + *(float *)(catmullrom_basis1 + lVar20 + 0x924) + fVar352;
        local_400._0_4_ = auVar118._0_4_;
        local_400._4_4_ = auVar118._4_4_;
        fStack_3f8 = auVar118._8_4_;
        fStack_3f4 = auVar118._12_4_;
        fStack_3f0 = auVar118._16_4_;
        fStack_3ec = auVar118._20_4_;
        fStack_3e8 = auVar118._24_4_;
        local_560._0_4_ = auVar117._0_4_;
        local_560._4_4_ = auVar117._4_4_;
        fStack_558 = auVar117._8_4_;
        fStack_554 = auVar117._12_4_;
        auStack_550._0_4_ = auVar117._16_4_;
        auStack_550._4_4_ = auVar117._20_4_;
        fStack_548 = auVar117._24_4_;
        local_5c0._0_4_ = auVar116._0_4_;
        local_5c0._4_4_ = auVar116._4_4_;
        fStack_5b8 = auVar116._8_4_;
        fStack_5b4 = auVar116._12_4_;
        fStack_5b0 = auVar116._16_4_;
        fStack_5ac = auVar116._20_4_;
        fStack_5a8 = auVar116._24_4_;
        local_620 = fVar154 * (float)local_400._0_4_ +
                    fVar301 * (float)local_560._0_4_ +
                    fVar337 * fVar218 + fVar160 * (float)local_5c0._0_4_;
        fStack_61c = fVar156 * (float)local_400._4_4_ +
                     fVar331 * (float)local_560._4_4_ +
                     fVar341 * fVar281 + fVar177 * (float)local_5c0._4_4_;
        fStack_618 = fVar158 * fStack_3f8 +
                     fVar333 * fStack_558 + fVar342 * fVar324 + fVar299 * fStack_5b8;
        fStack_614 = fVar159 * fStack_3f4 +
                     fVar335 * fStack_554 + fVar343 * fVar184 + fVar300 * fStack_5b4;
        fStack_610 = fVar154 * fStack_3f0 +
                     fVar301 * (float)auStack_550._0_4_ + fVar337 * fVar221 + fVar160 * fStack_5b0;
        fStack_60c = fVar156 * fStack_3ec +
                     fVar331 * (float)auStack_550._4_4_ + fVar341 * fVar282 + fVar177 * fStack_5ac;
        fStack_608 = fVar158 * fStack_3e8 +
                     fVar333 * fStack_548 + fVar342 * fVar186 + fVar299 * fStack_5a8;
        fStack_604 = fVar153 + fStack_404 + local_2e0._28_4_ + auVar31._28_4_;
        fVar255 = *(float *)(catmullrom_basis0 + lVar20 + 0x1210);
        fVar323 = *(float *)(catmullrom_basis0 + lVar20 + 0x1214);
        fVar203 = *(float *)(catmullrom_basis0 + lVar20 + 0x1218);
        fVar218 = *(float *)(catmullrom_basis0 + lVar20 + 0x121c);
        fVar281 = *(float *)(catmullrom_basis0 + lVar20 + 0x1220);
        fVar324 = *(float *)(catmullrom_basis0 + lVar20 + 0x1224);
        fVar184 = *(float *)(catmullrom_basis0 + lVar20 + 0x1228);
        fVar221 = *(float *)(catmullrom_basis0 + lVar20 + 0x1694);
        fVar282 = *(float *)(catmullrom_basis0 + lVar20 + 0x1698);
        fVar186 = *(float *)(catmullrom_basis0 + lVar20 + 0x169c);
        fVar325 = *(float *)(catmullrom_basis0 + lVar20 + 0x16a0);
        fVar308 = *(float *)(catmullrom_basis0 + lVar20 + 0x16a4);
        fVar226 = *(float *)(catmullrom_basis0 + lVar20 + 0x16a8);
        fVar309 = *(float *)(catmullrom_basis0 + lVar20 + 0x16ac);
        fVar183 = *(float *)(catmullrom_basis0 + lVar20 + 0x1b18);
        fVar310 = *(float *)(catmullrom_basis0 + lVar20 + 0x1b1c);
        fVar283 = *(float *)(catmullrom_basis0 + lVar20 + 0x1b20);
        fVar311 = *(float *)(catmullrom_basis0 + lVar20 + 0x1b24);
        fVar257 = *(float *)(catmullrom_basis0 + lVar20 + 0x1b28);
        fVar265 = *(float *)(catmullrom_basis0 + lVar20 + 0x1b2c);
        fVar266 = *(float *)(catmullrom_basis0 + lVar20 + 0x1b30);
        fVar267 = *(float *)(catmullrom_basis0 + lVar20 + 0x1f9c);
        fVar268 = *(float *)(catmullrom_basis0 + lVar20 + 0x1fa0);
        fVar269 = *(float *)(catmullrom_basis0 + lVar20 + 0x1fa4);
        fVar270 = *(float *)(catmullrom_basis0 + lVar20 + 0x1fa8);
        fVar132 = *(float *)(catmullrom_basis0 + lVar20 + 0x1fac);
        fVar149 = *(float *)(catmullrom_basis0 + lVar20 + 0x1fb0);
        fVar151 = *(float *)(catmullrom_basis0 + lVar20 + 0x1fb4);
        _local_5c0 = auVar287;
        fVar187 = *(float *)(catmullrom_basis0 + lVar20 + 0x1b34) +
                  *(float *)(catmullrom_basis0 + lVar20 + 0x1fb8);
        fVar302 = *(float *)(catmullrom_basis0 + lVar20 + 0x16b0) + fVar187;
        local_400._4_4_ =
             fVar323 * fVar350 + fVar330 * fVar282 + fVar244 * fVar310 + fVar322 * fVar268;
        local_400._0_4_ =
             fVar255 * fVar345 + fVar326 * fVar221 + fVar245 * fVar183 + fVar272 * fVar267;
        fStack_3f8 = fVar203 * fVar351 + fVar332 * fVar186 + fVar271 * fVar283 + fVar219 * fVar269;
        fStack_3f4 = fVar218 * fVar352 + fVar334 * fVar325 + fVar180 * fVar311 + fVar240 * fVar270;
        fStack_3f0 = fVar281 * fVar345 + fVar326 * fVar308 + fVar245 * fVar257 + fVar272 * fVar132;
        fStack_3ec = fVar324 * fVar350 + fVar330 * fVar226 + fVar244 * fVar265 + fVar322 * fVar149;
        fStack_3e8 = fVar184 * fVar351 + fVar332 * fVar309 + fVar271 * fVar266 + fVar219 * fVar151;
        fStack_3e4 = *(float *)(catmullrom_basis0 + lVar20 + 0x16b0) +
                     *(float *)(catmullrom_basis0 + lVar20 + 0x1fb8) +
                     *(float *)(catmullrom_basis1 + lVar20 + 0x4a0) + 0.0;
        auVar168._0_4_ =
             fVar230 * fVar255 + fVar188 * fVar183 + fVar179 * fVar267 + fVar247 * fVar221;
        auVar168._4_4_ =
             fVar150 * fVar323 + fVar200 * fVar310 + fVar181 * fVar268 + fVar252 * fVar282;
        auVar168._8_4_ =
             fVar152 * fVar203 + fVar201 * fVar283 + fVar182 * fVar269 + fVar254 * fVar186;
        auVar168._12_4_ =
             fVar153 * fVar218 + fVar202 * fVar311 + fVar185 * fVar270 + fVar256 * fVar325;
        auVar168._16_4_ =
             fVar230 * fVar281 + fVar188 * fVar257 + fVar179 * fVar132 + fVar247 * fVar308;
        auVar168._20_4_ =
             fVar150 * fVar324 + fVar200 * fVar265 + fVar181 * fVar149 + fVar252 * fVar226;
        auVar168._24_4_ =
             fVar152 * fVar184 + fVar201 * fVar266 + fVar182 * fVar151 + fVar254 * fVar309;
        auVar168._28_4_ = fVar187 + *(float *)(catmullrom_basis1 + lVar20 + 0x4a0) + 0.0 + 0.0;
        auVar260._0_4_ =
             fVar301 * fVar221 + fVar337 * fVar183 + fVar160 * fVar267 + fVar154 * fVar255;
        auVar260._4_4_ =
             fVar331 * fVar282 + fVar341 * fVar310 + fVar177 * fVar268 + fVar156 * fVar323;
        auVar260._8_4_ =
             fVar333 * fVar186 + fVar342 * fVar283 + fVar299 * fVar269 + fVar158 * fVar203;
        auVar260._12_4_ =
             fVar335 * fVar325 + fVar343 * fVar311 + fVar300 * fVar270 + fVar159 * fVar218;
        auVar260._16_4_ =
             fVar301 * fVar308 + fVar337 * fVar257 + fVar160 * fVar132 + fVar154 * fVar281;
        auVar260._20_4_ =
             fVar331 * fVar226 + fVar341 * fVar265 + fVar177 * fVar149 + fVar156 * fVar324;
        auVar260._24_4_ =
             fVar333 * fVar309 + fVar342 * fVar266 + fVar299 * fVar151 + fVar158 * fVar184;
        auVar260._28_4_ = fVar302 + *(float *)(catmullrom_basis0 + lVar20 + 0x122c);
        fVar255 = *(float *)(catmullrom_basis1 + lVar20 + 0x1b18);
        fVar323 = *(float *)(catmullrom_basis1 + lVar20 + 0x1b1c);
        fVar203 = *(float *)(catmullrom_basis1 + lVar20 + 0x1b20);
        fVar218 = *(float *)(catmullrom_basis1 + lVar20 + 0x1b24);
        fVar281 = *(float *)(catmullrom_basis1 + lVar20 + 0x1b28);
        fVar324 = *(float *)(catmullrom_basis1 + lVar20 + 0x1b2c);
        fVar184 = *(float *)(catmullrom_basis1 + lVar20 + 0x1b30);
        fVar221 = *(float *)(catmullrom_basis1 + lVar20 + 0x1f9c);
        fVar282 = *(float *)(catmullrom_basis1 + lVar20 + 0x1fa0);
        fVar186 = *(float *)(catmullrom_basis1 + lVar20 + 0x1fa4);
        fVar325 = *(float *)(catmullrom_basis1 + lVar20 + 0x1fa8);
        fVar308 = *(float *)(catmullrom_basis1 + lVar20 + 0x1fac);
        fVar226 = *(float *)(catmullrom_basis1 + lVar20 + 0x1fb0);
        fVar309 = *(float *)(catmullrom_basis1 + lVar20 + 0x1fb4);
        fVar183 = *(float *)(catmullrom_basis1 + lVar20 + 0x1694);
        fVar310 = *(float *)(catmullrom_basis1 + lVar20 + 0x1698);
        fVar283 = *(float *)(catmullrom_basis1 + lVar20 + 0x169c);
        fVar311 = *(float *)(catmullrom_basis1 + lVar20 + 0x16a0);
        fVar257 = *(float *)(catmullrom_basis1 + lVar20 + 0x16a4);
        fVar265 = *(float *)(catmullrom_basis1 + lVar20 + 0x16a8);
        fVar266 = *(float *)(catmullrom_basis1 + lVar20 + 0x16ac);
        fVar267 = *(float *)(catmullrom_basis1 + lVar20 + 0x1210);
        fVar268 = *(float *)(catmullrom_basis1 + lVar20 + 0x1214);
        fVar269 = *(float *)(catmullrom_basis1 + lVar20 + 0x1218);
        fVar270 = *(float *)(catmullrom_basis1 + lVar20 + 0x121c);
        fVar132 = *(float *)(catmullrom_basis1 + lVar20 + 0x1220);
        fVar149 = *(float *)(catmullrom_basis1 + lVar20 + 0x1224);
        fVar151 = *(float *)(catmullrom_basis1 + lVar20 + 0x1228);
        auVar278._0_4_ =
             fVar267 * fVar345 + fVar326 * fVar183 + fVar245 * fVar255 + fVar272 * fVar221;
        auVar278._4_4_ =
             fVar268 * fVar350 + fVar330 * fVar310 + fVar244 * fVar323 + fVar322 * fVar282;
        auVar278._8_4_ =
             fVar269 * fVar351 + fVar332 * fVar283 + fVar271 * fVar203 + fVar219 * fVar186;
        auVar278._12_4_ =
             fVar270 * fVar352 + fVar334 * fVar311 + fVar180 * fVar218 + fVar240 * fVar325;
        auVar278._16_4_ =
             fVar132 * fVar345 + fVar326 * fVar257 + fVar245 * fVar281 + fVar272 * fVar308;
        auVar278._20_4_ =
             fVar149 * fVar350 + fVar330 * fVar265 + fVar244 * fVar324 + fVar322 * fVar226;
        auVar278._24_4_ =
             fVar151 * fVar351 + fVar332 * fVar266 + fVar271 * fVar184 + fVar219 * fVar309;
        auVar278._28_4_ = fVar202 + fVar202 + fVar302 + fVar240;
        auVar293._0_4_ =
             fVar230 * fVar267 + fVar247 * fVar183 + fVar188 * fVar255 + fVar179 * fVar221;
        auVar293._4_4_ =
             fVar150 * fVar268 + fVar252 * fVar310 + fVar200 * fVar323 + fVar181 * fVar282;
        auVar293._8_4_ =
             fVar152 * fVar269 + fVar254 * fVar283 + fVar201 * fVar203 + fVar182 * fVar186;
        auVar293._12_4_ =
             fVar153 * fVar270 + fVar256 * fVar311 + fVar202 * fVar218 + fVar185 * fVar325;
        auVar293._16_4_ =
             fVar230 * fVar132 + fVar247 * fVar257 + fVar188 * fVar281 + fVar179 * fVar308;
        auVar293._20_4_ =
             fVar150 * fVar149 + fVar252 * fVar265 + fVar200 * fVar324 + fVar181 * fVar226;
        auVar293._24_4_ =
             fVar152 * fVar151 + fVar254 * fVar266 + fVar201 * fVar184 + fVar182 * fVar309;
        auVar293._28_4_ = fVar202 + fVar202 + fVar202 + fVar302;
        _local_640 = auVar304;
        auVar199._0_4_ =
             fVar154 * fVar267 + fVar301 * fVar183 + fVar337 * fVar255 + fVar160 * fVar221;
        auVar199._4_4_ =
             fVar156 * fVar268 + fVar331 * fVar310 + fVar341 * fVar323 + fVar177 * fVar282;
        auVar199._8_4_ =
             fVar158 * fVar269 + fVar333 * fVar283 + fVar342 * fVar203 + fVar299 * fVar186;
        auVar199._12_4_ =
             fVar159 * fVar270 + fVar335 * fVar311 + fVar343 * fVar218 + fVar300 * fVar325;
        auVar199._16_4_ =
             fVar154 * fVar132 + fVar301 * fVar257 + fVar337 * fVar281 + fVar160 * fVar308;
        auVar199._20_4_ =
             fVar156 * fVar149 + fVar331 * fVar265 + fVar341 * fVar324 + fVar177 * fVar226;
        auVar199._24_4_ =
             fVar158 * fVar151 + fVar333 * fVar266 + fVar342 * fVar184 + fVar299 * fVar309;
        auVar199._28_4_ =
             *(float *)(catmullrom_basis1 + lVar20 + 0x122c) +
             *(float *)(catmullrom_basis1 + lVar20 + 0x16b0) +
             *(float *)(catmullrom_basis1 + lVar20 + 0x1b34) +
             *(float *)(catmullrom_basis1 + lVar20 + 0x1fb8);
        auVar236._8_4_ = 0x7fffffff;
        auVar236._0_8_ = 0x7fffffff7fffffff;
        auVar236._12_4_ = 0x7fffffff;
        auVar236._16_4_ = 0x7fffffff;
        auVar236._20_4_ = 0x7fffffff;
        auVar236._24_4_ = 0x7fffffff;
        auVar236._28_4_ = 0x7fffffff;
        auVar142 = vandps_avx(_local_400,auVar236);
        auVar31 = vandps_avx(auVar168,auVar236);
        auVar31 = vmaxps_avx(auVar142,auVar31);
        auVar142 = vandps_avx(auVar260,auVar236);
        auVar142 = vmaxps_avx(auVar31,auVar142);
        auVar166 = vpermilps_avx(auVar166,0);
        auVar261._16_16_ = auVar166;
        auVar261._0_16_ = auVar166;
        auVar142 = vcmpps_avx(auVar142,auVar261,1);
        auVar34 = vblendvps_avx(_local_400,auVar29,auVar142);
        auVar295 = vblendvps_avx(auVar168,auVar30,auVar142);
        auVar142 = vandps_avx(auVar278,auVar236);
        auVar31 = vandps_avx(auVar293,auVar236);
        auVar211 = vmaxps_avx(auVar142,auVar31);
        auVar142 = vandps_avx(auVar199,auVar236);
        auVar142 = vmaxps_avx(auVar211,auVar142);
        auVar211 = vcmpps_avx(auVar142,auVar261,1);
        auVar142 = vblendvps_avx(auVar278,auVar29,auVar211);
        auVar29 = vblendvps_avx(auVar293,auVar30,auVar211);
        fVar132 = auVar34._0_4_;
        fVar149 = auVar34._4_4_;
        fVar151 = auVar34._8_4_;
        fVar187 = auVar34._12_4_;
        fVar302 = auVar34._16_4_;
        fVar155 = auVar34._20_4_;
        fVar157 = auVar34._24_4_;
        fVar205 = auVar142._0_4_;
        fVar217 = auVar142._4_4_;
        fVar220 = auVar142._8_4_;
        fVar223 = auVar142._12_4_;
        fVar224 = auVar142._16_4_;
        fVar225 = auVar142._20_4_;
        fVar227 = auVar142._24_4_;
        fVar245 = -auVar142._28_4_;
        fVar272 = auVar295._0_4_;
        fVar255 = auVar295._4_4_;
        fVar281 = auVar295._8_4_;
        fVar282 = auVar295._12_4_;
        fVar226 = auVar295._16_4_;
        fVar283 = auVar295._20_4_;
        fVar266 = auVar295._24_4_;
        auVar138._0_4_ = fVar272 * fVar272 + fVar132 * fVar132;
        auVar138._4_4_ = fVar255 * fVar255 + fVar149 * fVar149;
        auVar138._8_4_ = fVar281 * fVar281 + fVar151 * fVar151;
        auVar138._12_4_ = fVar282 * fVar282 + fVar187 * fVar187;
        auVar138._16_4_ = fVar226 * fVar226 + fVar302 * fVar302;
        auVar138._20_4_ = fVar283 * fVar283 + fVar155 * fVar155;
        auVar138._24_4_ = fVar266 * fVar266 + fVar157 * fVar157;
        auVar138._28_4_ = auVar293._28_4_ + auVar34._28_4_;
        auVar30 = vrsqrtps_avx(auVar138);
        fVar322 = auVar30._0_4_;
        fVar219 = auVar30._4_4_;
        auVar32._4_4_ = fVar219 * 1.5;
        auVar32._0_4_ = fVar322 * 1.5;
        fVar240 = auVar30._8_4_;
        auVar32._8_4_ = fVar240 * 1.5;
        fVar323 = auVar30._12_4_;
        auVar32._12_4_ = fVar323 * 1.5;
        fVar203 = auVar30._16_4_;
        auVar32._16_4_ = fVar203 * 1.5;
        fVar218 = auVar30._20_4_;
        auVar32._20_4_ = fVar218 * 1.5;
        fVar324 = auVar30._24_4_;
        fVar270 = auVar31._28_4_;
        auVar32._24_4_ = fVar324 * 1.5;
        auVar32._28_4_ = fVar270;
        auVar30._4_4_ = fVar219 * fVar219 * fVar219 * auVar138._4_4_ * 0.5;
        auVar30._0_4_ = fVar322 * fVar322 * fVar322 * auVar138._0_4_ * 0.5;
        auVar30._8_4_ = fVar240 * fVar240 * fVar240 * auVar138._8_4_ * 0.5;
        auVar30._12_4_ = fVar323 * fVar323 * fVar323 * auVar138._12_4_ * 0.5;
        auVar30._16_4_ = fVar203 * fVar203 * fVar203 * auVar138._16_4_ * 0.5;
        auVar30._20_4_ = fVar218 * fVar218 * fVar218 * auVar138._20_4_ * 0.5;
        auVar30._24_4_ = fVar324 * fVar324 * fVar324 * auVar138._24_4_ * 0.5;
        auVar30._28_4_ = auVar138._28_4_;
        auVar31 = vsubps_avx(auVar32,auVar30);
        fVar322 = auVar31._0_4_;
        fVar323 = auVar31._4_4_;
        fVar324 = auVar31._8_4_;
        fVar186 = auVar31._12_4_;
        fVar309 = auVar31._16_4_;
        fVar311 = auVar31._20_4_;
        fVar267 = auVar31._24_4_;
        fVar219 = auVar29._0_4_;
        fVar203 = auVar29._4_4_;
        fVar184 = auVar29._8_4_;
        fVar325 = auVar29._12_4_;
        fVar183 = auVar29._16_4_;
        fVar257 = auVar29._20_4_;
        fVar268 = auVar29._24_4_;
        auVar139._0_4_ = fVar219 * fVar219 + fVar205 * fVar205;
        auVar139._4_4_ = fVar203 * fVar203 + fVar217 * fVar217;
        auVar139._8_4_ = fVar184 * fVar184 + fVar220 * fVar220;
        auVar139._12_4_ = fVar325 * fVar325 + fVar223 * fVar223;
        auVar139._16_4_ = fVar183 * fVar183 + fVar224 * fVar224;
        auVar139._20_4_ = fVar257 * fVar257 + fVar225 * fVar225;
        auVar139._24_4_ = fVar268 * fVar268 + fVar227 * fVar227;
        auVar139._28_4_ = auVar142._28_4_ + auVar31._28_4_;
        auVar142 = vrsqrtps_avx(auVar139);
        fVar240 = auVar142._0_4_;
        fVar218 = auVar142._4_4_;
        auVar33._4_4_ = fVar218 * 1.5;
        auVar33._0_4_ = fVar240 * 1.5;
        fVar221 = auVar142._8_4_;
        auVar33._8_4_ = fVar221 * 1.5;
        fVar308 = auVar142._12_4_;
        auVar33._12_4_ = fVar308 * 1.5;
        fVar310 = auVar142._16_4_;
        auVar33._16_4_ = fVar310 * 1.5;
        fVar265 = auVar142._20_4_;
        auVar33._20_4_ = fVar265 * 1.5;
        fVar269 = auVar142._24_4_;
        auVar33._24_4_ = fVar269 * 1.5;
        auVar33._28_4_ = fVar270;
        auVar35._4_4_ = fVar218 * fVar218 * fVar218 * auVar139._4_4_ * 0.5;
        auVar35._0_4_ = fVar240 * fVar240 * fVar240 * auVar139._0_4_ * 0.5;
        auVar35._8_4_ = fVar221 * fVar221 * fVar221 * auVar139._8_4_ * 0.5;
        auVar35._12_4_ = fVar308 * fVar308 * fVar308 * auVar139._12_4_ * 0.5;
        auVar35._16_4_ = fVar310 * fVar310 * fVar310 * auVar139._16_4_ * 0.5;
        auVar35._20_4_ = fVar265 * fVar265 * fVar265 * auVar139._20_4_ * 0.5;
        auVar35._24_4_ = fVar269 * fVar269 * fVar269 * auVar139._24_4_ * 0.5;
        auVar35._28_4_ = auVar139._28_4_;
        auVar142 = vsubps_avx(auVar33,auVar35);
        fVar240 = auVar142._0_4_;
        fVar218 = auVar142._4_4_;
        fVar221 = auVar142._8_4_;
        fVar308 = auVar142._12_4_;
        fVar310 = auVar142._16_4_;
        fVar265 = auVar142._20_4_;
        fVar269 = auVar142._24_4_;
        fVar272 = (float)local_7a0._0_4_ * fVar272 * fVar322;
        fVar255 = (float)local_7a0._4_4_ * fVar255 * fVar323;
        auVar36._4_4_ = fVar255;
        auVar36._0_4_ = fVar272;
        fVar281 = fStack_798 * fVar281 * fVar324;
        auVar36._8_4_ = fVar281;
        fVar282 = fStack_794 * fVar282 * fVar186;
        auVar36._12_4_ = fVar282;
        fVar226 = fStack_790 * fVar226 * fVar309;
        auVar36._16_4_ = fVar226;
        fVar283 = fStack_78c * fVar283 * fVar311;
        auVar36._20_4_ = fVar283;
        fVar266 = fStack_788 * fVar266 * fVar267;
        auVar36._24_4_ = fVar266;
        auVar36._28_4_ = fVar245;
        local_540._4_4_ = auVar292._4_4_ + fVar255;
        local_540._0_4_ = auVar292._0_4_ + fVar272;
        fStack_538 = auVar292._8_4_ + fVar281;
        fStack_534 = auVar292._12_4_ + fVar282;
        fStack_530 = auVar292._16_4_ + fVar226;
        fStack_52c = auVar292._20_4_ + fVar283;
        fStack_528 = auVar292._24_4_ + fVar266;
        fStack_524 = auVar292._28_4_ + fVar245;
        fVar272 = (float)local_7a0._0_4_ * fVar322 * -fVar132;
        fVar255 = (float)local_7a0._4_4_ * fVar323 * -fVar149;
        auVar37._4_4_ = fVar255;
        auVar37._0_4_ = fVar272;
        fVar281 = fStack_798 * fVar324 * -fVar151;
        auVar37._8_4_ = fVar281;
        fVar282 = fStack_794 * fVar186 * -fVar187;
        auVar37._12_4_ = fVar282;
        fVar226 = fStack_790 * fVar309 * -fVar302;
        auVar37._16_4_ = fVar226;
        fVar283 = fStack_78c * fVar311 * -fVar155;
        auVar37._20_4_ = fVar283;
        fVar266 = fStack_788 * fVar267 * -fVar157;
        auVar37._24_4_ = fVar266;
        auVar37._28_4_ = fVar270;
        local_560._4_4_ = fVar255 + auVar315._4_4_;
        local_560._0_4_ = fVar272 + auVar315._0_4_;
        fStack_558 = fVar281 + auVar315._8_4_;
        fStack_554 = fVar282 + auVar315._12_4_;
        auStack_550._0_4_ = fVar226 + auVar315._16_4_;
        auStack_550._4_4_ = fVar283 + auVar315._20_4_;
        fStack_548 = fVar266 + auVar315._24_4_;
        fStack_544 = fVar270 + auVar315._28_4_;
        fVar272 = fVar322 * 0.0 * (float)local_7a0._0_4_;
        fVar322 = fVar323 * 0.0 * (float)local_7a0._4_4_;
        auVar38._4_4_ = fVar322;
        auVar38._0_4_ = fVar272;
        fVar255 = fVar324 * 0.0 * fStack_798;
        auVar38._8_4_ = fVar255;
        fVar323 = fVar186 * 0.0 * fStack_794;
        auVar38._12_4_ = fVar323;
        fVar281 = fVar309 * 0.0 * fStack_790;
        auVar38._16_4_ = fVar281;
        fVar324 = fVar311 * 0.0 * fStack_78c;
        auVar38._20_4_ = fVar324;
        fVar282 = fVar267 * 0.0 * fStack_788;
        auVar38._24_4_ = fVar282;
        auVar38._28_4_ = fVar185;
        auVar111._4_4_ = fStack_61c;
        auVar111._0_4_ = local_620;
        auVar111._8_4_ = fStack_618;
        auVar111._12_4_ = fStack_614;
        auVar111._16_4_ = fStack_610;
        auVar111._20_4_ = fStack_60c;
        auVar111._24_4_ = fStack_608;
        auVar111._28_4_ = fStack_604;
        auVar262._0_4_ = fVar272 + local_620;
        auVar262._4_4_ = fVar322 + fStack_61c;
        auVar262._8_4_ = fVar255 + fStack_618;
        auVar262._12_4_ = fVar323 + fStack_614;
        auVar262._16_4_ = fVar281 + fStack_610;
        auVar262._20_4_ = fVar324 + fStack_60c;
        auVar262._24_4_ = fVar282 + fStack_608;
        auVar262._28_4_ = fVar185 + fStack_604;
        fVar272 = local_580._0_4_ * fVar219 * fVar240;
        fVar322 = local_580._4_4_ * fVar203 * fVar218;
        auVar39._4_4_ = fVar322;
        auVar39._0_4_ = fVar272;
        fVar219 = local_580._8_4_ * fVar184 * fVar221;
        auVar39._8_4_ = fVar219;
        fVar255 = local_580._12_4_ * fVar325 * fVar308;
        auVar39._12_4_ = fVar255;
        fVar323 = local_580._16_4_ * fVar183 * fVar310;
        auVar39._16_4_ = fVar323;
        fVar203 = local_580._20_4_ * fVar257 * fVar265;
        auVar39._20_4_ = fVar203;
        fVar281 = local_580._24_4_ * fVar268 * fVar269;
        auVar39._24_4_ = fVar281;
        auVar39._28_4_ = auVar29._28_4_;
        auVar34 = vsubps_avx(auVar292,auVar36);
        auVar294._0_4_ = auVar287._0_4_ + fVar272;
        auVar294._4_4_ = auVar287._4_4_ + fVar322;
        auVar294._8_4_ = auVar287._8_4_ + fVar219;
        auVar294._12_4_ = auVar287._12_4_ + fVar255;
        auVar294._16_4_ = auVar287._16_4_ + fVar323;
        auVar294._20_4_ = auVar287._20_4_ + fVar203;
        auVar294._24_4_ = auVar287._24_4_ + fVar281;
        auVar294._28_4_ = auVar287._28_4_ + auVar29._28_4_;
        fVar272 = local_580._0_4_ * fVar240 * -fVar205;
        fVar322 = local_580._4_4_ * fVar218 * -fVar217;
        auVar29._4_4_ = fVar322;
        auVar29._0_4_ = fVar272;
        fVar219 = local_580._8_4_ * fVar221 * -fVar220;
        auVar29._8_4_ = fVar219;
        fVar255 = local_580._12_4_ * fVar308 * -fVar223;
        auVar29._12_4_ = fVar255;
        fVar323 = local_580._16_4_ * fVar310 * -fVar224;
        auVar29._16_4_ = fVar323;
        fVar203 = local_580._20_4_ * fVar265 * -fVar225;
        auVar29._20_4_ = fVar203;
        fVar281 = local_580._24_4_ * fVar269 * -fVar227;
        auVar29._24_4_ = fVar281;
        auVar29._28_4_ = fVar335;
        auVar295 = vsubps_avx(auVar315,auVar37);
        auVar305._0_4_ = fVar272 + auVar210._0_4_;
        auVar305._4_4_ = fVar322 + auVar210._4_4_;
        auVar305._8_4_ = fVar219 + auVar210._8_4_;
        auVar305._12_4_ = fVar255 + auVar210._12_4_;
        auVar305._16_4_ = fVar323 + auVar210._16_4_;
        auVar305._20_4_ = fVar203 + auVar210._20_4_;
        auVar305._24_4_ = fVar281 + auVar210._24_4_;
        auVar305._28_4_ = fVar335 + auVar210._28_4_;
        fVar272 = local_580._0_4_ * fVar240 * 0.0;
        fVar322 = local_580._4_4_ * fVar218 * 0.0;
        auVar40._4_4_ = fVar322;
        auVar40._0_4_ = fVar272;
        fVar219 = local_580._8_4_ * fVar221 * 0.0;
        auVar40._8_4_ = fVar219;
        fVar240 = local_580._12_4_ * fVar308 * 0.0;
        auVar40._12_4_ = fVar240;
        fVar255 = local_580._16_4_ * fVar310 * 0.0;
        auVar40._16_4_ = fVar255;
        fVar323 = local_580._20_4_ * fVar265 * 0.0;
        auVar40._20_4_ = fVar323;
        fVar203 = local_580._24_4_ * fVar269 * 0.0;
        auVar40._24_4_ = fVar203;
        auVar40._28_4_ = 0x3f000000;
        auVar315 = vsubps_avx(auVar111,auVar38);
        auVar113._4_4_ = fStack_41c;
        auVar113._0_4_ = local_420;
        auVar113._8_4_ = fStack_418;
        auVar113._12_4_ = fStack_414;
        auVar113._16_4_ = fStack_410;
        auVar113._20_4_ = fStack_40c;
        auVar113._24_4_ = fStack_408;
        auVar113._28_4_ = fStack_404;
        auVar339._0_4_ = fVar272 + local_420;
        auVar339._4_4_ = fVar322 + fStack_41c;
        auVar339._8_4_ = fVar219 + fStack_418;
        auVar339._12_4_ = fVar240 + fStack_414;
        auVar339._16_4_ = fVar255 + fStack_410;
        auVar339._20_4_ = fVar323 + fStack_40c;
        auVar339._24_4_ = fVar203 + fStack_408;
        auVar339._28_4_ = fStack_404 + 0.5;
        auVar142 = vsubps_avx(auVar287,auVar39);
        auVar31 = vsubps_avx(auVar210,auVar29);
        auVar32 = vsubps_avx(auVar113,auVar40);
        auVar29 = vsubps_avx(auVar305,auVar295);
        auVar30 = vsubps_avx(auVar339,auVar315);
        auVar41._4_4_ = auVar315._4_4_ * auVar29._4_4_;
        auVar41._0_4_ = auVar315._0_4_ * auVar29._0_4_;
        auVar41._8_4_ = auVar315._8_4_ * auVar29._8_4_;
        auVar41._12_4_ = auVar315._12_4_ * auVar29._12_4_;
        auVar41._16_4_ = auVar315._16_4_ * auVar29._16_4_;
        auVar41._20_4_ = auVar315._20_4_ * auVar29._20_4_;
        auVar41._24_4_ = auVar315._24_4_ * auVar29._24_4_;
        auVar41._28_4_ = auVar287._28_4_;
        auVar42._4_4_ = auVar295._4_4_ * auVar30._4_4_;
        auVar42._0_4_ = auVar295._0_4_ * auVar30._0_4_;
        auVar42._8_4_ = auVar295._8_4_ * auVar30._8_4_;
        auVar42._12_4_ = auVar295._12_4_ * auVar30._12_4_;
        auVar42._16_4_ = auVar295._16_4_ * auVar30._16_4_;
        auVar42._20_4_ = auVar295._20_4_ * auVar30._20_4_;
        auVar42._24_4_ = auVar295._24_4_ * auVar30._24_4_;
        auVar42._28_4_ = fStack_404;
        auVar211 = vsubps_avx(auVar42,auVar41);
        auVar43._4_4_ = auVar34._4_4_ * auVar30._4_4_;
        auVar43._0_4_ = auVar34._0_4_ * auVar30._0_4_;
        auVar43._8_4_ = auVar34._8_4_ * auVar30._8_4_;
        auVar43._12_4_ = auVar34._12_4_ * auVar30._12_4_;
        auVar43._16_4_ = auVar34._16_4_ * auVar30._16_4_;
        auVar43._20_4_ = auVar34._20_4_ * auVar30._20_4_;
        auVar43._24_4_ = auVar34._24_4_ * auVar30._24_4_;
        auVar43._28_4_ = auVar30._28_4_;
        auVar287 = vsubps_avx(auVar294,auVar34);
        auVar44._4_4_ = auVar315._4_4_ * auVar287._4_4_;
        auVar44._0_4_ = auVar315._0_4_ * auVar287._0_4_;
        auVar44._8_4_ = auVar315._8_4_ * auVar287._8_4_;
        auVar44._12_4_ = auVar315._12_4_ * auVar287._12_4_;
        auVar44._16_4_ = auVar315._16_4_ * auVar287._16_4_;
        auVar44._20_4_ = auVar315._20_4_ * auVar287._20_4_;
        auVar44._24_4_ = auVar315._24_4_ * auVar287._24_4_;
        auVar44._28_4_ = auVar210._28_4_;
        auVar210 = vsubps_avx(auVar44,auVar43);
        auVar45._4_4_ = auVar287._4_4_ * auVar295._4_4_;
        auVar45._0_4_ = auVar287._0_4_ * auVar295._0_4_;
        auVar45._8_4_ = auVar287._8_4_ * auVar295._8_4_;
        auVar45._12_4_ = auVar287._12_4_ * auVar295._12_4_;
        auVar45._16_4_ = auVar287._16_4_ * auVar295._16_4_;
        auVar45._20_4_ = auVar287._20_4_ * auVar295._20_4_;
        auVar45._24_4_ = auVar287._24_4_ * auVar295._24_4_;
        auVar45._28_4_ = auVar30._28_4_;
        auVar46._4_4_ = auVar34._4_4_ * auVar29._4_4_;
        auVar46._0_4_ = auVar34._0_4_ * auVar29._0_4_;
        auVar46._8_4_ = auVar34._8_4_ * auVar29._8_4_;
        auVar46._12_4_ = auVar34._12_4_ * auVar29._12_4_;
        auVar46._16_4_ = auVar34._16_4_ * auVar29._16_4_;
        auVar46._20_4_ = auVar34._20_4_ * auVar29._20_4_;
        auVar46._24_4_ = auVar34._24_4_ * auVar29._24_4_;
        auVar46._28_4_ = auVar29._28_4_;
        auVar29 = vsubps_avx(auVar46,auVar45);
        auVar140._0_4_ = auVar211._0_4_ * 0.0 + auVar29._0_4_ + auVar210._0_4_ * 0.0;
        auVar140._4_4_ = auVar211._4_4_ * 0.0 + auVar29._4_4_ + auVar210._4_4_ * 0.0;
        auVar140._8_4_ = auVar211._8_4_ * 0.0 + auVar29._8_4_ + auVar210._8_4_ * 0.0;
        auVar140._12_4_ = auVar211._12_4_ * 0.0 + auVar29._12_4_ + auVar210._12_4_ * 0.0;
        auVar140._16_4_ = auVar211._16_4_ * 0.0 + auVar29._16_4_ + auVar210._16_4_ * 0.0;
        auVar140._20_4_ = auVar211._20_4_ * 0.0 + auVar29._20_4_ + auVar210._20_4_ * 0.0;
        auVar140._24_4_ = auVar211._24_4_ * 0.0 + auVar29._24_4_ + auVar210._24_4_ * 0.0;
        auVar140._28_4_ = auVar29._28_4_ + auVar29._28_4_ + auVar210._28_4_;
        auVar211 = vcmpps_avx(auVar140,ZEXT432(0) << 0x20,2);
        _local_500 = vblendvps_avx(auVar142,_local_540,auVar211);
        _local_520 = vblendvps_avx(auVar31,_local_560,auVar211);
        auVar142 = vblendvps_avx(auVar32,auVar262,auVar211);
        auVar31 = vblendvps_avx(auVar34,auVar294,auVar211);
        auVar29 = vblendvps_avx(auVar295,auVar305,auVar211);
        auVar30 = vblendvps_avx(auVar315,auVar339,auVar211);
        auVar34 = vblendvps_avx(auVar294,auVar34,auVar211);
        auVar295 = vblendvps_avx(auVar305,auVar295,auVar211);
        _local_4e0 = vpackssdw_avx(local_2e0._0_16_,local_2e0._16_16_);
        _auStack_4d0 = auVar292._16_16_;
        auVar210 = vblendvps_avx(auVar339,auVar315,auVar211);
        auVar34 = vsubps_avx(auVar34,_local_500);
        auVar287 = vsubps_avx(auVar295,_local_520);
        auVar210 = vsubps_avx(auVar210,auVar142);
        auVar292 = vsubps_avx(_local_520,auVar29);
        fVar272 = auVar287._0_4_;
        fVar157 = auVar142._0_4_;
        fVar323 = auVar287._4_4_;
        fVar205 = auVar142._4_4_;
        auVar47._4_4_ = fVar205 * fVar323;
        auVar47._0_4_ = fVar157 * fVar272;
        fVar184 = auVar287._8_4_;
        fVar217 = auVar142._8_4_;
        auVar47._8_4_ = fVar217 * fVar184;
        fVar308 = auVar287._12_4_;
        fVar220 = auVar142._12_4_;
        auVar47._12_4_ = fVar220 * fVar308;
        fVar283 = auVar287._16_4_;
        fVar223 = auVar142._16_4_;
        auVar47._16_4_ = fVar223 * fVar283;
        fVar267 = auVar287._20_4_;
        fVar224 = auVar142._20_4_;
        auVar47._20_4_ = fVar224 * fVar267;
        fVar149 = auVar287._24_4_;
        fVar225 = auVar142._24_4_;
        auVar47._24_4_ = fVar225 * fVar149;
        auVar47._28_4_ = auVar295._28_4_;
        fVar322 = local_520._0_4_;
        fVar152 = auVar210._0_4_;
        fVar203 = local_520._4_4_;
        fVar153 = auVar210._4_4_;
        auVar48._4_4_ = fVar153 * fVar203;
        auVar48._0_4_ = fVar152 * fVar322;
        fVar221 = local_520._8_4_;
        fVar154 = auVar210._8_4_;
        auVar48._8_4_ = fVar154 * fVar221;
        fVar226 = local_520._12_4_;
        fVar156 = auVar210._12_4_;
        auVar48._12_4_ = fVar156 * fVar226;
        fVar311 = local_520._16_4_;
        fVar158 = auVar210._16_4_;
        auVar48._16_4_ = fVar158 * fVar311;
        fVar268 = local_520._20_4_;
        fVar159 = auVar210._20_4_;
        auVar48._20_4_ = fVar159 * fVar268;
        fVar151 = local_520._24_4_;
        fVar160 = auVar210._24_4_;
        uVar11 = auVar32._28_4_;
        auVar48._24_4_ = fVar160 * fVar151;
        auVar48._28_4_ = uVar11;
        auVar295 = vsubps_avx(auVar48,auVar47);
        fVar219 = local_500._0_4_;
        fVar218 = local_500._4_4_;
        auVar49._4_4_ = fVar153 * fVar218;
        auVar49._0_4_ = fVar152 * fVar219;
        fVar282 = local_500._8_4_;
        auVar49._8_4_ = fVar154 * fVar282;
        fVar309 = local_500._12_4_;
        auVar49._12_4_ = fVar156 * fVar309;
        fVar257 = local_500._16_4_;
        auVar49._16_4_ = fVar158 * fVar257;
        fVar269 = local_500._20_4_;
        auVar49._20_4_ = fVar159 * fVar269;
        fVar187 = local_500._24_4_;
        auVar49._24_4_ = fVar160 * fVar187;
        auVar49._28_4_ = uVar11;
        fVar240 = auVar34._0_4_;
        fVar281 = auVar34._4_4_;
        auVar50._4_4_ = fVar205 * fVar281;
        auVar50._0_4_ = fVar157 * fVar240;
        fVar186 = auVar34._8_4_;
        auVar50._8_4_ = fVar217 * fVar186;
        fVar183 = auVar34._12_4_;
        auVar50._12_4_ = fVar220 * fVar183;
        fVar265 = auVar34._16_4_;
        auVar50._16_4_ = fVar223 * fVar265;
        fVar270 = auVar34._20_4_;
        auVar50._20_4_ = fVar224 * fVar270;
        fVar302 = auVar34._24_4_;
        auVar50._24_4_ = fVar225 * fVar302;
        auVar50._28_4_ = auVar339._28_4_;
        auVar315 = vsubps_avx(auVar50,auVar49);
        auVar51._4_4_ = fVar203 * fVar281;
        auVar51._0_4_ = fVar322 * fVar240;
        auVar51._8_4_ = fVar221 * fVar186;
        auVar51._12_4_ = fVar226 * fVar183;
        auVar51._16_4_ = fVar311 * fVar265;
        auVar51._20_4_ = fVar268 * fVar270;
        auVar51._24_4_ = fVar151 * fVar302;
        auVar51._28_4_ = uVar11;
        auVar347._0_4_ = fVar219 * fVar272;
        auVar347._4_4_ = fVar218 * fVar323;
        auVar347._8_4_ = fVar282 * fVar184;
        auVar347._12_4_ = fVar309 * fVar308;
        auVar347._16_4_ = fVar257 * fVar283;
        auVar347._20_4_ = fVar269 * fVar267;
        auVar347._24_4_ = fVar187 * fVar149;
        auVar347._28_4_ = 0;
        auVar32 = vsubps_avx(auVar347,auVar51);
        auVar33 = vsubps_avx(auVar142,auVar30);
        fVar255 = auVar32._28_4_ + auVar315._28_4_;
        auVar169._0_4_ = auVar32._0_4_ + auVar315._0_4_ * 0.0 + auVar295._0_4_ * 0.0;
        auVar169._4_4_ = auVar32._4_4_ + auVar315._4_4_ * 0.0 + auVar295._4_4_ * 0.0;
        auVar169._8_4_ = auVar32._8_4_ + auVar315._8_4_ * 0.0 + auVar295._8_4_ * 0.0;
        auVar169._12_4_ = auVar32._12_4_ + auVar315._12_4_ * 0.0 + auVar295._12_4_ * 0.0;
        auVar169._16_4_ = auVar32._16_4_ + auVar315._16_4_ * 0.0 + auVar295._16_4_ * 0.0;
        auVar169._20_4_ = auVar32._20_4_ + auVar315._20_4_ * 0.0 + auVar295._20_4_ * 0.0;
        auVar169._24_4_ = auVar32._24_4_ + auVar315._24_4_ * 0.0 + auVar295._24_4_ * 0.0;
        auVar169._28_4_ = fVar255 + auVar295._28_4_;
        fVar227 = auVar292._0_4_;
        fVar245 = auVar292._4_4_;
        auVar52._4_4_ = fVar245 * auVar30._4_4_;
        auVar52._0_4_ = fVar227 * auVar30._0_4_;
        fVar244 = auVar292._8_4_;
        auVar52._8_4_ = fVar244 * auVar30._8_4_;
        fVar271 = auVar292._12_4_;
        auVar52._12_4_ = fVar271 * auVar30._12_4_;
        fVar180 = auVar292._16_4_;
        auVar52._16_4_ = fVar180 * auVar30._16_4_;
        fVar230 = auVar292._20_4_;
        auVar52._20_4_ = fVar230 * auVar30._20_4_;
        fVar150 = auVar292._24_4_;
        auVar52._24_4_ = fVar150 * auVar30._24_4_;
        auVar52._28_4_ = fVar255;
        fVar255 = auVar33._0_4_;
        fVar324 = auVar33._4_4_;
        auVar53._4_4_ = auVar29._4_4_ * fVar324;
        auVar53._0_4_ = auVar29._0_4_ * fVar255;
        fVar325 = auVar33._8_4_;
        auVar53._8_4_ = auVar29._8_4_ * fVar325;
        fVar310 = auVar33._12_4_;
        auVar53._12_4_ = auVar29._12_4_ * fVar310;
        fVar266 = auVar33._16_4_;
        auVar53._16_4_ = auVar29._16_4_ * fVar266;
        fVar132 = auVar33._20_4_;
        auVar53._20_4_ = auVar29._20_4_ * fVar132;
        fVar155 = auVar33._24_4_;
        auVar53._24_4_ = auVar29._24_4_ * fVar155;
        auVar53._28_4_ = auVar32._28_4_;
        auVar292 = vsubps_avx(auVar53,auVar52);
        auVar315 = vsubps_avx(_local_500,auVar31);
        fVar177 = auVar315._0_4_;
        fVar179 = auVar315._4_4_;
        auVar54._4_4_ = fVar179 * auVar30._4_4_;
        auVar54._0_4_ = fVar177 * auVar30._0_4_;
        fVar181 = auVar315._8_4_;
        auVar54._8_4_ = fVar181 * auVar30._8_4_;
        fVar182 = auVar315._12_4_;
        auVar54._12_4_ = fVar182 * auVar30._12_4_;
        fVar185 = auVar315._16_4_;
        auVar54._16_4_ = fVar185 * auVar30._16_4_;
        fVar299 = auVar315._20_4_;
        auVar54._20_4_ = fVar299 * auVar30._20_4_;
        fVar300 = auVar315._24_4_;
        auVar54._24_4_ = fVar300 * auVar30._24_4_;
        auVar54._28_4_ = auVar30._28_4_;
        auVar55._4_4_ = auVar31._4_4_ * fVar324;
        auVar55._0_4_ = auVar31._0_4_ * fVar255;
        auVar55._8_4_ = auVar31._8_4_ * fVar325;
        auVar55._12_4_ = auVar31._12_4_ * fVar310;
        auVar55._16_4_ = auVar31._16_4_ * fVar266;
        auVar55._20_4_ = auVar31._20_4_ * fVar132;
        auVar55._24_4_ = auVar31._24_4_ * fVar155;
        auVar55._28_4_ = auVar295._28_4_;
        auVar295 = vsubps_avx(auVar54,auVar55);
        auVar56._4_4_ = auVar29._4_4_ * fVar179;
        auVar56._0_4_ = auVar29._0_4_ * fVar177;
        auVar56._8_4_ = auVar29._8_4_ * fVar181;
        auVar56._12_4_ = auVar29._12_4_ * fVar182;
        auVar56._16_4_ = auVar29._16_4_ * fVar185;
        auVar56._20_4_ = auVar29._20_4_ * fVar299;
        auVar56._24_4_ = auVar29._24_4_ * fVar300;
        auVar56._28_4_ = auVar30._28_4_;
        auVar57._4_4_ = auVar31._4_4_ * fVar245;
        auVar57._0_4_ = auVar31._0_4_ * fVar227;
        auVar57._8_4_ = auVar31._8_4_ * fVar244;
        auVar57._12_4_ = auVar31._12_4_ * fVar271;
        auVar57._16_4_ = auVar31._16_4_ * fVar180;
        auVar57._20_4_ = auVar31._20_4_ * fVar230;
        auVar57._24_4_ = auVar31._24_4_ * fVar150;
        auVar57._28_4_ = auVar31._28_4_;
        auVar31 = vsubps_avx(auVar57,auVar56);
        auVar237._0_4_ = auVar292._0_4_ * 0.0 + auVar31._0_4_ + auVar295._0_4_ * 0.0;
        auVar237._4_4_ = auVar292._4_4_ * 0.0 + auVar31._4_4_ + auVar295._4_4_ * 0.0;
        auVar237._8_4_ = auVar292._8_4_ * 0.0 + auVar31._8_4_ + auVar295._8_4_ * 0.0;
        auVar237._12_4_ = auVar292._12_4_ * 0.0 + auVar31._12_4_ + auVar295._12_4_ * 0.0;
        auVar237._16_4_ = auVar292._16_4_ * 0.0 + auVar31._16_4_ + auVar295._16_4_ * 0.0;
        auVar237._20_4_ = auVar292._20_4_ * 0.0 + auVar31._20_4_ + auVar295._20_4_ * 0.0;
        auVar237._24_4_ = auVar292._24_4_ * 0.0 + auVar31._24_4_ + auVar295._24_4_ * 0.0;
        auVar237._28_4_ = auVar31._28_4_ + auVar31._28_4_ + auVar295._28_4_;
        auVar31 = vmaxps_avx(auVar169,auVar237);
        auVar31 = vcmpps_avx(auVar31,ZEXT832(0) << 0x20,2);
        auVar166 = vpackssdw_avx(auVar31._0_16_,auVar31._16_16_);
        auVar166 = vpand_avx(auVar166,_local_4e0);
        auVar195 = vpmovsxwd_avx(auVar166);
        auVar196 = vpunpckhwd_avx(auVar166,auVar166);
        auVar212._16_16_ = auVar196;
        auVar212._0_16_ = auVar195;
        if ((((((((auVar212 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar212 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar212 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar212 >> 0x7f,0) == '\0') &&
              (auVar212 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar196 >> 0x3f,0) == '\0') &&
            (auVar212 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar196[0xf]) {
LAB_00fa4654:
          auVar215 = ZEXT3264(auVar212);
          auVar175 = ZEXT3264(CONCAT824(local_4a0[1]._24_8_,
                                        CONCAT816(local_4a0[1]._16_8_,
                                                  CONCAT88(local_4a0[1]._8_8_,local_4a0[1]._0_8_))))
          ;
          auVar148 = ZEXT3264(local_4c0);
        }
        else {
          auVar58._4_4_ = fVar324 * fVar323;
          auVar58._0_4_ = fVar255 * fVar272;
          auVar58._8_4_ = fVar325 * fVar184;
          auVar58._12_4_ = fVar310 * fVar308;
          auVar58._16_4_ = fVar266 * fVar283;
          auVar58._20_4_ = fVar132 * fVar267;
          auVar58._24_4_ = fVar155 * fVar149;
          auVar58._28_4_ = auVar196._12_4_;
          auVar316._0_4_ = fVar227 * fVar152;
          auVar316._4_4_ = fVar245 * fVar153;
          auVar316._8_4_ = fVar244 * fVar154;
          auVar316._12_4_ = fVar271 * fVar156;
          auVar316._16_4_ = fVar180 * fVar158;
          auVar316._20_4_ = fVar230 * fVar159;
          auVar316._24_4_ = fVar150 * fVar160;
          auVar316._28_4_ = 0;
          auVar31 = vsubps_avx(auVar316,auVar58);
          auVar59._4_4_ = fVar179 * fVar153;
          auVar59._0_4_ = fVar177 * fVar152;
          auVar59._8_4_ = fVar181 * fVar154;
          auVar59._12_4_ = fVar182 * fVar156;
          auVar59._16_4_ = fVar185 * fVar158;
          auVar59._20_4_ = fVar299 * fVar159;
          auVar59._24_4_ = fVar300 * fVar160;
          auVar59._28_4_ = auVar210._28_4_;
          auVar60._4_4_ = fVar324 * fVar281;
          auVar60._0_4_ = fVar255 * fVar240;
          auVar60._8_4_ = fVar325 * fVar186;
          auVar60._12_4_ = fVar310 * fVar183;
          auVar60._16_4_ = fVar266 * fVar265;
          auVar60._20_4_ = fVar132 * fVar270;
          auVar60._24_4_ = fVar155 * fVar302;
          auVar60._28_4_ = auVar33._28_4_;
          auVar30 = vsubps_avx(auVar60,auVar59);
          auVar61._4_4_ = fVar245 * fVar281;
          auVar61._0_4_ = fVar227 * fVar240;
          auVar61._8_4_ = fVar244 * fVar186;
          auVar61._12_4_ = fVar271 * fVar183;
          auVar61._16_4_ = fVar180 * fVar265;
          auVar61._20_4_ = fVar230 * fVar270;
          auVar61._24_4_ = fVar150 * fVar302;
          auVar61._28_4_ = auVar169._28_4_;
          auVar62._4_4_ = fVar179 * fVar323;
          auVar62._0_4_ = fVar177 * fVar272;
          auVar62._8_4_ = fVar181 * fVar184;
          auVar62._12_4_ = fVar182 * fVar308;
          auVar62._16_4_ = fVar185 * fVar283;
          auVar62._20_4_ = fVar299 * fVar267;
          auVar62._24_4_ = fVar300 * fVar149;
          auVar62._28_4_ = auVar287._28_4_;
          auVar295 = vsubps_avx(auVar62,auVar61);
          auVar279._0_4_ = auVar31._0_4_ * 0.0 + auVar295._0_4_ + auVar30._0_4_ * 0.0;
          auVar279._4_4_ = auVar31._4_4_ * 0.0 + auVar295._4_4_ + auVar30._4_4_ * 0.0;
          auVar279._8_4_ = auVar31._8_4_ * 0.0 + auVar295._8_4_ + auVar30._8_4_ * 0.0;
          auVar279._12_4_ = auVar31._12_4_ * 0.0 + auVar295._12_4_ + auVar30._12_4_ * 0.0;
          auVar279._16_4_ = auVar31._16_4_ * 0.0 + auVar295._16_4_ + auVar30._16_4_ * 0.0;
          auVar279._20_4_ = auVar31._20_4_ * 0.0 + auVar295._20_4_ + auVar30._20_4_ * 0.0;
          auVar279._24_4_ = auVar31._24_4_ * 0.0 + auVar295._24_4_ + auVar30._24_4_ * 0.0;
          auVar279._28_4_ = auVar287._28_4_ + auVar295._28_4_ + auVar169._28_4_;
          auVar29 = vrcpps_avx(auVar279);
          fVar240 = auVar29._0_4_;
          fVar255 = auVar29._4_4_;
          auVar63._4_4_ = auVar279._4_4_ * fVar255;
          auVar63._0_4_ = auVar279._0_4_ * fVar240;
          fVar323 = auVar29._8_4_;
          auVar63._8_4_ = auVar279._8_4_ * fVar323;
          fVar281 = auVar29._12_4_;
          auVar63._12_4_ = auVar279._12_4_ * fVar281;
          fVar324 = auVar29._16_4_;
          auVar63._16_4_ = auVar279._16_4_ * fVar324;
          fVar184 = auVar29._20_4_;
          auVar63._20_4_ = auVar279._20_4_ * fVar184;
          fVar186 = auVar29._24_4_;
          auVar63._24_4_ = auVar279._24_4_ * fVar186;
          auVar63._28_4_ = auVar33._28_4_;
          auVar317._8_4_ = 0x3f800000;
          auVar317._0_8_ = 0x3f8000003f800000;
          auVar317._12_4_ = 0x3f800000;
          auVar317._16_4_ = 0x3f800000;
          auVar317._20_4_ = 0x3f800000;
          auVar317._24_4_ = 0x3f800000;
          auVar317._28_4_ = 0x3f800000;
          auVar210 = vsubps_avx(auVar317,auVar63);
          fVar240 = auVar210._0_4_ * fVar240 + fVar240;
          fVar255 = auVar210._4_4_ * fVar255 + fVar255;
          fVar323 = auVar210._8_4_ * fVar323 + fVar323;
          fVar281 = auVar210._12_4_ * fVar281 + fVar281;
          fVar324 = auVar210._16_4_ * fVar324 + fVar324;
          fVar184 = auVar210._20_4_ * fVar184 + fVar184;
          fVar186 = auVar210._24_4_ * fVar186 + fVar186;
          auVar64._4_4_ =
               (auVar31._4_4_ * fVar218 + auVar30._4_4_ * fVar203 + auVar295._4_4_ * fVar205) *
               fVar255;
          auVar64._0_4_ =
               (auVar31._0_4_ * fVar219 + auVar30._0_4_ * fVar322 + auVar295._0_4_ * fVar157) *
               fVar240;
          auVar64._8_4_ =
               (auVar31._8_4_ * fVar282 + auVar30._8_4_ * fVar221 + auVar295._8_4_ * fVar217) *
               fVar323;
          auVar64._12_4_ =
               (auVar31._12_4_ * fVar309 + auVar30._12_4_ * fVar226 + auVar295._12_4_ * fVar220) *
               fVar281;
          auVar64._16_4_ =
               (auVar31._16_4_ * fVar257 + auVar30._16_4_ * fVar311 + auVar295._16_4_ * fVar223) *
               fVar324;
          auVar64._20_4_ =
               (auVar31._20_4_ * fVar269 + auVar30._20_4_ * fVar268 + auVar295._20_4_ * fVar224) *
               fVar184;
          auVar64._24_4_ =
               (auVar31._24_4_ * fVar187 + auVar30._24_4_ * fVar151 + auVar295._24_4_ * fVar225) *
               fVar186;
          auVar64._28_4_ = auVar34._28_4_ + auVar142._28_4_;
          auVar195 = vpermilps_avx((undefined1  [16])aVar13,0xff);
          auVar141._16_16_ = auVar195;
          auVar141._0_16_ = auVar195;
          auVar142 = vcmpps_avx(auVar141,auVar64,2);
          fVar272 = (local_7b8->super_RayK<1>).tfar;
          auVar213._4_4_ = fVar272;
          auVar213._0_4_ = fVar272;
          auVar213._8_4_ = fVar272;
          auVar213._12_4_ = fVar272;
          auVar213._16_4_ = fVar272;
          auVar213._20_4_ = fVar272;
          auVar213._24_4_ = fVar272;
          auVar213._28_4_ = fVar272;
          auVar31 = vcmpps_avx(auVar64,auVar213,2);
          auVar142 = vandps_avx(auVar31,auVar142);
          auVar195 = vpackssdw_avx(auVar142._0_16_,auVar142._16_16_);
          auVar166 = vpand_avx(auVar166,auVar195);
          auVar195 = vpmovsxwd_avx(auVar166);
          auVar196 = vpshufd_avx(auVar166,0xee);
          auVar196 = vpmovsxwd_avx(auVar196);
          auVar212._16_16_ = auVar196;
          auVar212._0_16_ = auVar195;
          if ((((((((auVar212 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar212 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar212 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar212 >> 0x7f,0) == '\0') &&
                (auVar212 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar196 >> 0x3f,0) == '\0') &&
              (auVar212 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar196[0xf]) goto LAB_00fa4654;
          auVar142 = vcmpps_avx(ZEXT832(0) << 0x20,auVar279,4);
          auVar195 = vpackssdw_avx(auVar142._0_16_,auVar142._16_16_);
          auVar166 = vpand_avx(auVar166,auVar195);
          auVar195 = vpmovsxwd_avx(auVar166);
          auVar215 = ZEXT1664(auVar195);
          auVar166 = vpunpckhwd_avx(auVar166,auVar166);
          auVar263._16_16_ = auVar166;
          auVar263._0_16_ = auVar195;
          auVar175 = ZEXT3264(CONCAT824(local_4a0[1]._24_8_,
                                        CONCAT816(local_4a0[1]._16_8_,
                                                  CONCAT88(local_4a0[1]._8_8_,local_4a0[1]._0_8_))))
          ;
          auVar148 = ZEXT3264(local_4c0);
          if ((((((((auVar263 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar263 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar263 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar263 >> 0x7f,0) != '\0') ||
                (auVar263 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar166 >> 0x3f,0) != '\0') ||
              (auVar263 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar166[0xf] < '\0') {
            auVar65._4_4_ = auVar169._4_4_ * fVar255;
            auVar65._0_4_ = auVar169._0_4_ * fVar240;
            auVar65._8_4_ = auVar169._8_4_ * fVar323;
            auVar65._12_4_ = auVar169._12_4_ * fVar281;
            auVar65._16_4_ = auVar169._16_4_ * fVar324;
            auVar65._20_4_ = auVar169._20_4_ * fVar184;
            auVar65._24_4_ = auVar169._24_4_ * fVar186;
            auVar65._28_4_ = SUB84(local_4a0[1]._24_8_,4);
            auVar66._4_4_ = auVar237._4_4_ * fVar255;
            auVar66._0_4_ = auVar237._0_4_ * fVar240;
            auVar66._8_4_ = auVar237._8_4_ * fVar323;
            auVar66._12_4_ = auVar237._12_4_ * fVar281;
            auVar66._16_4_ = auVar237._16_4_ * fVar324;
            auVar66._20_4_ = auVar237._20_4_ * fVar184;
            auVar66._24_4_ = auVar237._24_4_ * fVar186;
            auVar66._28_4_ = auVar210._28_4_ + auVar29._28_4_;
            auVar238._8_4_ = 0x3f800000;
            auVar238._0_8_ = 0x3f8000003f800000;
            auVar238._12_4_ = 0x3f800000;
            auVar238._16_4_ = 0x3f800000;
            auVar238._20_4_ = 0x3f800000;
            auVar238._24_4_ = 0x3f800000;
            auVar238._28_4_ = 0x3f800000;
            auVar142 = vsubps_avx(auVar238,auVar65);
            auVar215 = ZEXT3264(auVar142);
            auVar142 = vblendvps_avx(auVar142,auVar65,auVar211);
            auVar148 = ZEXT3264(auVar142);
            auVar142 = vsubps_avx(auVar238,auVar66);
            _local_300 = vblendvps_avx(auVar142,auVar66,auVar211);
            auVar175 = ZEXT3264(auVar263);
            local_460 = auVar64;
          }
        }
        auVar290 = ZEXT3264(auVar304);
        auVar295 = auVar148._0_32_;
        auVar142 = auVar175._0_32_;
        if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar142 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar142 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar142 >> 0x7f,0) != '\0') ||
              (auVar175 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar142 >> 0xbf,0) != '\0') ||
            (auVar175 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar175[0x1f] < '\0') {
          auVar31 = vsubps_avx(local_580,_local_7a0);
          local_7a0._0_4_ = (float)local_7a0._0_4_ + auVar148._0_4_ * auVar31._0_4_;
          local_7a0._4_4_ = (float)local_7a0._4_4_ + auVar148._4_4_ * auVar31._4_4_;
          fStack_798 = fStack_798 + auVar148._8_4_ * auVar31._8_4_;
          fStack_794 = fStack_794 + auVar148._12_4_ * auVar31._12_4_;
          fStack_790 = fStack_790 + auVar148._16_4_ * auVar31._16_4_;
          fStack_78c = fStack_78c + auVar148._20_4_ * auVar31._20_4_;
          fStack_788 = fStack_788 + auVar148._24_4_ * auVar31._24_4_;
          fStack_784 = fStack_784 + auVar31._28_4_;
          fVar272 = local_768->depth_scale;
          auVar67._4_4_ = ((float)local_7a0._4_4_ + (float)local_7a0._4_4_) * fVar272;
          auVar67._0_4_ = ((float)local_7a0._0_4_ + (float)local_7a0._0_4_) * fVar272;
          auVar67._8_4_ = (fStack_798 + fStack_798) * fVar272;
          auVar67._12_4_ = (fStack_794 + fStack_794) * fVar272;
          auVar67._16_4_ = (fStack_790 + fStack_790) * fVar272;
          auVar67._20_4_ = (fStack_78c + fStack_78c) * fVar272;
          auVar67._24_4_ = (fStack_788 + fStack_788) * fVar272;
          auVar67._28_4_ = fStack_784 + fStack_784;
          auVar31 = vcmpps_avx(local_460,auVar67,6);
          auVar29 = auVar142 & auVar31;
          if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar29 >> 0x7f,0) != '\0') ||
                (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar29 >> 0xbf,0) != '\0') ||
              (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar29[0x1f] < '\0') {
            auVar215 = ZEXT3264(CONCAT428(0xbf800000,
                                          CONCAT424(0xbf800000,
                                                    CONCAT420(0xbf800000,
                                                              CONCAT416(0xbf800000,
                                                                        CONCAT412(0xbf800000,
                                                                                  CONCAT48(
                                                  0xbf800000,0xbf800000bf800000)))))));
            local_300._0_4_ = (float)local_300._0_4_ + (float)local_300._0_4_ + -1.0;
            local_300._4_4_ = (float)local_300._4_4_ + (float)local_300._4_4_ + -1.0;
            uStack_2f8._0_4_ = (float)uStack_2f8 + (float)uStack_2f8 + -1.0;
            uStack_2f8._4_4_ = uStack_2f8._4_4_ + uStack_2f8._4_4_ + -1.0;
            uStack_2f0._0_4_ = (float)uStack_2f0 + (float)uStack_2f0 + -1.0;
            uStack_2f0._4_4_ = uStack_2f0._4_4_ + uStack_2f0._4_4_ + -1.0;
            uStack_2e8._0_4_ = (float)uStack_2e8 + (float)uStack_2e8 + -1.0;
            uStack_2e8._4_4_ = uStack_2e8._4_4_ + uStack_2e8._4_4_ + -1.0;
            local_280 = auVar295;
            auVar121 = _local_300;
            auVar29 = _local_300;
            local_260 = (float)local_300._0_4_;
            fStack_25c = (float)local_300._4_4_;
            fStack_258 = (float)uStack_2f8;
            fStack_254 = uStack_2f8._4_4_;
            fStack_250 = (float)uStack_2f0;
            fStack_24c = uStack_2f0._4_4_;
            fStack_248 = (float)uStack_2e8;
            fStack_244 = uStack_2e8._4_4_;
            local_240 = local_460;
            local_220 = 0;
            local_21c = uVar15;
            uStack_778 = auVar233._8_8_;
            local_210 = auVar233._0_8_;
            uStack_208 = uStack_778;
            uStack_708 = auVar314._8_8_;
            local_200 = auVar314._0_8_;
            uStack_1f8 = uStack_708;
            uStack_718 = auVar338._8_8_;
            local_1f0 = auVar338._0_8_;
            uStack_1e8 = uStack_718;
            uStack_728 = auVar346._8_8_;
            local_1e0._8_8_ = uStack_728;
            local_1e0._0_8_ = auVar346._0_8_;
            _local_300 = auVar29;
            if ((pGVar131->mask & (local_7b8->super_RayK<1>).mask) != 0) {
              auVar142 = vandps_avx(auVar31,auVar142);
              local_4a0[0] = auVar142;
              auVar193._0_4_ = 1.0 / local_3c0;
              auVar193._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar166 = vshufps_avx(auVar193,auVar193,0);
              local_1a0[0] = auVar166._0_4_ * (auVar148._0_4_ + 0.0);
              local_1a0[1] = auVar166._4_4_ * (auVar148._4_4_ + 1.0);
              local_1a0[2] = auVar166._8_4_ * (auVar148._8_4_ + 2.0);
              local_1a0[3] = auVar166._12_4_ * (auVar148._12_4_ + 3.0);
              fStack_190 = auVar166._0_4_ * (auVar148._16_4_ + 4.0);
              fStack_18c = auVar166._4_4_ * (auVar148._20_4_ + 5.0);
              fStack_188 = auVar166._8_4_ * (auVar148._24_4_ + 6.0);
              fStack_184 = auVar148._28_4_ + 7.0;
              uStack_2f0 = auVar121._16_8_;
              uStack_2e8 = auVar29._24_8_;
              local_180 = local_300;
              uStack_178 = uStack_2f8;
              uStack_170 = uStack_2f0;
              uStack_168 = uStack_2e8;
              local_160 = local_460;
              auVar170._8_4_ = 0x7f800000;
              auVar170._0_8_ = 0x7f8000007f800000;
              auVar170._12_4_ = 0x7f800000;
              auVar170._16_4_ = 0x7f800000;
              auVar170._20_4_ = 0x7f800000;
              auVar170._24_4_ = 0x7f800000;
              auVar170._28_4_ = 0x7f800000;
              auVar31 = vblendvps_avx(auVar170,local_460,auVar142);
              auVar29 = vshufps_avx(auVar31,auVar31,0xb1);
              auVar29 = vminps_avx(auVar31,auVar29);
              auVar30 = vshufpd_avx(auVar29,auVar29,5);
              auVar29 = vminps_avx(auVar29,auVar30);
              auVar30 = vperm2f128_avx(auVar29,auVar29,1);
              auVar29 = vminps_avx(auVar29,auVar30);
              auVar31 = vcmpps_avx(auVar31,auVar29,0);
              auVar29 = auVar142 & auVar31;
              if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar29 >> 0x7f,0) != '\0') ||
                    (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar29 >> 0xbf,0) != '\0') ||
                  (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar29[0x1f] < '\0') {
                auVar142 = vandps_avx(auVar31,auVar142);
              }
              uVar123 = vmovmskps_avx(auVar142);
              uVar19 = 0;
              if (uVar123 != 0) {
                for (; (uVar123 >> uVar19 & 1) == 0; uVar19 = uVar19 + 1) {
                }
              }
              uVar125 = (ulong)uVar19;
              if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                 (pGVar131->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
                _local_7a0 = ZEXT432((uint)(local_7b8->super_RayK<1>).tfar);
                local_4c0 = auVar295;
                local_760.ray = (RTCRayN *)local_7b8;
                do {
                  local_664 = local_1a0[uVar125];
                  local_660 = *(undefined4 *)((long)&local_180 + uVar125 * 4);
                  (((RayHit *)local_760.ray)->super_RayK<1>).tfar =
                       *(float *)(local_160 + uVar125 * 4);
                  fVar176 = 1.0 - local_664;
                  fVar272 = local_664 * 3.0;
                  auVar166 = ZEXT416((uint)((fVar176 * -2.0 * local_664 + local_664 * local_664) *
                                           0.5));
                  auVar166 = vshufps_avx(auVar166,auVar166,0);
                  auVar195 = ZEXT416((uint)(((fVar176 + fVar176) * (fVar272 + 2.0) +
                                            fVar176 * fVar176 * -3.0) * 0.5));
                  auVar195 = vshufps_avx(auVar195,auVar195,0);
                  auVar196 = ZEXT416((uint)(((local_664 + local_664) * (fVar272 + -5.0) +
                                            local_664 * fVar272) * 0.5));
                  auVar196 = vshufps_avx(auVar196,auVar196,0);
                  auVar208 = ZEXT416((uint)((local_664 * (fVar176 + fVar176) - fVar176 * fVar176) *
                                           0.5));
                  auVar208 = vshufps_avx(auVar208,auVar208,0);
                  auVar198._0_4_ =
                       auVar208._0_4_ * (float)local_780._0_4_ +
                       auVar196._0_4_ * (float)local_710._0_4_ +
                       auVar166._0_4_ * (float)local_730._0_4_ +
                       auVar195._0_4_ * (float)local_720._0_4_;
                  auVar198._4_4_ =
                       auVar208._4_4_ * (float)local_780._4_4_ +
                       auVar196._4_4_ * (float)local_710._4_4_ +
                       auVar166._4_4_ * (float)local_730._4_4_ +
                       auVar195._4_4_ * (float)local_720._4_4_;
                  auVar198._8_4_ =
                       auVar208._8_4_ * (float)uStack_778 +
                       auVar196._8_4_ * (float)uStack_708 +
                       auVar166._8_4_ * (float)uStack_728 + auVar195._8_4_ * (float)uStack_718;
                  auVar198._12_4_ =
                       auVar208._12_4_ * uStack_778._4_4_ +
                       auVar196._12_4_ * uStack_708._4_4_ +
                       auVar166._12_4_ * uStack_728._4_4_ + auVar195._12_4_ * uStack_718._4_4_;
                  local_760.context = context->user;
                  local_670 = vmovlps_avx(auVar198);
                  local_668 = vextractps_avx(auVar198,2);
                  local_65c = (int)local_7a8;
                  local_658 = (int)local_7b0;
                  local_654 = (local_760.context)->instID[0];
                  local_650 = (local_760.context)->instPrimID[0];
                  local_7bc = -1;
                  local_760.valid = &local_7bc;
                  local_760.geometryUserPtr = pGVar131->userPtr;
                  local_760.hit = (RTCHitN *)&local_670;
                  local_760.N = 1;
                  pRVar128 = (RayHit *)local_760.ray;
                  if (pGVar131->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00fa4899:
                    p_Var18 = context->args->filter;
                    if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar131->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var18)(&local_760);
                      auVar290 = ZEXT3264(_local_640);
                      auVar148 = ZEXT3264(local_4c0);
                      pRVar128 = local_7b8;
                      fVar326 = (float)local_700._0_4_;
                      fVar330 = (float)local_700._4_4_;
                      fVar332 = fStack_6f8;
                      fVar334 = fStack_6f4;
                      fVar216 = fStack_6f0;
                      fVar222 = fStack_6ec;
                      fVar228 = fStack_6e8;
                      fVar242 = fStack_6e4;
                      fVar188 = (float)local_6c0._0_4_;
                      fVar200 = (float)local_6c0._4_4_;
                      fVar201 = fStack_6b8;
                      fVar202 = fStack_6b4;
                      fVar243 = fStack_6b0;
                      fVar246 = fStack_6ac;
                      fVar251 = fStack_6a8;
                      fVar253 = fStack_6a4;
                      if (*local_760.valid == 0) goto LAB_00fa4954;
                    }
                    (((Vec3f *)((long)local_760.ray + 0x30))->field_0).components[0] =
                         *(float *)local_760.hit;
                    (((Vec3f *)((long)local_760.ray + 0x30))->field_0).field_0.y =
                         *(float *)(local_760.hit + 4);
                    (((Vec3f *)((long)local_760.ray + 0x30))->field_0).field_0.z =
                         *(float *)(local_760.hit + 8);
                    *(float *)((long)local_760.ray + 0x3c) = *(float *)(local_760.hit + 0xc);
                    *(float *)((long)local_760.ray + 0x40) = *(float *)(local_760.hit + 0x10);
                    *(float *)((long)local_760.ray + 0x44) = *(float *)(local_760.hit + 0x14);
                    *(float *)((long)local_760.ray + 0x48) = *(float *)(local_760.hit + 0x18);
                    *(float *)((long)local_760.ray + 0x4c) = *(float *)(local_760.hit + 0x1c);
                    *(float *)((long)local_760.ray + 0x50) = *(float *)(local_760.hit + 0x20);
                    local_760.ray = (RTCRayN *)pRVar128;
                  }
                  else {
                    (*pGVar131->intersectionFilterN)(&local_760);
                    auVar290 = ZEXT3264(_local_640);
                    auVar148 = ZEXT3264(local_4c0);
                    pRVar128 = local_7b8;
                    fVar326 = (float)local_700._0_4_;
                    fVar330 = (float)local_700._4_4_;
                    fVar332 = fStack_6f8;
                    fVar334 = fStack_6f4;
                    fVar216 = fStack_6f0;
                    fVar222 = fStack_6ec;
                    fVar228 = fStack_6e8;
                    fVar242 = fStack_6e4;
                    fVar188 = (float)local_6c0._0_4_;
                    fVar200 = (float)local_6c0._4_4_;
                    fVar201 = fStack_6b8;
                    fVar202 = fStack_6b4;
                    fVar243 = fStack_6b0;
                    fVar246 = fStack_6ac;
                    fVar251 = fStack_6a8;
                    fVar253 = fStack_6a4;
                    if (*local_760.valid != 0) goto LAB_00fa4899;
LAB_00fa4954:
                    (local_7b8->super_RayK<1>).tfar = (float)local_7a0._0_4_;
                    local_760.ray = (RTCRayN *)local_7b8;
                  }
                  auVar304 = auVar290._0_32_;
                  *(undefined4 *)(local_4a0[0] + uVar125 * 4) = 0;
                  auVar29 = local_4a0[0];
                  _local_7a0 = *(undefined1 (*) [32])
                                &(((RayHit *)local_760.ray)->super_RayK<1>).tfar;
                  auVar215 = ZEXT3264(_local_7a0);
                  fVar272 = (((RayHit *)local_760.ray)->super_RayK<1>).tfar;
                  auVar147._4_4_ = fVar272;
                  auVar147._0_4_ = fVar272;
                  auVar147._8_4_ = fVar272;
                  auVar147._12_4_ = fVar272;
                  auVar147._16_4_ = fVar272;
                  auVar147._20_4_ = fVar272;
                  auVar147._24_4_ = fVar272;
                  auVar147._28_4_ = fVar272;
                  auVar31 = vcmpps_avx(local_460,auVar147,2);
                  auVar142 = vandps_avx(auVar31,local_4a0[0]);
                  local_4a0[0] = auVar142;
                  auVar29 = auVar29 & auVar31;
                  prim = local_770;
                  ray = (RayHit *)local_760.ray;
                  auVar295 = auVar148._0_32_;
                  fVar247 = (float)local_6e0._0_4_;
                  fVar252 = (float)local_6e0._4_4_;
                  fVar254 = fStack_6d8;
                  fVar256 = fStack_6d4;
                  fVar176 = fStack_6d0;
                  fVar178 = fStack_6cc;
                  fVar204 = fStack_6c8;
                  if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar29 >> 0x7f,0) == '\0') &&
                        (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar29 >> 0xbf,0) == '\0') &&
                      (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar29[0x1f]) goto LAB_00fa362f;
                  auVar174._8_4_ = 0x7f800000;
                  auVar174._0_8_ = 0x7f8000007f800000;
                  auVar174._12_4_ = 0x7f800000;
                  auVar174._16_4_ = 0x7f800000;
                  auVar174._20_4_ = 0x7f800000;
                  auVar174._24_4_ = 0x7f800000;
                  auVar174._28_4_ = 0x7f800000;
                  auVar31 = vblendvps_avx(auVar174,local_460,auVar142);
                  auVar29 = vshufps_avx(auVar31,auVar31,0xb1);
                  auVar29 = vminps_avx(auVar31,auVar29);
                  auVar30 = vshufpd_avx(auVar29,auVar29,5);
                  auVar29 = vminps_avx(auVar29,auVar30);
                  auVar30 = vperm2f128_avx(auVar29,auVar29,1);
                  auVar29 = vminps_avx(auVar29,auVar30);
                  auVar31 = vcmpps_avx(auVar31,auVar29,0);
                  auVar29 = auVar142 & auVar31;
                  if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar29 >> 0x7f,0) != '\0') ||
                        (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar29 >> 0xbf,0) != '\0') ||
                      (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar29[0x1f] < '\0') {
                    auVar142 = vandps_avx(auVar31,auVar142);
                  }
                  uVar124 = vmovmskps_avx(auVar142);
                  uVar126 = 0;
                  if (uVar124 != 0) {
                    for (; (uVar124 >> uVar126 & 1) == 0; uVar126 = uVar126 + 1) {
                    }
                  }
                  uVar125 = (ulong)uVar126;
                } while( true );
              }
              fVar272 = local_1a0[uVar125];
              fVar219 = 1.0 - fVar272;
              fVar322 = fVar272 * 3.0;
              auVar166 = ZEXT416((uint)((fVar219 * -2.0 * fVar272 + fVar272 * fVar272) * 0.5));
              auVar166 = vshufps_avx(auVar166,auVar166,0);
              auVar195 = ZEXT416((uint)(((fVar219 + fVar219) * (fVar322 + 2.0) +
                                        fVar219 * fVar219 * -3.0) * 0.5));
              auVar195 = vshufps_avx(auVar195,auVar195,0);
              auVar196 = ZEXT416((uint)(((fVar272 + fVar272) * (fVar322 + -5.0) + fVar272 * fVar322)
                                       * 0.5));
              auVar196 = vshufps_avx(auVar196,auVar196,0);
              fVar322 = *(float *)((long)&local_180 + uVar125 * 4);
              auVar208 = ZEXT416((uint)((fVar272 * (fVar219 + fVar219) - fVar219 * fVar219) * 0.5));
              auVar208 = vshufps_avx(auVar208,auVar208,0);
              auVar165._0_4_ =
                   auVar208._0_4_ * fVar229 +
                   auVar196._0_4_ * fVar312 + auVar166._0_4_ * fVar344 + auVar195._0_4_ * fVar336;
              auVar165._4_4_ =
                   auVar208._4_4_ * fVar241 +
                   auVar196._4_4_ * fVar321 + auVar166._4_4_ * fVar349 + auVar195._4_4_ * fVar340;
              auVar165._8_4_ =
                   auVar208._8_4_ * auVar233._8_4_ +
                   auVar196._8_4_ * auVar314._8_4_ +
                   auVar166._8_4_ * auVar346._8_4_ + auVar195._8_4_ * auVar338._8_4_;
              auVar165._12_4_ =
                   auVar208._12_4_ * auVar233._12_4_ +
                   auVar196._12_4_ * auVar314._12_4_ +
                   auVar166._12_4_ * auVar346._12_4_ + auVar195._12_4_ * auVar338._12_4_;
              auVar215 = ZEXT464((uint)*(float *)(local_160 + uVar125 * 4));
              (local_7b8->super_RayK<1>).tfar = *(float *)(local_160 + uVar125 * 4);
              uVar12 = vmovlps_avx(auVar165);
              *(undefined8 *)&(local_7b8->Ng).field_0 = uVar12;
              fVar219 = (float)vextractps_avx(auVar165,2);
              (local_7b8->Ng).field_0.field_0.z = fVar219;
              local_7b8->u = fVar272;
              local_7b8->v = fVar322;
              local_7b8->primID = uVar124;
              local_7b8->geomID = uVar126;
              local_7b8->instID[0] = context->user->instID[0];
              local_7b8->instPrimID[0] = context->user->instPrimID[0];
              prim = local_770;
            }
          }
        }
      }
LAB_00fa362f:
      local_4c0 = auVar295;
      auVar175 = ZEXT1664(local_6a0._0_16_);
      if (8 < (int)uVar15) {
        _local_640 = auVar304;
        _local_560 = vpshufd_avx(ZEXT416(uVar15),0);
        auVar166 = vshufps_avx(local_6a0._0_16_,local_6a0._0_16_,0);
        local_2e0._16_16_ = auVar166;
        local_2e0._0_16_ = auVar166;
        auVar166 = vpermilps_avx(local_3a0._0_16_,0xff);
        local_c0._16_16_ = auVar166;
        local_c0._0_16_ = auVar166;
        auVar137._0_4_ = 1.0 / local_3c0;
        auVar137._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar166 = vshufps_avx(auVar137,auVar137,0);
        register0x00001210 = auVar166;
        _local_e0 = auVar166;
        auVar148 = ZEXT3264(_local_e0);
        lVar127 = 8;
        fVar272 = (float)local_5a0._0_4_;
        fVar322 = (float)local_5a0._4_4_;
        fVar219 = fStack_598;
        fVar240 = fStack_594;
        fVar255 = fStack_590;
        fVar323 = fStack_58c;
        fVar203 = fStack_588;
        fVar218 = fStack_584;
        fVar281 = (float)local_5e0._0_4_;
        fVar324 = (float)local_5e0._4_4_;
        fVar184 = fStack_5d8;
        fVar221 = fStack_5d4;
        fVar282 = fStack_5d0;
        fVar186 = fStack_5cc;
        fVar325 = fStack_5c8;
LAB_00fa3715:
        pauVar9 = (undefined1 (*) [28])(catmullrom_basis0 + lVar127 * 4 + lVar20);
        fVar308 = *(float *)*pauVar9;
        fVar226 = *(float *)(*pauVar9 + 4);
        fVar309 = *(float *)(*pauVar9 + 8);
        fVar183 = *(float *)(*pauVar9 + 0xc);
        fVar310 = *(float *)(*pauVar9 + 0x10);
        fVar283 = *(float *)(*pauVar9 + 0x14);
        fVar311 = *(float *)(*pauVar9 + 0x18);
        auVar118 = *pauVar9;
        pauVar9 = (undefined1 (*) [28])(lVar20 + 0x21b37f0 + lVar127 * 4);
        fVar257 = *(float *)*pauVar9;
        fVar265 = *(float *)(*pauVar9 + 4);
        fVar266 = *(float *)(*pauVar9 + 8);
        fVar267 = *(float *)(*pauVar9 + 0xc);
        fVar268 = *(float *)(*pauVar9 + 0x10);
        fVar269 = *(float *)(*pauVar9 + 0x14);
        fVar270 = *(float *)(*pauVar9 + 0x18);
        auVar117 = *pauVar9;
        pauVar9 = (undefined1 (*) [28])(lVar20 + 0x21b3c74 + lVar127 * 4);
        fVar132 = *(float *)*pauVar9;
        fVar149 = *(float *)(*pauVar9 + 4);
        fVar151 = *(float *)(*pauVar9 + 8);
        fVar187 = *(float *)(*pauVar9 + 0xc);
        fVar302 = *(float *)(*pauVar9 + 0x10);
        fVar155 = *(float *)(*pauVar9 + 0x14);
        fVar157 = *(float *)(*pauVar9 + 0x18);
        auVar116 = *pauVar9;
        pfVar1 = (float *)(lVar20 + 0x21b40f8 + lVar127 * 4);
        fVar205 = *pfVar1;
        fVar217 = pfVar1[1];
        fVar220 = pfVar1[2];
        fVar223 = pfVar1[3];
        fVar224 = pfVar1[4];
        fVar225 = pfVar1[5];
        fVar227 = pfVar1[6];
        fVar245 = auVar215._28_4_;
        fStack_784 = fVar245 + fVar245 + auVar148._28_4_;
        fVar244 = fVar245 + fVar245 + pfVar1[7];
        auVar296._0_4_ =
             (float)local_360._0_4_ * fVar308 +
             fVar326 * fVar257 + fVar281 * fVar132 + (float)local_3e0._0_4_ * fVar205;
        auVar296._4_4_ =
             (float)local_360._4_4_ * fVar226 +
             fVar330 * fVar265 + fVar324 * fVar149 + (float)local_3e0._4_4_ * fVar217;
        auVar296._8_4_ =
             fStack_358 * fVar309 + fVar332 * fVar266 + fVar184 * fVar151 + fStack_3d8 * fVar220;
        auVar296._12_4_ =
             fStack_354 * fVar183 + fVar334 * fVar267 + fVar221 * fVar187 + fStack_3d4 * fVar223;
        auVar296._16_4_ =
             fStack_350 * fVar310 + fVar216 * fVar268 + fVar282 * fVar302 + fStack_3d0 * fVar224;
        auVar296._20_4_ =
             fStack_34c * fVar283 + fVar222 * fVar269 + fVar186 * fVar155 + fStack_3cc * fVar225;
        auVar296._24_4_ =
             fStack_348 * fVar311 + fVar228 * fVar270 + fVar325 * fVar157 + fStack_3c8 * fVar227;
        auVar296._28_4_ = fVar245 + pfVar1[7] + fStack_784;
        local_6a0._0_4_ =
             (float)local_380._0_4_ * fVar308 +
             fVar247 * fVar257 + fVar188 * fVar132 + fVar272 * fVar205;
        local_6a0._4_4_ =
             (float)local_380._4_4_ * fVar226 +
             fVar252 * fVar265 + fVar200 * fVar149 + fVar322 * fVar217;
        local_6a0._8_4_ =
             fStack_378 * fVar309 + fVar254 * fVar266 + fVar201 * fVar151 + fVar219 * fVar220;
        local_6a0._12_4_ =
             fStack_374 * fVar183 + fVar256 * fVar267 + fVar202 * fVar187 + fVar240 * fVar223;
        local_6a0._16_4_ =
             fStack_370 * fVar310 + fVar176 * fVar268 + fVar243 * fVar302 + fVar255 * fVar224;
        local_6a0._20_4_ =
             fStack_36c * fVar283 + fVar178 * fVar269 + fVar246 * fVar155 + fVar323 * fVar225;
        local_6a0._24_4_ =
             fStack_368 * fVar311 + fVar204 * fVar270 + fVar251 * fVar157 + fVar203 * fVar227;
        local_6a0._28_4_ = fStack_784 + fVar245 + fVar245 + auVar175._28_4_;
        local_7a0._0_4_ =
             fVar308 * (float)local_120._0_4_ +
             (float)local_a0._0_4_ * fVar257 +
             fVar132 * (float)local_100._0_4_ + (float)local_80._0_4_ * fVar205;
        local_7a0._4_4_ =
             fVar226 * (float)local_120._4_4_ +
             (float)local_a0._4_4_ * fVar265 +
             fVar149 * (float)local_100._4_4_ + (float)local_80._4_4_ * fVar217;
        fStack_798 = fVar309 * fStack_118 +
                     fStack_98 * fVar266 + fVar151 * fStack_f8 + fStack_78 * fVar220;
        fStack_794 = fVar183 * fStack_114 +
                     fStack_94 * fVar267 + fVar187 * fStack_f4 + fStack_74 * fVar223;
        fStack_790 = fVar310 * fStack_110 +
                     fStack_90 * fVar268 + fVar302 * fStack_f0 + fStack_70 * fVar224;
        fStack_78c = fVar283 * fStack_10c +
                     fStack_8c * fVar269 + fVar155 * fStack_ec + fStack_6c * fVar225;
        fStack_788 = fVar311 * fStack_108 +
                     fStack_88 * fVar270 + fVar157 * fStack_e8 + fStack_68 * fVar227;
        fStack_784 = fStack_784 + fVar244;
        pauVar9 = (undefined1 (*) [28])(catmullrom_basis1 + lVar127 * 4 + lVar20);
        fVar281 = *(float *)*pauVar9;
        fVar324 = *(float *)(*pauVar9 + 4);
        fVar184 = *(float *)(*pauVar9 + 8);
        fVar221 = *(float *)(*pauVar9 + 0xc);
        fVar282 = *(float *)(*pauVar9 + 0x10);
        fVar186 = *(float *)(*pauVar9 + 0x14);
        fVar325 = *(float *)(*pauVar9 + 0x18);
        auVar120 = *pauVar9;
        pfVar1 = (float *)(lVar20 + 0x21b5c10 + lVar127 * 4);
        fVar308 = *pfVar1;
        fVar226 = pfVar1[1];
        fVar309 = pfVar1[2];
        fVar183 = pfVar1[3];
        fVar310 = pfVar1[4];
        fVar283 = pfVar1[5];
        fVar311 = pfVar1[6];
        auVar142 = *(undefined1 (*) [32])(lVar20 + 0x21b6094 + lVar127 * 4);
        pauVar9 = (undefined1 (*) [28])(lVar20 + 0x21b6518 + lVar127 * 4);
        fVar257 = *(float *)*pauVar9;
        fVar265 = *(float *)(*pauVar9 + 4);
        fVar266 = *(float *)(*pauVar9 + 8);
        fVar267 = *(float *)(*pauVar9 + 0xc);
        fVar268 = *(float *)(*pauVar9 + 0x10);
        fVar269 = *(float *)(*pauVar9 + 0x14);
        fVar270 = *(float *)(*pauVar9 + 0x18);
        auVar119 = *pauVar9;
        auVar148 = ZEXT3264(auVar142);
        fVar132 = auVar142._0_4_;
        fVar149 = auVar142._4_4_;
        fVar151 = auVar142._8_4_;
        fVar187 = auVar142._12_4_;
        fVar302 = auVar142._16_4_;
        fVar155 = auVar142._20_4_;
        fVar157 = auVar142._24_4_;
        fVar271 = fVar218 + fStack_64;
        fVar245 = fVar218 + fVar218 + fVar244;
        auVar318._0_4_ =
             (float)local_360._0_4_ * fVar281 +
             fVar326 * fVar308 + fVar132 * (float)local_5e0._0_4_ + (float)local_3e0._0_4_ * fVar257
        ;
        auVar318._4_4_ =
             (float)local_360._4_4_ * fVar324 +
             fVar330 * fVar226 + fVar149 * (float)local_5e0._4_4_ + (float)local_3e0._4_4_ * fVar265
        ;
        auVar318._8_4_ =
             fStack_358 * fVar184 + fVar332 * fVar309 + fVar151 * fStack_5d8 + fStack_3d8 * fVar266;
        auVar318._12_4_ =
             fStack_354 * fVar221 + fVar334 * fVar183 + fVar187 * fStack_5d4 + fStack_3d4 * fVar267;
        auVar318._16_4_ =
             fStack_350 * fVar282 + fVar216 * fVar310 + fVar302 * fStack_5d0 + fStack_3d0 * fVar268;
        auVar318._20_4_ =
             fStack_34c * fVar186 + fVar222 * fVar283 + fVar155 * fStack_5cc + fStack_3cc * fVar269;
        auVar318._24_4_ =
             fStack_348 * fVar325 + fVar228 * fVar311 + fVar157 * fStack_5c8 + fStack_3c8 * fVar270;
        auVar318._28_4_ = fVar271 + fVar245;
        local_3a0._0_4_ =
             fVar281 * (float)local_380._0_4_ +
             fVar247 * fVar308 + fVar188 * fVar132 + fVar272 * fVar257;
        local_3a0._4_4_ =
             fVar324 * (float)local_380._4_4_ +
             fVar252 * fVar226 + fVar200 * fVar149 + fVar322 * fVar265;
        local_3a0._8_4_ =
             fVar184 * fStack_378 + fVar254 * fVar309 + fVar201 * fVar151 + fVar219 * fVar266;
        local_3a0._12_4_ =
             fVar221 * fStack_374 + fVar256 * fVar183 + fVar202 * fVar187 + fVar240 * fVar267;
        local_3a0._16_4_ =
             fVar282 * fStack_370 + fVar176 * fVar310 + fVar243 * fVar302 + fVar255 * fVar268;
        local_3a0._20_4_ =
             fVar186 * fStack_36c + fVar178 * fVar283 + fVar246 * fVar155 + fVar323 * fVar269;
        local_3a0._24_4_ =
             fVar325 * fStack_368 + fVar204 * fVar311 + fVar251 * fVar157 + fVar203 * fVar270;
        local_3a0._28_4_ = fVar245 + fVar218 + fVar218 + fVar242;
        auVar280._0_4_ =
             (float)local_a0._0_4_ * fVar308 +
             fVar132 * (float)local_100._0_4_ + (float)local_80._0_4_ * fVar257 +
             fVar281 * (float)local_120._0_4_;
        auVar280._4_4_ =
             (float)local_a0._4_4_ * fVar226 +
             fVar149 * (float)local_100._4_4_ + (float)local_80._4_4_ * fVar265 +
             fVar324 * (float)local_120._4_4_;
        auVar280._8_4_ =
             fStack_98 * fVar309 + fVar151 * fStack_f8 + fStack_78 * fVar266 + fVar184 * fStack_118;
        auVar280._12_4_ =
             fStack_94 * fVar183 + fVar187 * fStack_f4 + fStack_74 * fVar267 + fVar221 * fStack_114;
        auVar280._16_4_ =
             fStack_90 * fVar310 + fVar302 * fStack_f0 + fStack_70 * fVar268 + fVar282 * fStack_110;
        auVar280._20_4_ =
             fStack_8c * fVar283 + fVar155 * fStack_ec + fStack_6c * fVar269 + fVar186 * fStack_10c;
        auVar280._24_4_ =
             fStack_88 * fVar311 + fVar157 * fStack_e8 + fStack_68 * fVar270 + fVar325 * fStack_108;
        auVar280._28_4_ = fVar218 + fVar271 + fVar245;
        auVar29 = vsubps_avx(auVar318,auVar296);
        auVar30 = vsubps_avx(local_3a0,local_6a0._0_32_);
        fVar222 = auVar29._0_4_;
        fVar228 = auVar29._4_4_;
        auVar68._4_4_ = fVar228 * local_6a0._4_4_;
        auVar68._0_4_ = fVar222 * local_6a0._0_4_;
        fVar240 = auVar29._8_4_;
        auVar68._8_4_ = fVar240 * local_6a0._8_4_;
        fVar242 = auVar29._12_4_;
        auVar68._12_4_ = fVar242 * local_6a0._12_4_;
        fVar255 = auVar29._16_4_;
        auVar68._16_4_ = fVar255 * local_6a0._16_4_;
        fVar323 = auVar29._20_4_;
        auVar68._20_4_ = fVar323 * local_6a0._20_4_;
        fVar203 = auVar29._24_4_;
        auVar68._24_4_ = fVar203 * local_6a0._24_4_;
        auVar68._28_4_ = fVar245;
        fVar272 = auVar30._0_4_;
        fVar176 = auVar30._4_4_;
        auVar69._4_4_ = auVar296._4_4_ * fVar176;
        auVar69._0_4_ = auVar296._0_4_ * fVar272;
        fVar178 = auVar30._8_4_;
        auVar69._8_4_ = auVar296._8_4_ * fVar178;
        fVar322 = auVar30._12_4_;
        auVar69._12_4_ = auVar296._12_4_ * fVar322;
        fVar204 = auVar30._16_4_;
        auVar69._16_4_ = auVar296._16_4_ * fVar204;
        fVar216 = auVar30._20_4_;
        auVar69._20_4_ = auVar296._20_4_ * fVar216;
        fVar219 = auVar30._24_4_;
        auVar69._24_4_ = auVar296._24_4_ * fVar219;
        auVar69._28_4_ = local_3a0._28_4_;
        auVar34 = vsubps_avx(auVar68,auVar69);
        auVar175 = ZEXT3264(_local_7a0);
        auVar31 = vmaxps_avx(_local_7a0,auVar280);
        auVar70._4_4_ = auVar31._4_4_ * auVar31._4_4_ * (fVar228 * fVar228 + fVar176 * fVar176);
        auVar70._0_4_ = auVar31._0_4_ * auVar31._0_4_ * (fVar222 * fVar222 + fVar272 * fVar272);
        auVar70._8_4_ = auVar31._8_4_ * auVar31._8_4_ * (fVar240 * fVar240 + fVar178 * fVar178);
        auVar70._12_4_ = auVar31._12_4_ * auVar31._12_4_ * (fVar242 * fVar242 + fVar322 * fVar322);
        auVar70._16_4_ = auVar31._16_4_ * auVar31._16_4_ * (fVar255 * fVar255 + fVar204 * fVar204);
        auVar70._20_4_ = auVar31._20_4_ * auVar31._20_4_ * (fVar323 * fVar323 + fVar216 * fVar216);
        auVar70._24_4_ = auVar31._24_4_ * auVar31._24_4_ * (fVar203 * fVar203 + fVar219 * fVar219);
        auVar70._28_4_ = fVar271 + local_3a0._28_4_;
        auVar71._4_4_ = auVar34._4_4_ * auVar34._4_4_;
        auVar71._0_4_ = auVar34._0_4_ * auVar34._0_4_;
        auVar71._8_4_ = auVar34._8_4_ * auVar34._8_4_;
        auVar71._12_4_ = auVar34._12_4_ * auVar34._12_4_;
        auVar71._16_4_ = auVar34._16_4_ * auVar34._16_4_;
        auVar71._20_4_ = auVar34._20_4_ * auVar34._20_4_;
        auVar71._24_4_ = auVar34._24_4_ * auVar34._24_4_;
        auVar71._28_4_ = auVar34._28_4_;
        auVar31 = vcmpps_avx(auVar71,auVar70,2);
        local_220 = (uint)lVar127;
        auVar195 = vpshufd_avx(ZEXT416(local_220),0);
        auVar166 = vpor_avx(auVar195,_DAT_01f7fcf0);
        auVar195 = vpor_avx(auVar195,_DAT_01fafea0);
        auVar166 = vpcmpgtd_avx(_local_560,auVar166);
        auVar195 = vpcmpgtd_avx(_local_560,auVar195);
        register0x000012d0 = auVar195;
        _local_400 = auVar166;
        auVar215 = ZEXT3264(_local_400);
        auVar34 = _local_400 & auVar31;
        fVar247 = (float)local_6e0._0_4_;
        fVar252 = (float)local_6e0._4_4_;
        fVar254 = fStack_6d8;
        fVar256 = fStack_6d4;
        fVar176 = fStack_6d0;
        fVar178 = fStack_6cc;
        fVar204 = fStack_6c8;
        fVar272 = (float)local_5a0._0_4_;
        fVar322 = (float)local_5a0._4_4_;
        fVar219 = fStack_598;
        fVar240 = fStack_594;
        fVar255 = fStack_590;
        fVar323 = fStack_58c;
        fVar203 = fStack_588;
        fVar218 = fStack_584;
        fVar281 = (float)local_5e0._0_4_;
        fVar324 = (float)local_5e0._4_4_;
        fVar184 = fStack_5d8;
        fVar221 = fStack_5d4;
        fVar282 = fStack_5d0;
        fVar186 = fStack_5cc;
        fVar325 = fStack_5c8;
        fVar326 = (float)local_700._0_4_;
        fVar330 = (float)local_700._4_4_;
        fVar332 = fStack_6f8;
        fVar334 = fStack_6f4;
        fVar216 = fStack_6f0;
        fVar222 = fStack_6ec;
        fVar228 = fStack_6e8;
        fVar242 = fStack_6e4;
        if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar34 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar34 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar34 >> 0x7f,0) != '\0') ||
              (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar34 >> 0xbf,0) != '\0') ||
            (auVar34 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar34[0x1f] < '\0') {
          local_5c0._0_4_ = auVar120._0_4_;
          local_5c0._4_4_ = auVar120._4_4_;
          fStack_5b8 = auVar120._8_4_;
          fStack_5b4 = auVar120._12_4_;
          fStack_5b0 = auVar120._16_4_;
          fStack_5ac = auVar120._20_4_;
          fStack_5a8 = auVar120._24_4_;
          fVar257 = (float)local_640._0_4_ * (float)local_5c0._0_4_;
          fVar265 = (float)local_640._4_4_ * (float)local_5c0._4_4_;
          fVar266 = fStack_638 * fStack_5b8;
          fVar267 = fStack_634 * fStack_5b4;
          fVar268 = fStack_630 * fStack_5b0;
          fVar269 = fStack_62c * fStack_5ac;
          fVar270 = fStack_628 * fStack_5a8;
          _local_5c0 = auVar280;
          local_540._0_4_ = auVar119._0_4_;
          local_540._4_4_ = auVar119._4_4_;
          fStack_538 = auVar119._8_4_;
          fStack_534 = auVar119._12_4_;
          fStack_530 = auVar119._16_4_;
          fStack_52c = auVar119._20_4_;
          fStack_528 = auVar119._24_4_;
          local_540._0_4_ =
               fVar257 + fVar308 * (float)local_340._0_4_ +
                         (float)local_2c0._0_4_ * fVar132 +
                         (float)local_600._0_4_ * (float)local_540._0_4_;
          local_540._4_4_ =
               fVar265 + fVar226 * (float)local_340._4_4_ +
                         (float)local_2c0._4_4_ * fVar149 +
                         (float)local_600._4_4_ * (float)local_540._4_4_;
          fStack_538 = fVar266 + fVar309 * fStack_338 +
                                 fStack_2b8 * fVar151 + fStack_5f8 * fStack_538;
          fStack_534 = fVar267 + fVar183 * fStack_334 +
                                 fStack_2b4 * fVar187 + fStack_5f4 * fStack_534;
          fStack_530 = fVar268 + fVar310 * fStack_330 +
                                 fStack_2b0 * fVar302 + fStack_5f0 * fStack_530;
          fStack_52c = fVar269 + fVar283 * fStack_32c +
                                 fStack_2ac * fVar155 + fStack_5ec * fStack_52c;
          fStack_528 = fVar270 + fVar311 * fStack_328 +
                                 fStack_2a8 * fVar157 + fStack_5e8 * fStack_528;
          fStack_524 = auVar296._28_4_ + auVar142._28_4_ + fStack_624 + 0.0;
          local_500._0_4_ = auVar117._0_4_;
          local_500._4_4_ = auVar117._4_4_;
          fStack_4f8 = auVar117._8_4_;
          fStack_4f4 = auVar117._12_4_;
          fStack_4f0 = auVar117._16_4_;
          fStack_4ec = auVar117._20_4_;
          fStack_4e8 = auVar117._24_4_;
          fVar241 = (float)local_340._0_4_ * (float)local_500._0_4_;
          fVar150 = (float)local_340._4_4_ * (float)local_500._4_4_;
          fVar152 = fStack_338 * fStack_4f8;
          fVar153 = fStack_334 * fStack_4f4;
          fVar154 = fStack_330 * fStack_4f0;
          fVar156 = fStack_32c * fStack_4ec;
          fVar158 = fStack_328 * fStack_4e8;
          local_520._0_4_ = auVar116._0_4_;
          local_520._4_4_ = auVar116._4_4_;
          fStack_518 = auVar116._8_4_;
          fStack_514 = auVar116._12_4_;
          fStack_510 = auVar116._16_4_;
          fStack_50c = auVar116._20_4_;
          fStack_508 = auVar116._24_4_;
          fVar160 = (float)local_2c0._0_4_ * (float)local_520._0_4_;
          fVar177 = (float)local_2c0._4_4_ * (float)local_520._4_4_;
          fVar179 = fStack_2b8 * fStack_518;
          fVar181 = fStack_2b4 * fStack_514;
          fVar182 = fStack_2b0 * fStack_510;
          fVar185 = fStack_2ac * fStack_50c;
          fVar312 = fStack_2a8 * fStack_508;
          pfVar2 = (float *)(lVar20 + 0x21b4e84 + lVar127 * 4);
          fVar308 = *pfVar2;
          fVar226 = pfVar2[1];
          fVar309 = pfVar2[2];
          fVar183 = pfVar2[3];
          fVar310 = pfVar2[4];
          fVar283 = pfVar2[5];
          fVar311 = pfVar2[6];
          pfVar3 = (float *)(lVar20 + 0x21b5308 + lVar127 * 4);
          fVar257 = *pfVar3;
          fVar265 = pfVar3[1];
          fVar266 = pfVar3[2];
          fVar267 = pfVar3[3];
          fVar268 = pfVar3[4];
          fVar269 = pfVar3[5];
          fVar270 = pfVar3[6];
          _local_520 = auVar318;
          pfVar4 = (float *)(lVar20 + 0x21b4a00 + lVar127 * 4);
          fVar132 = *pfVar4;
          fVar149 = pfVar4[1];
          fVar151 = pfVar4[2];
          fVar187 = pfVar4[3];
          fVar302 = pfVar4[4];
          fVar155 = pfVar4[5];
          fVar157 = pfVar4[6];
          fVar159 = pfVar2[7] + pfVar3[7];
          fStack_3a4 = pfVar3[7] + fVar253 + 0.0;
          fVar321 = fVar253 + pfVar1[7] + fVar253 + 0.0;
          pfVar1 = (float *)(lVar20 + 0x21b457c + lVar127 * 4);
          fVar253 = *pfVar1;
          fVar245 = pfVar1[1];
          fVar244 = pfVar1[2];
          fVar271 = pfVar1[3];
          fVar180 = pfVar1[4];
          fVar229 = pfVar1[5];
          fVar230 = pfVar1[6];
          local_420 = fVar253 * (float)local_360._0_4_ +
                      fVar132 * (float)local_700._0_4_ +
                      (float)local_5e0._0_4_ * fVar308 + (float)local_3e0._0_4_ * fVar257;
          fStack_41c = fVar245 * (float)local_360._4_4_ +
                       fVar149 * (float)local_700._4_4_ +
                       (float)local_5e0._4_4_ * fVar226 + (float)local_3e0._4_4_ * fVar265;
          fStack_418 = fVar244 * fStack_358 +
                       fVar151 * fStack_6f8 + fStack_5d8 * fVar309 + fStack_3d8 * fVar266;
          fStack_414 = fVar271 * fStack_354 +
                       fVar187 * fStack_6f4 + fStack_5d4 * fVar183 + fStack_3d4 * fVar267;
          fStack_410 = fVar180 * fStack_350 +
                       fVar302 * fStack_6f0 + fStack_5d0 * fVar310 + fStack_3d0 * fVar268;
          fStack_40c = fVar229 * fStack_34c +
                       fVar155 * fStack_6ec + fStack_5cc * fVar283 + fStack_3cc * fVar269;
          fStack_408 = fVar230 * fStack_348 +
                       fVar157 * fStack_6e8 + fStack_5c8 * fVar311 + fStack_3c8 * fVar270;
          fStack_404 = fVar159 + fStack_3a4;
          local_3c0 = fVar253 * (float)local_380._0_4_ +
                      fVar188 * fVar308 + (float)local_5a0._0_4_ * fVar257 +
                      (float)local_6e0._0_4_ * fVar132;
          fStack_3bc = fVar245 * (float)local_380._4_4_ +
                       fVar200 * fVar226 + (float)local_5a0._4_4_ * fVar265 +
                       (float)local_6e0._4_4_ * fVar149;
          fStack_3b8 = fVar244 * fStack_378 +
                       fVar201 * fVar309 + fStack_598 * fVar266 + fStack_6d8 * fVar151;
          fStack_3b4 = fVar271 * fStack_374 +
                       fVar202 * fVar183 + fStack_594 * fVar267 + fStack_6d4 * fVar187;
          fStack_3b0 = fVar180 * fStack_370 +
                       fVar243 * fVar310 + fStack_590 * fVar268 + fStack_6d0 * fVar302;
          fStack_3ac = fVar229 * fStack_36c +
                       fVar246 * fVar283 + fStack_58c * fVar269 + fStack_6cc * fVar155;
          fStack_3a8 = fVar230 * fStack_368 +
                       fVar251 * fVar311 + fStack_588 * fVar270 + fStack_6c8 * fVar157;
          fStack_3a4 = fStack_3a4 + fVar321;
          auVar328._0_4_ =
               fVar132 * (float)local_340._0_4_ +
               (float)local_2c0._0_4_ * fVar308 + (float)local_600._0_4_ * fVar257 +
               fVar253 * (float)local_640._0_4_;
          auVar328._4_4_ =
               fVar149 * (float)local_340._4_4_ +
               (float)local_2c0._4_4_ * fVar226 + (float)local_600._4_4_ * fVar265 +
               fVar245 * (float)local_640._4_4_;
          auVar328._8_4_ =
               fVar151 * fStack_338 + fStack_2b8 * fVar309 + fStack_5f8 * fVar266 +
               fVar244 * fStack_638;
          auVar328._12_4_ =
               fVar187 * fStack_334 + fStack_2b4 * fVar183 + fStack_5f4 * fVar267 +
               fVar271 * fStack_634;
          auVar328._16_4_ =
               fVar302 * fStack_330 + fStack_2b0 * fVar310 + fStack_5f0 * fVar268 +
               fVar180 * fStack_630;
          auVar328._20_4_ =
               fVar155 * fStack_32c + fStack_2ac * fVar283 + fStack_5ec * fVar269 +
               fVar229 * fStack_62c;
          auVar328._24_4_ =
               fVar157 * fStack_328 + fStack_2a8 * fVar311 + fStack_5e8 * fVar270 +
               fVar230 * fStack_628;
          auVar328._28_4_ = pfVar4[7] + fVar159 + fVar321;
          pfVar1 = (float *)(lVar20 + 0x21b72a4 + lVar127 * 4);
          fVar253 = *pfVar1;
          fVar308 = pfVar1[1];
          fVar226 = pfVar1[2];
          fVar309 = pfVar1[3];
          fVar183 = pfVar1[4];
          fVar310 = pfVar1[5];
          fVar283 = pfVar1[6];
          pfVar2 = (float *)(lVar20 + 0x21b7728 + lVar127 * 4);
          fVar311 = *pfVar2;
          fVar257 = pfVar2[1];
          fVar265 = pfVar2[2];
          fVar266 = pfVar2[3];
          fVar267 = pfVar2[4];
          fVar268 = pfVar2[5];
          fVar269 = pfVar2[6];
          _local_500 = auVar31;
          pfVar3 = (float *)(lVar20 + 0x21b6e20 + lVar127 * 4);
          fVar270 = *pfVar3;
          fVar132 = pfVar3[1];
          fVar149 = pfVar3[2];
          fVar151 = pfVar3[3];
          fVar187 = pfVar3[4];
          fVar302 = pfVar3[5];
          fVar155 = pfVar3[6];
          pfVar4 = (float *)(lVar20 + 0x21b699c + lVar127 * 4);
          fVar157 = *pfVar4;
          fVar245 = pfVar4[1];
          fVar244 = pfVar4[2];
          fVar271 = pfVar4[3];
          fVar180 = pfVar4[4];
          fVar229 = pfVar4[5];
          fVar230 = pfVar4[6];
          auVar297._0_4_ =
               fVar157 * (float)local_360._0_4_ +
               fVar270 * (float)local_700._0_4_ +
               (float)local_5e0._0_4_ * fVar253 + (float)local_3e0._0_4_ * fVar311;
          auVar297._4_4_ =
               fVar245 * (float)local_360._4_4_ +
               fVar132 * (float)local_700._4_4_ +
               (float)local_5e0._4_4_ * fVar308 + (float)local_3e0._4_4_ * fVar257;
          auVar297._8_4_ =
               fVar244 * fStack_358 +
               fVar149 * fStack_6f8 + fStack_5d8 * fVar226 + fStack_3d8 * fVar265;
          auVar297._12_4_ =
               fVar271 * fStack_354 +
               fVar151 * fStack_6f4 + fStack_5d4 * fVar309 + fStack_3d4 * fVar266;
          auVar297._16_4_ =
               fVar180 * fStack_350 +
               fVar187 * fStack_6f0 + fStack_5d0 * fVar183 + fStack_3d0 * fVar267;
          auVar297._20_4_ =
               fVar229 * fStack_34c +
               fVar302 * fStack_6ec + fStack_5cc * fVar310 + fStack_3cc * fVar268;
          auVar297._24_4_ =
               fVar230 * fStack_348 +
               fVar155 * fStack_6e8 + fStack_5c8 * fVar283 + fStack_3c8 * fVar269;
          auVar297._28_4_ = fStack_584 + fStack_584 + fStack_3c4 + fStack_3a4;
          auVar319._0_4_ =
               fVar157 * (float)local_380._0_4_ +
               (float)local_6e0._0_4_ * fVar270 +
               fVar188 * fVar253 + (float)local_5a0._0_4_ * fVar311;
          auVar319._4_4_ =
               fVar245 * (float)local_380._4_4_ +
               (float)local_6e0._4_4_ * fVar132 +
               fVar200 * fVar308 + (float)local_5a0._4_4_ * fVar257;
          auVar319._8_4_ =
               fVar244 * fStack_378 +
               fStack_6d8 * fVar149 + fVar201 * fVar226 + fStack_598 * fVar265;
          auVar319._12_4_ =
               fVar271 * fStack_374 +
               fStack_6d4 * fVar151 + fVar202 * fVar309 + fStack_594 * fVar266;
          auVar319._16_4_ =
               fVar180 * fStack_370 +
               fStack_6d0 * fVar187 + fVar243 * fVar183 + fStack_590 * fVar267;
          auVar319._20_4_ =
               fVar229 * fStack_36c +
               fStack_6cc * fVar302 + fVar246 * fVar310 + fStack_58c * fVar268;
          auVar319._24_4_ =
               fVar230 * fStack_368 +
               fStack_6c8 * fVar155 + fVar251 * fVar283 + fStack_588 * fVar269;
          auVar319._28_4_ = fStack_584 + fStack_584 + fStack_5c4 + fStack_584;
          auVar250._8_4_ = 0x7fffffff;
          auVar250._0_8_ = 0x7fffffff7fffffff;
          auVar250._12_4_ = 0x7fffffff;
          auVar250._16_4_ = 0x7fffffff;
          auVar250._20_4_ = 0x7fffffff;
          auVar250._24_4_ = 0x7fffffff;
          auVar250._28_4_ = 0x7fffffff;
          auVar114._4_4_ = fStack_41c;
          auVar114._0_4_ = local_420;
          auVar114._8_4_ = fStack_418;
          auVar114._12_4_ = fStack_414;
          auVar114._16_4_ = fStack_410;
          auVar114._20_4_ = fStack_40c;
          auVar114._24_4_ = fStack_408;
          auVar114._28_4_ = fStack_404;
          auVar142 = vandps_avx(auVar114,auVar250);
          auVar115._4_4_ = fStack_3bc;
          auVar115._0_4_ = local_3c0;
          auVar115._8_4_ = fStack_3b8;
          auVar115._12_4_ = fStack_3b4;
          auVar115._16_4_ = fStack_3b0;
          auVar115._20_4_ = fStack_3ac;
          auVar115._24_4_ = fStack_3a8;
          auVar115._28_4_ = fStack_3a4;
          auVar34 = vandps_avx(auVar115,auVar250);
          auVar34 = vmaxps_avx(auVar142,auVar34);
          auVar142 = vandps_avx(auVar328,auVar250);
          auVar34 = vmaxps_avx(auVar34,auVar142);
          auVar34 = vcmpps_avx(auVar34,local_2e0,1);
          auVar295 = vblendvps_avx(auVar114,auVar29,auVar34);
          auVar143._0_4_ =
               fVar157 * (float)local_640._0_4_ +
               fVar270 * (float)local_340._0_4_ +
               fVar311 * (float)local_600._0_4_ + (float)local_2c0._0_4_ * fVar253;
          auVar143._4_4_ =
               fVar245 * (float)local_640._4_4_ +
               fVar132 * (float)local_340._4_4_ +
               fVar257 * (float)local_600._4_4_ + (float)local_2c0._4_4_ * fVar308;
          auVar143._8_4_ =
               fVar244 * fStack_638 +
               fVar149 * fStack_338 + fVar265 * fStack_5f8 + fStack_2b8 * fVar226;
          auVar143._12_4_ =
               fVar271 * fStack_634 +
               fVar151 * fStack_334 + fVar266 * fStack_5f4 + fStack_2b4 * fVar309;
          auVar143._16_4_ =
               fVar180 * fStack_630 +
               fVar187 * fStack_330 + fVar267 * fStack_5f0 + fStack_2b0 * fVar183;
          auVar143._20_4_ =
               fVar229 * fStack_62c +
               fVar302 * fStack_32c + fVar268 * fStack_5ec + fStack_2ac * fVar310;
          auVar143._24_4_ =
               fVar230 * fStack_628 +
               fVar155 * fStack_328 + fVar269 * fStack_5e8 + fStack_2a8 * fVar283;
          auVar143._28_4_ = auVar142._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
          auVar210 = vblendvps_avx(auVar115,auVar30,auVar34);
          auVar142 = vandps_avx(auVar297,auVar250);
          auVar34 = vandps_avx(auVar319,auVar250);
          auVar211 = vmaxps_avx(auVar142,auVar34);
          auVar142 = vandps_avx(auVar143,auVar250);
          auVar142 = vmaxps_avx(auVar211,auVar142);
          local_4e0._0_4_ = auVar118._0_4_;
          local_4e0._4_4_ = auVar118._4_4_;
          fStack_4d8 = auVar118._8_4_;
          fStack_4d4 = auVar118._12_4_;
          auStack_4d0._0_4_ = auVar118._16_4_;
          auStack_4d0._4_4_ = auVar118._20_4_;
          fStack_4c8 = auVar118._24_4_;
          auVar34 = vcmpps_avx(auVar142,local_2e0,1);
          auVar142 = vblendvps_avx(auVar297,auVar29,auVar34);
          auVar144._0_4_ =
               (float)local_640._0_4_ * (float)local_4e0._0_4_ +
               fVar241 + fVar160 + (float)local_600._0_4_ * fVar205;
          auVar144._4_4_ =
               (float)local_640._4_4_ * (float)local_4e0._4_4_ +
               fVar150 + fVar177 + (float)local_600._4_4_ * fVar217;
          auVar144._8_4_ = fStack_638 * fStack_4d8 + fVar152 + fVar179 + fStack_5f8 * fVar220;
          auVar144._12_4_ = fStack_634 * fStack_4d4 + fVar153 + fVar181 + fStack_5f4 * fVar223;
          auVar144._16_4_ =
               fStack_630 * (float)auStack_4d0._0_4_ + fVar154 + fVar182 + fStack_5f0 * fVar224;
          auVar144._20_4_ =
               fStack_62c * (float)auStack_4d0._4_4_ + fVar156 + fVar185 + fStack_5ec * fVar225;
          auVar144._24_4_ = fStack_628 * fStack_4c8 + fVar158 + fVar312 + fStack_5e8 * fVar227;
          auVar144._28_4_ = auVar211._28_4_ + fStack_524 + fStack_624 + 0.0;
          auVar34 = vblendvps_avx(auVar319,auVar30,auVar34);
          fVar202 = auVar295._0_4_;
          fVar245 = auVar295._4_4_;
          fVar244 = auVar295._8_4_;
          fVar271 = auVar295._12_4_;
          fVar180 = auVar295._16_4_;
          fVar229 = auVar295._20_4_;
          fVar230 = auVar295._24_4_;
          fVar241 = auVar295._28_4_;
          fVar267 = auVar142._0_4_;
          fVar269 = auVar142._4_4_;
          fVar132 = auVar142._8_4_;
          fVar151 = auVar142._12_4_;
          fVar302 = auVar142._16_4_;
          fVar157 = auVar142._20_4_;
          fVar217 = auVar142._24_4_;
          fVar243 = auVar210._0_4_;
          fVar251 = auVar210._4_4_;
          fVar308 = auVar210._8_4_;
          fVar309 = auVar210._12_4_;
          fVar310 = auVar210._16_4_;
          fVar311 = auVar210._20_4_;
          fVar265 = auVar210._24_4_;
          auVar306._0_4_ = fVar243 * fVar243 + fVar202 * fVar202;
          auVar306._4_4_ = fVar251 * fVar251 + fVar245 * fVar245;
          auVar306._8_4_ = fVar308 * fVar308 + fVar244 * fVar244;
          auVar306._12_4_ = fVar309 * fVar309 + fVar271 * fVar271;
          auVar306._16_4_ = fVar310 * fVar310 + fVar180 * fVar180;
          auVar306._20_4_ = fVar311 * fVar311 + fVar229 * fVar229;
          auVar306._24_4_ = fVar265 * fVar265 + fVar230 * fVar230;
          auVar306._28_4_ = auVar29._28_4_ + auVar30._28_4_;
          auVar29 = vrsqrtps_avx(auVar306);
          fVar246 = auVar29._0_4_;
          fVar253 = auVar29._4_4_;
          auVar72._4_4_ = fVar253 * 1.5;
          auVar72._0_4_ = fVar246 * 1.5;
          fVar226 = auVar29._8_4_;
          auVar72._8_4_ = fVar226 * 1.5;
          fVar183 = auVar29._12_4_;
          auVar72._12_4_ = fVar183 * 1.5;
          fVar283 = auVar29._16_4_;
          auVar72._16_4_ = fVar283 * 1.5;
          fVar257 = auVar29._20_4_;
          auVar72._20_4_ = fVar257 * 1.5;
          fVar266 = auVar29._24_4_;
          auVar72._24_4_ = fVar266 * 1.5;
          auVar72._28_4_ = auVar319._28_4_;
          auVar73._4_4_ = fVar253 * fVar253 * fVar253 * auVar306._4_4_ * 0.5;
          auVar73._0_4_ = fVar246 * fVar246 * fVar246 * auVar306._0_4_ * 0.5;
          auVar73._8_4_ = fVar226 * fVar226 * fVar226 * auVar306._8_4_ * 0.5;
          auVar73._12_4_ = fVar183 * fVar183 * fVar183 * auVar306._12_4_ * 0.5;
          auVar73._16_4_ = fVar283 * fVar283 * fVar283 * auVar306._16_4_ * 0.5;
          auVar73._20_4_ = fVar257 * fVar257 * fVar257 * auVar306._20_4_ * 0.5;
          auVar73._24_4_ = fVar266 * fVar266 * fVar266 * auVar306._24_4_ * 0.5;
          auVar73._28_4_ = auVar306._28_4_;
          auVar30 = vsubps_avx(auVar72,auVar73);
          fVar223 = auVar30._0_4_;
          fVar224 = auVar30._4_4_;
          fVar225 = auVar30._8_4_;
          fVar227 = auVar30._12_4_;
          fVar188 = auVar30._16_4_;
          fVar200 = auVar30._20_4_;
          fVar201 = auVar30._24_4_;
          fVar246 = auVar34._0_4_;
          fVar253 = auVar34._4_4_;
          fVar226 = auVar34._8_4_;
          fVar183 = auVar34._12_4_;
          fVar283 = auVar34._16_4_;
          fVar257 = auVar34._20_4_;
          fVar266 = auVar34._24_4_;
          auVar288._0_4_ = fVar246 * fVar246 + fVar267 * fVar267;
          auVar288._4_4_ = fVar253 * fVar253 + fVar269 * fVar269;
          auVar288._8_4_ = fVar226 * fVar226 + fVar132 * fVar132;
          auVar288._12_4_ = fVar183 * fVar183 + fVar151 * fVar151;
          auVar288._16_4_ = fVar283 * fVar283 + fVar302 * fVar302;
          auVar288._20_4_ = fVar257 * fVar257 + fVar157 * fVar157;
          auVar288._24_4_ = fVar266 * fVar266 + fVar217 * fVar217;
          auVar288._28_4_ = auVar29._28_4_ + auVar142._28_4_;
          auVar142 = vrsqrtps_avx(auVar288);
          fVar268 = auVar142._0_4_;
          fVar270 = auVar142._4_4_;
          auVar74._4_4_ = fVar270 * 1.5;
          auVar74._0_4_ = fVar268 * 1.5;
          fVar149 = auVar142._8_4_;
          auVar74._8_4_ = fVar149 * 1.5;
          fVar187 = auVar142._12_4_;
          auVar74._12_4_ = fVar187 * 1.5;
          fVar155 = auVar142._16_4_;
          auVar74._16_4_ = fVar155 * 1.5;
          fVar205 = auVar142._20_4_;
          auVar74._20_4_ = fVar205 * 1.5;
          fVar220 = auVar142._24_4_;
          auVar74._24_4_ = fVar220 * 1.5;
          auVar74._28_4_ = auVar319._28_4_;
          auVar75._4_4_ = fVar270 * fVar270 * fVar270 * auVar288._4_4_ * 0.5;
          auVar75._0_4_ = fVar268 * fVar268 * fVar268 * auVar288._0_4_ * 0.5;
          auVar75._8_4_ = fVar149 * fVar149 * fVar149 * auVar288._8_4_ * 0.5;
          auVar75._12_4_ = fVar187 * fVar187 * fVar187 * auVar288._12_4_ * 0.5;
          auVar75._16_4_ = fVar155 * fVar155 * fVar155 * auVar288._16_4_ * 0.5;
          auVar75._20_4_ = fVar205 * fVar205 * fVar205 * auVar288._20_4_ * 0.5;
          auVar75._24_4_ = fVar220 * fVar220 * fVar220 * auVar288._24_4_ * 0.5;
          auVar75._28_4_ = auVar288._28_4_;
          auVar29 = vsubps_avx(auVar74,auVar75);
          fVar268 = auVar29._0_4_;
          fVar270 = auVar29._4_4_;
          fVar149 = auVar29._8_4_;
          fVar187 = auVar29._12_4_;
          fVar155 = auVar29._16_4_;
          fVar205 = auVar29._20_4_;
          fVar220 = auVar29._24_4_;
          fVar243 = (float)local_7a0._0_4_ * fVar223 * fVar243;
          fVar251 = (float)local_7a0._4_4_ * fVar224 * fVar251;
          auVar76._4_4_ = fVar251;
          auVar76._0_4_ = fVar243;
          fVar308 = fStack_798 * fVar225 * fVar308;
          auVar76._8_4_ = fVar308;
          fVar309 = fStack_794 * fVar227 * fVar309;
          auVar76._12_4_ = fVar309;
          fVar310 = fStack_790 * fVar188 * fVar310;
          auVar76._16_4_ = fVar310;
          fVar311 = fStack_78c * fVar200 * fVar311;
          auVar76._20_4_ = fVar311;
          fVar265 = fStack_788 * fVar201 * fVar265;
          auVar76._24_4_ = fVar265;
          auVar76._28_4_ = auVar142._28_4_;
          local_4e0._4_4_ = fVar251 + auVar296._4_4_;
          local_4e0._0_4_ = fVar243 + auVar296._0_4_;
          fStack_4d8 = fVar308 + auVar296._8_4_;
          fStack_4d4 = fVar309 + auVar296._12_4_;
          auStack_4d0._0_4_ = fVar310 + auVar296._16_4_;
          auStack_4d0._4_4_ = fVar311 + auVar296._20_4_;
          fStack_4c8 = fVar265 + auVar296._24_4_;
          fStack_4c4 = auVar142._28_4_ + auVar296._28_4_;
          local_620 = (float)local_7a0._0_4_ * fVar223 * -fVar202;
          fStack_61c = (float)local_7a0._4_4_ * fVar224 * -fVar245;
          auVar77._4_4_ = fStack_61c;
          auVar77._0_4_ = local_620;
          fStack_618 = fStack_798 * fVar225 * -fVar244;
          auVar77._8_4_ = fStack_618;
          fStack_614 = fStack_794 * fVar227 * -fVar271;
          auVar77._12_4_ = fStack_614;
          fStack_610 = fStack_790 * fVar188 * -fVar180;
          auVar77._16_4_ = fStack_610;
          fStack_60c = fStack_78c * fVar200 * -fVar229;
          auVar77._20_4_ = fStack_60c;
          fStack_608 = fStack_788 * fVar201 * -fVar230;
          auVar77._24_4_ = fStack_608;
          auVar77._28_4_ = -fVar241;
          local_620 = local_6a0._0_4_ + local_620;
          fStack_61c = local_6a0._4_4_ + fStack_61c;
          fStack_618 = local_6a0._8_4_ + fStack_618;
          fStack_614 = local_6a0._12_4_ + fStack_614;
          fStack_610 = local_6a0._16_4_ + fStack_610;
          fStack_60c = local_6a0._20_4_ + fStack_60c;
          fStack_608 = local_6a0._24_4_ + fStack_608;
          fStack_604 = local_6a0._28_4_ + -fVar241;
          fVar243 = fVar223 * 0.0 * (float)local_7a0._0_4_;
          fVar251 = fVar224 * 0.0 * (float)local_7a0._4_4_;
          auVar78._4_4_ = fVar251;
          auVar78._0_4_ = fVar243;
          fVar308 = fVar225 * 0.0 * fStack_798;
          auVar78._8_4_ = fVar308;
          fVar309 = fVar227 * 0.0 * fStack_794;
          auVar78._12_4_ = fVar309;
          fVar310 = fVar188 * 0.0 * fStack_790;
          auVar78._16_4_ = fVar310;
          fVar311 = fVar200 * 0.0 * fStack_78c;
          auVar78._20_4_ = fVar311;
          fVar265 = fVar201 * 0.0 * fStack_788;
          auVar78._24_4_ = fVar265;
          auVar78._28_4_ = fVar241;
          auVar211 = vsubps_avx(auVar296,auVar76);
          auVar348._0_4_ = fVar243 + auVar144._0_4_;
          auVar348._4_4_ = fVar251 + auVar144._4_4_;
          auVar348._8_4_ = fVar308 + auVar144._8_4_;
          auVar348._12_4_ = fVar309 + auVar144._12_4_;
          auVar348._16_4_ = fVar310 + auVar144._16_4_;
          auVar348._20_4_ = fVar311 + auVar144._20_4_;
          auVar348._24_4_ = fVar265 + auVar144._24_4_;
          auVar348._28_4_ = fVar241 + auVar144._28_4_;
          fVar243 = auVar280._0_4_ * fVar268 * fVar246;
          fVar246 = auVar280._4_4_ * fVar270 * fVar253;
          auVar79._4_4_ = fVar246;
          auVar79._0_4_ = fVar243;
          fVar251 = auVar280._8_4_ * fVar149 * fVar226;
          auVar79._8_4_ = fVar251;
          fVar253 = auVar280._12_4_ * fVar187 * fVar183;
          auVar79._12_4_ = fVar253;
          fVar308 = auVar280._16_4_ * fVar155 * fVar283;
          auVar79._16_4_ = fVar308;
          fVar226 = auVar280._20_4_ * fVar205 * fVar257;
          auVar79._20_4_ = fVar226;
          fVar309 = auVar280._24_4_ * fVar220 * fVar266;
          auVar79._24_4_ = fVar309;
          auVar79._28_4_ = fStack_784;
          auVar315 = vsubps_avx(local_6a0._0_32_,auVar77);
          auVar329._0_4_ = auVar318._0_4_ + fVar243;
          auVar329._4_4_ = auVar318._4_4_ + fVar246;
          auVar329._8_4_ = auVar318._8_4_ + fVar251;
          auVar329._12_4_ = auVar318._12_4_ + fVar253;
          auVar329._16_4_ = auVar318._16_4_ + fVar308;
          auVar329._20_4_ = auVar318._20_4_ + fVar226;
          auVar329._24_4_ = auVar318._24_4_ + fVar309;
          auVar329._28_4_ = auVar318._28_4_ + fStack_784;
          fVar243 = fVar268 * -fVar267 * auVar280._0_4_;
          fVar246 = fVar270 * -fVar269 * auVar280._4_4_;
          auVar80._4_4_ = fVar246;
          auVar80._0_4_ = fVar243;
          fVar251 = fVar149 * -fVar132 * auVar280._8_4_;
          auVar80._8_4_ = fVar251;
          fVar253 = fVar187 * -fVar151 * auVar280._12_4_;
          auVar80._12_4_ = fVar253;
          fVar308 = fVar155 * -fVar302 * auVar280._16_4_;
          auVar80._16_4_ = fVar308;
          fVar226 = fVar205 * -fVar157 * auVar280._20_4_;
          auVar80._20_4_ = fVar226;
          fVar309 = fVar220 * -fVar217 * auVar280._24_4_;
          auVar80._24_4_ = fVar309;
          auVar80._28_4_ = auVar296._28_4_;
          auVar32 = vsubps_avx(auVar144,auVar78);
          auVar239._0_4_ = local_3a0._0_4_ + fVar243;
          auVar239._4_4_ = local_3a0._4_4_ + fVar246;
          auVar239._8_4_ = local_3a0._8_4_ + fVar251;
          auVar239._12_4_ = local_3a0._12_4_ + fVar253;
          auVar239._16_4_ = local_3a0._16_4_ + fVar308;
          auVar239._20_4_ = local_3a0._20_4_ + fVar226;
          auVar239._24_4_ = local_3a0._24_4_ + fVar309;
          auVar239._28_4_ = local_3a0._28_4_ + auVar296._28_4_;
          fVar243 = fVar268 * 0.0 * auVar280._0_4_;
          fVar246 = fVar270 * 0.0 * auVar280._4_4_;
          auVar81._4_4_ = fVar246;
          auVar81._0_4_ = fVar243;
          fVar251 = fVar149 * 0.0 * auVar280._8_4_;
          auVar81._8_4_ = fVar251;
          fVar253 = fVar187 * 0.0 * auVar280._12_4_;
          auVar81._12_4_ = fVar253;
          fVar308 = fVar155 * 0.0 * auVar280._16_4_;
          auVar81._16_4_ = fVar308;
          fVar226 = fVar205 * 0.0 * auVar280._20_4_;
          auVar81._20_4_ = fVar226;
          fVar309 = fVar220 * 0.0 * auVar280._24_4_;
          auVar81._24_4_ = fVar309;
          auVar81._28_4_ = auVar144._28_4_;
          auVar142 = vsubps_avx(auVar318,auVar79);
          auVar298._0_4_ = (float)local_540._0_4_ + fVar243;
          auVar298._4_4_ = (float)local_540._4_4_ + fVar246;
          auVar298._8_4_ = fStack_538 + fVar251;
          auVar298._12_4_ = fStack_534 + fVar253;
          auVar298._16_4_ = fStack_530 + fVar308;
          auVar298._20_4_ = fStack_52c + fVar226;
          auVar298._24_4_ = fStack_528 + fVar309;
          auVar298._28_4_ = fStack_524 + auVar144._28_4_;
          auVar30 = vsubps_avx(local_3a0,auVar80);
          auVar34 = vsubps_avx(_local_540,auVar81);
          auVar295 = vsubps_avx(auVar239,auVar315);
          auVar210 = vsubps_avx(auVar298,auVar32);
          auVar82._4_4_ = auVar32._4_4_ * auVar295._4_4_;
          auVar82._0_4_ = auVar32._0_4_ * auVar295._0_4_;
          auVar82._8_4_ = auVar32._8_4_ * auVar295._8_4_;
          auVar82._12_4_ = auVar32._12_4_ * auVar295._12_4_;
          auVar82._16_4_ = auVar32._16_4_ * auVar295._16_4_;
          auVar82._20_4_ = auVar32._20_4_ * auVar295._20_4_;
          auVar82._24_4_ = auVar32._24_4_ * auVar295._24_4_;
          auVar82._28_4_ = auVar319._28_4_;
          auVar83._4_4_ = auVar315._4_4_ * auVar210._4_4_;
          auVar83._0_4_ = auVar315._0_4_ * auVar210._0_4_;
          auVar83._8_4_ = auVar315._8_4_ * auVar210._8_4_;
          auVar83._12_4_ = auVar315._12_4_ * auVar210._12_4_;
          auVar83._16_4_ = auVar315._16_4_ * auVar210._16_4_;
          auVar83._20_4_ = auVar315._20_4_ * auVar210._20_4_;
          auVar83._24_4_ = auVar315._24_4_ * auVar210._24_4_;
          auVar83._28_4_ = local_3a0._28_4_;
          auVar287 = vsubps_avx(auVar83,auVar82);
          auVar84._4_4_ = auVar211._4_4_ * auVar210._4_4_;
          auVar84._0_4_ = auVar211._0_4_ * auVar210._0_4_;
          auVar84._8_4_ = auVar211._8_4_ * auVar210._8_4_;
          auVar84._12_4_ = auVar211._12_4_ * auVar210._12_4_;
          auVar84._16_4_ = auVar211._16_4_ * auVar210._16_4_;
          auVar84._20_4_ = auVar211._20_4_ * auVar210._20_4_;
          auVar84._24_4_ = auVar211._24_4_ * auVar210._24_4_;
          auVar84._28_4_ = auVar210._28_4_;
          auVar210 = vsubps_avx(auVar329,auVar211);
          auVar85._4_4_ = auVar32._4_4_ * auVar210._4_4_;
          auVar85._0_4_ = auVar32._0_4_ * auVar210._0_4_;
          auVar85._8_4_ = auVar32._8_4_ * auVar210._8_4_;
          auVar85._12_4_ = auVar32._12_4_ * auVar210._12_4_;
          auVar85._16_4_ = auVar32._16_4_ * auVar210._16_4_;
          auVar85._20_4_ = auVar32._20_4_ * auVar210._20_4_;
          auVar85._24_4_ = auVar32._24_4_ * auVar210._24_4_;
          auVar85._28_4_ = auVar29._28_4_;
          auVar292 = vsubps_avx(auVar85,auVar84);
          auVar86._4_4_ = auVar315._4_4_ * auVar210._4_4_;
          auVar86._0_4_ = auVar315._0_4_ * auVar210._0_4_;
          auVar86._8_4_ = auVar315._8_4_ * auVar210._8_4_;
          auVar86._12_4_ = auVar315._12_4_ * auVar210._12_4_;
          auVar86._16_4_ = auVar315._16_4_ * auVar210._16_4_;
          auVar86._20_4_ = auVar315._20_4_ * auVar210._20_4_;
          auVar86._24_4_ = auVar315._24_4_ * auVar210._24_4_;
          auVar86._28_4_ = auVar29._28_4_;
          auVar87._4_4_ = auVar211._4_4_ * auVar295._4_4_;
          auVar87._0_4_ = auVar211._0_4_ * auVar295._0_4_;
          auVar87._8_4_ = auVar211._8_4_ * auVar295._8_4_;
          auVar87._12_4_ = auVar211._12_4_ * auVar295._12_4_;
          auVar87._16_4_ = auVar211._16_4_ * auVar295._16_4_;
          auVar87._20_4_ = auVar211._20_4_ * auVar295._20_4_;
          auVar87._24_4_ = auVar211._24_4_ * auVar295._24_4_;
          auVar87._28_4_ = auVar295._28_4_;
          auVar29 = vsubps_avx(auVar87,auVar86);
          auVar171._0_4_ = auVar287._0_4_ * 0.0 + auVar29._0_4_ + auVar292._0_4_ * 0.0;
          auVar171._4_4_ = auVar287._4_4_ * 0.0 + auVar29._4_4_ + auVar292._4_4_ * 0.0;
          auVar171._8_4_ = auVar287._8_4_ * 0.0 + auVar29._8_4_ + auVar292._8_4_ * 0.0;
          auVar171._12_4_ = auVar287._12_4_ * 0.0 + auVar29._12_4_ + auVar292._12_4_ * 0.0;
          auVar171._16_4_ = auVar287._16_4_ * 0.0 + auVar29._16_4_ + auVar292._16_4_ * 0.0;
          auVar171._20_4_ = auVar287._20_4_ * 0.0 + auVar29._20_4_ + auVar292._20_4_ * 0.0;
          auVar171._24_4_ = auVar287._24_4_ * 0.0 + auVar29._24_4_ + auVar292._24_4_ * 0.0;
          auVar171._28_4_ = auVar287._28_4_ + auVar29._28_4_ + auVar292._28_4_;
          auVar304 = vcmpps_avx(auVar171,ZEXT832(0) << 0x20,2);
          auVar142 = vblendvps_avx(auVar142,_local_4e0,auVar304);
          auVar112._4_4_ = fStack_61c;
          auVar112._0_4_ = local_620;
          auVar112._8_4_ = fStack_618;
          auVar112._12_4_ = fStack_614;
          auVar112._16_4_ = fStack_610;
          auVar112._20_4_ = fStack_60c;
          auVar112._24_4_ = fStack_608;
          auVar112._28_4_ = fStack_604;
          auVar29 = vblendvps_avx(auVar30,auVar112,auVar304);
          auVar30 = vblendvps_avx(auVar34,auVar348,auVar304);
          auVar34 = vblendvps_avx(auVar211,auVar329,auVar304);
          auVar295 = vblendvps_avx(auVar315,auVar239,auVar304);
          auVar210 = vblendvps_avx(auVar32,auVar298,auVar304);
          auVar211 = vblendvps_avx(auVar329,auVar211,auVar304);
          auVar287 = vblendvps_avx(auVar239,auVar315,auVar304);
          auVar292 = vblendvps_avx(auVar298,auVar32,auVar304);
          local_6a0._0_32_ = vandps_avx(auVar31,_local_400);
          auVar31 = vsubps_avx(auVar211,auVar142);
          auVar211 = vsubps_avx(auVar287,auVar29);
          auVar292 = vsubps_avx(auVar292,auVar30);
          auVar33 = vsubps_avx(auVar29,auVar295);
          fVar243 = auVar211._0_4_;
          fVar159 = auVar30._0_4_;
          fVar183 = auVar211._4_4_;
          fVar160 = auVar30._4_4_;
          auVar88._4_4_ = fVar160 * fVar183;
          auVar88._0_4_ = fVar159 * fVar243;
          fVar267 = auVar211._8_4_;
          fVar177 = auVar30._8_4_;
          auVar88._8_4_ = fVar177 * fVar267;
          fVar187 = auVar211._12_4_;
          fVar179 = auVar30._12_4_;
          auVar88._12_4_ = fVar179 * fVar187;
          fVar223 = auVar211._16_4_;
          fVar181 = auVar30._16_4_;
          auVar88._16_4_ = fVar181 * fVar223;
          fVar202 = auVar211._20_4_;
          fVar182 = auVar30._20_4_;
          auVar88._20_4_ = fVar182 * fVar202;
          fVar241 = auVar211._24_4_;
          fVar185 = auVar30._24_4_;
          auVar88._24_4_ = fVar185 * fVar241;
          auVar88._28_4_ = auVar287._28_4_;
          fVar246 = auVar29._0_4_;
          fVar312 = auVar292._0_4_;
          fVar310 = auVar29._4_4_;
          fVar321 = auVar292._4_4_;
          auVar89._4_4_ = fVar321 * fVar310;
          auVar89._0_4_ = fVar312 * fVar246;
          fVar268 = auVar29._8_4_;
          fVar336 = auVar292._8_4_;
          auVar89._8_4_ = fVar336 * fVar268;
          fVar302 = auVar29._12_4_;
          fVar299 = auVar292._12_4_;
          auVar89._12_4_ = fVar299 * fVar302;
          fVar224 = auVar29._16_4_;
          fVar340 = auVar292._16_4_;
          auVar89._16_4_ = fVar340 * fVar224;
          fVar245 = auVar29._20_4_;
          fVar300 = auVar292._20_4_;
          auVar89._20_4_ = fVar300 * fVar245;
          fVar150 = auVar29._24_4_;
          fVar301 = auVar292._24_4_;
          uVar11 = auVar315._28_4_;
          auVar89._24_4_ = fVar301 * fVar150;
          auVar89._28_4_ = uVar11;
          auVar287 = vsubps_avx(auVar89,auVar88);
          fVar251 = auVar142._0_4_;
          fVar283 = auVar142._4_4_;
          auVar90._4_4_ = fVar321 * fVar283;
          auVar90._0_4_ = fVar312 * fVar251;
          fVar269 = auVar142._8_4_;
          auVar90._8_4_ = fVar336 * fVar269;
          fVar155 = auVar142._12_4_;
          auVar90._12_4_ = fVar299 * fVar155;
          fVar225 = auVar142._16_4_;
          auVar90._16_4_ = fVar340 * fVar225;
          fVar244 = auVar142._20_4_;
          auVar90._20_4_ = fVar300 * fVar244;
          fVar152 = auVar142._24_4_;
          auVar90._24_4_ = fVar301 * fVar152;
          auVar90._28_4_ = uVar11;
          fVar253 = auVar31._0_4_;
          fVar311 = auVar31._4_4_;
          auVar91._4_4_ = fVar160 * fVar311;
          auVar91._0_4_ = fVar159 * fVar253;
          fVar270 = auVar31._8_4_;
          auVar91._8_4_ = fVar177 * fVar270;
          fVar157 = auVar31._12_4_;
          auVar91._12_4_ = fVar179 * fVar157;
          fVar227 = auVar31._16_4_;
          auVar91._16_4_ = fVar181 * fVar227;
          fVar271 = auVar31._20_4_;
          auVar91._20_4_ = fVar182 * fVar271;
          fVar153 = auVar31._24_4_;
          auVar91._24_4_ = fVar185 * fVar153;
          auVar91._28_4_ = auVar329._28_4_;
          auVar315 = vsubps_avx(auVar91,auVar90);
          auVar92._4_4_ = fVar310 * fVar311;
          auVar92._0_4_ = fVar246 * fVar253;
          auVar92._8_4_ = fVar268 * fVar270;
          auVar92._12_4_ = fVar302 * fVar157;
          auVar92._16_4_ = fVar224 * fVar227;
          auVar92._20_4_ = fVar245 * fVar271;
          auVar92._24_4_ = fVar150 * fVar153;
          auVar92._28_4_ = uVar11;
          auVar93._4_4_ = fVar283 * fVar183;
          auVar93._0_4_ = fVar251 * fVar243;
          auVar93._8_4_ = fVar269 * fVar267;
          auVar93._12_4_ = fVar155 * fVar187;
          auVar93._16_4_ = fVar225 * fVar223;
          auVar93._20_4_ = fVar244 * fVar202;
          auVar93._24_4_ = fVar152 * fVar241;
          auVar93._28_4_ = auVar32._28_4_;
          auVar32 = vsubps_avx(auVar93,auVar92);
          auVar30 = vsubps_avx(auVar30,auVar210);
          fVar226 = auVar32._28_4_ + auVar315._28_4_;
          local_580._0_4_ = auVar32._0_4_ + auVar315._0_4_ * 0.0 + auVar287._0_4_ * 0.0;
          local_580._4_4_ = auVar32._4_4_ + auVar315._4_4_ * 0.0 + auVar287._4_4_ * 0.0;
          local_580._8_4_ = auVar32._8_4_ + auVar315._8_4_ * 0.0 + auVar287._8_4_ * 0.0;
          local_580._12_4_ = auVar32._12_4_ + auVar315._12_4_ * 0.0 + auVar287._12_4_ * 0.0;
          local_580._16_4_ = auVar32._16_4_ + auVar315._16_4_ * 0.0 + auVar287._16_4_ * 0.0;
          local_580._20_4_ = auVar32._20_4_ + auVar315._20_4_ * 0.0 + auVar287._20_4_ * 0.0;
          local_580._24_4_ = auVar32._24_4_ + auVar315._24_4_ * 0.0 + auVar287._24_4_ * 0.0;
          local_580._28_4_ = fVar226 + auVar287._28_4_;
          fVar308 = auVar33._0_4_;
          fVar257 = auVar33._4_4_;
          auVar94._4_4_ = auVar210._4_4_ * fVar257;
          auVar94._0_4_ = auVar210._0_4_ * fVar308;
          fVar132 = auVar33._8_4_;
          auVar94._8_4_ = auVar210._8_4_ * fVar132;
          fVar205 = auVar33._12_4_;
          auVar94._12_4_ = auVar210._12_4_ * fVar205;
          fVar188 = auVar33._16_4_;
          auVar94._16_4_ = auVar210._16_4_ * fVar188;
          fVar180 = auVar33._20_4_;
          auVar94._20_4_ = auVar210._20_4_ * fVar180;
          fVar154 = auVar33._24_4_;
          auVar94._24_4_ = auVar210._24_4_ * fVar154;
          auVar94._28_4_ = fVar226;
          fVar226 = auVar30._0_4_;
          fVar265 = auVar30._4_4_;
          auVar95._4_4_ = auVar295._4_4_ * fVar265;
          auVar95._0_4_ = auVar295._0_4_ * fVar226;
          fVar149 = auVar30._8_4_;
          auVar95._8_4_ = auVar295._8_4_ * fVar149;
          fVar217 = auVar30._12_4_;
          auVar95._12_4_ = auVar295._12_4_ * fVar217;
          fVar200 = auVar30._16_4_;
          auVar95._16_4_ = auVar295._16_4_ * fVar200;
          fVar229 = auVar30._20_4_;
          auVar95._20_4_ = auVar295._20_4_ * fVar229;
          fVar156 = auVar30._24_4_;
          auVar95._24_4_ = auVar295._24_4_ * fVar156;
          auVar95._28_4_ = auVar32._28_4_;
          auVar315 = vsubps_avx(auVar95,auVar94);
          auVar142 = vsubps_avx(auVar142,auVar34);
          fVar309 = auVar142._0_4_;
          fVar266 = auVar142._4_4_;
          auVar96._4_4_ = auVar210._4_4_ * fVar266;
          auVar96._0_4_ = auVar210._0_4_ * fVar309;
          fVar151 = auVar142._8_4_;
          auVar96._8_4_ = auVar210._8_4_ * fVar151;
          fVar220 = auVar142._12_4_;
          auVar96._12_4_ = auVar210._12_4_ * fVar220;
          fVar201 = auVar142._16_4_;
          auVar96._16_4_ = auVar210._16_4_ * fVar201;
          fVar230 = auVar142._20_4_;
          auVar96._20_4_ = auVar210._20_4_ * fVar230;
          fVar158 = auVar142._24_4_;
          auVar96._24_4_ = auVar210._24_4_ * fVar158;
          auVar96._28_4_ = auVar210._28_4_;
          auVar97._4_4_ = fVar265 * auVar34._4_4_;
          auVar97._0_4_ = fVar226 * auVar34._0_4_;
          auVar97._8_4_ = fVar149 * auVar34._8_4_;
          auVar97._12_4_ = fVar217 * auVar34._12_4_;
          auVar97._16_4_ = fVar200 * auVar34._16_4_;
          auVar97._20_4_ = fVar229 * auVar34._20_4_;
          auVar97._24_4_ = fVar156 * auVar34._24_4_;
          auVar97._28_4_ = auVar287._28_4_;
          auVar142 = vsubps_avx(auVar96,auVar97);
          auVar98._4_4_ = auVar295._4_4_ * fVar266;
          auVar98._0_4_ = auVar295._0_4_ * fVar309;
          auVar98._8_4_ = auVar295._8_4_ * fVar151;
          auVar98._12_4_ = auVar295._12_4_ * fVar220;
          auVar98._16_4_ = auVar295._16_4_ * fVar201;
          auVar98._20_4_ = auVar295._20_4_ * fVar230;
          auVar98._24_4_ = auVar295._24_4_ * fVar158;
          auVar98._28_4_ = auVar295._28_4_;
          auVar99._4_4_ = fVar257 * auVar34._4_4_;
          auVar99._0_4_ = fVar308 * auVar34._0_4_;
          auVar99._8_4_ = fVar132 * auVar34._8_4_;
          auVar99._12_4_ = fVar205 * auVar34._12_4_;
          auVar99._16_4_ = fVar188 * auVar34._16_4_;
          auVar99._20_4_ = fVar180 * auVar34._20_4_;
          auVar99._24_4_ = fVar154 * auVar34._24_4_;
          auVar99._28_4_ = auVar34._28_4_;
          auVar34 = vsubps_avx(auVar99,auVar98);
          auVar145._0_4_ = auVar315._0_4_ * 0.0 + auVar34._0_4_ + auVar142._0_4_ * 0.0;
          auVar145._4_4_ = auVar315._4_4_ * 0.0 + auVar34._4_4_ + auVar142._4_4_ * 0.0;
          auVar145._8_4_ = auVar315._8_4_ * 0.0 + auVar34._8_4_ + auVar142._8_4_ * 0.0;
          auVar145._12_4_ = auVar315._12_4_ * 0.0 + auVar34._12_4_ + auVar142._12_4_ * 0.0;
          auVar145._16_4_ = auVar315._16_4_ * 0.0 + auVar34._16_4_ + auVar142._16_4_ * 0.0;
          auVar145._20_4_ = auVar315._20_4_ * 0.0 + auVar34._20_4_ + auVar142._20_4_ * 0.0;
          auVar145._24_4_ = auVar315._24_4_ * 0.0 + auVar34._24_4_ + auVar142._24_4_ * 0.0;
          auVar145._28_4_ = auVar142._28_4_ + auVar34._28_4_ + auVar142._28_4_;
          auVar148 = ZEXT3264(auVar145);
          auVar142 = vmaxps_avx(local_580,auVar145);
          auVar142 = vcmpps_avx(auVar142,ZEXT1232(ZEXT412(0)) << 0x20,2);
          auVar34 = local_6a0._0_32_ & auVar142;
          if ((((((((auVar34 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar34 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar34 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar34 >> 0x7f,0) == '\0') &&
                (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar34 >> 0xbf,0) == '\0') &&
              (auVar34 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar34[0x1f]) {
LAB_00fa42e7:
            auVar215 = ZEXT3264(CONCAT824(local_4a0[1]._24_8_,
                                          CONCAT816(local_4a0[1]._16_8_,
                                                    CONCAT88(local_4a0[1]._8_8_,local_4a0[1]._0_8_))
                                         ));
          }
          else {
            auVar34 = vandps_avx(auVar142,local_6a0._0_32_);
            auVar100._4_4_ = fVar265 * fVar183;
            auVar100._0_4_ = fVar226 * fVar243;
            auVar100._8_4_ = fVar149 * fVar267;
            auVar100._12_4_ = fVar217 * fVar187;
            auVar100._16_4_ = fVar200 * fVar223;
            auVar100._20_4_ = fVar229 * fVar202;
            auVar100._24_4_ = fVar156 * fVar241;
            auVar100._28_4_ = local_6a0._28_4_;
            auVar101._4_4_ = fVar257 * fVar321;
            auVar101._0_4_ = fVar308 * fVar312;
            auVar101._8_4_ = fVar132 * fVar336;
            auVar101._12_4_ = fVar205 * fVar299;
            auVar101._16_4_ = fVar188 * fVar340;
            auVar101._20_4_ = fVar180 * fVar300;
            auVar101._24_4_ = fVar154 * fVar301;
            auVar101._28_4_ = auVar142._28_4_;
            auVar295 = vsubps_avx(auVar101,auVar100);
            auVar102._4_4_ = fVar266 * fVar321;
            auVar102._0_4_ = fVar309 * fVar312;
            auVar102._8_4_ = fVar151 * fVar336;
            auVar102._12_4_ = fVar220 * fVar299;
            auVar102._16_4_ = fVar201 * fVar340;
            auVar102._20_4_ = fVar230 * fVar300;
            auVar102._24_4_ = fVar158 * fVar301;
            auVar102._28_4_ = auVar292._28_4_;
            auVar103._4_4_ = fVar265 * fVar311;
            auVar103._0_4_ = fVar226 * fVar253;
            auVar103._8_4_ = fVar149 * fVar270;
            auVar103._12_4_ = fVar217 * fVar157;
            auVar103._16_4_ = fVar200 * fVar227;
            auVar103._20_4_ = fVar229 * fVar271;
            auVar103._24_4_ = fVar156 * fVar153;
            auVar103._28_4_ = auVar30._28_4_;
            auVar210 = vsubps_avx(auVar103,auVar102);
            auVar104._4_4_ = fVar257 * fVar311;
            auVar104._0_4_ = fVar308 * fVar253;
            auVar104._8_4_ = fVar132 * fVar270;
            auVar104._12_4_ = fVar205 * fVar157;
            auVar104._16_4_ = fVar188 * fVar227;
            auVar104._20_4_ = fVar180 * fVar271;
            auVar104._24_4_ = fVar154 * fVar153;
            auVar104._28_4_ = auVar31._28_4_;
            auVar105._4_4_ = fVar266 * fVar183;
            auVar105._0_4_ = fVar309 * fVar243;
            auVar105._8_4_ = fVar151 * fVar267;
            auVar105._12_4_ = fVar220 * fVar187;
            auVar105._16_4_ = fVar201 * fVar223;
            auVar105._20_4_ = fVar230 * fVar202;
            auVar105._24_4_ = fVar158 * fVar241;
            auVar105._28_4_ = auVar211._28_4_;
            auVar211 = vsubps_avx(auVar105,auVar104);
            auVar289._0_4_ = auVar295._0_4_ * 0.0 + auVar211._0_4_ + auVar210._0_4_ * 0.0;
            auVar289._4_4_ = auVar295._4_4_ * 0.0 + auVar211._4_4_ + auVar210._4_4_ * 0.0;
            auVar289._8_4_ = auVar295._8_4_ * 0.0 + auVar211._8_4_ + auVar210._8_4_ * 0.0;
            auVar289._12_4_ = auVar295._12_4_ * 0.0 + auVar211._12_4_ + auVar210._12_4_ * 0.0;
            auVar289._16_4_ = auVar295._16_4_ * 0.0 + auVar211._16_4_ + auVar210._16_4_ * 0.0;
            auVar289._20_4_ = auVar295._20_4_ * 0.0 + auVar211._20_4_ + auVar210._20_4_ * 0.0;
            auVar289._24_4_ = auVar295._24_4_ * 0.0 + auVar211._24_4_ + auVar210._24_4_ * 0.0;
            auVar289._28_4_ = auVar33._28_4_ + auVar211._28_4_ + auVar31._28_4_;
            auVar142 = vrcpps_avx(auVar289);
            fVar253 = auVar142._0_4_;
            fVar308 = auVar142._4_4_;
            auVar106._4_4_ = auVar289._4_4_ * fVar308;
            auVar106._0_4_ = auVar289._0_4_ * fVar253;
            fVar226 = auVar142._8_4_;
            auVar106._8_4_ = auVar289._8_4_ * fVar226;
            fVar309 = auVar142._12_4_;
            auVar106._12_4_ = auVar289._12_4_ * fVar309;
            fVar183 = auVar142._16_4_;
            auVar106._16_4_ = auVar289._16_4_ * fVar183;
            fVar311 = auVar142._20_4_;
            auVar106._20_4_ = auVar289._20_4_ * fVar311;
            fVar257 = auVar142._24_4_;
            auVar106._24_4_ = auVar289._24_4_ * fVar257;
            auVar106._28_4_ = auVar30._28_4_;
            auVar320._8_4_ = 0x3f800000;
            auVar320._0_8_ = 0x3f8000003f800000;
            auVar320._12_4_ = 0x3f800000;
            auVar320._16_4_ = 0x3f800000;
            auVar320._20_4_ = 0x3f800000;
            auVar320._24_4_ = 0x3f800000;
            auVar320._28_4_ = 0x3f800000;
            auVar142 = vsubps_avx(auVar320,auVar106);
            fVar253 = auVar142._0_4_ * fVar253 + fVar253;
            fVar308 = auVar142._4_4_ * fVar308 + fVar308;
            fVar226 = auVar142._8_4_ * fVar226 + fVar226;
            fVar309 = auVar142._12_4_ * fVar309 + fVar309;
            fVar183 = auVar142._16_4_ * fVar183 + fVar183;
            fVar311 = auVar142._20_4_ * fVar311 + fVar311;
            fVar257 = auVar142._24_4_ * fVar257 + fVar257;
            auVar107._4_4_ =
                 (fVar283 * auVar295._4_4_ + auVar210._4_4_ * fVar310 + fVar160 * auVar211._4_4_) *
                 fVar308;
            auVar107._0_4_ =
                 (fVar251 * auVar295._0_4_ + auVar210._0_4_ * fVar246 + fVar159 * auVar211._0_4_) *
                 fVar253;
            auVar107._8_4_ =
                 (fVar269 * auVar295._8_4_ + auVar210._8_4_ * fVar268 + fVar177 * auVar211._8_4_) *
                 fVar226;
            auVar107._12_4_ =
                 (fVar155 * auVar295._12_4_ + auVar210._12_4_ * fVar302 + fVar179 * auVar211._12_4_)
                 * fVar309;
            auVar107._16_4_ =
                 (fVar225 * auVar295._16_4_ + auVar210._16_4_ * fVar224 + fVar181 * auVar211._16_4_)
                 * fVar183;
            auVar107._20_4_ =
                 (fVar244 * auVar295._20_4_ + auVar210._20_4_ * fVar245 + fVar182 * auVar211._20_4_)
                 * fVar311;
            auVar107._24_4_ =
                 (fVar152 * auVar295._24_4_ + auVar210._24_4_ * fVar150 + fVar185 * auVar211._24_4_)
                 * fVar257;
            auVar107._28_4_ = auVar29._28_4_ + auVar211._28_4_;
            fVar243 = (ray->super_RayK<1>).tfar;
            auVar214._4_4_ = fVar243;
            auVar214._0_4_ = fVar243;
            auVar214._8_4_ = fVar243;
            auVar214._12_4_ = fVar243;
            auVar214._16_4_ = fVar243;
            auVar214._20_4_ = fVar243;
            auVar214._24_4_ = fVar243;
            auVar214._28_4_ = fVar243;
            auVar31 = vcmpps_avx(local_c0,auVar107,2);
            auVar142 = vcmpps_avx(auVar107,auVar214,2);
            auVar142 = vandps_avx(auVar31,auVar142);
            auVar29 = auVar34 & auVar142;
            if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar29 >> 0x7f,0) == '\0') &&
                  (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar29 >> 0xbf,0) == '\0') &&
                (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar29[0x1f]) goto LAB_00fa42e7;
            auVar142 = vandps_avx(auVar34,auVar142);
            auVar29 = vcmpps_avx(auVar289,ZEXT1232(ZEXT412(0)) << 0x20,4);
            auVar30 = auVar142 & auVar29;
            auVar215 = ZEXT3264(CONCAT824(local_4a0[1]._24_8_,
                                          CONCAT816(local_4a0[1]._16_8_,
                                                    CONCAT88(local_4a0[1]._8_8_,local_4a0[1]._0_8_))
                                         ));
            if ((((((((auVar30 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar30 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar30 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar30 >> 0x7f,0) != '\0') ||
                  (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar30 >> 0xbf,0) != '\0') ||
                (auVar30 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar30[0x1f] < '\0') {
              auVar142 = vandps_avx(auVar29,auVar142);
              auVar215 = ZEXT3264(auVar142);
              auVar108._4_4_ = fVar308 * local_580._4_4_;
              auVar108._0_4_ = fVar253 * local_580._0_4_;
              auVar108._8_4_ = fVar226 * local_580._8_4_;
              auVar108._12_4_ = fVar309 * local_580._12_4_;
              auVar108._16_4_ = fVar183 * local_580._16_4_;
              auVar108._20_4_ = fVar311 * local_580._20_4_;
              auVar108._24_4_ = fVar257 * local_580._24_4_;
              auVar108._28_4_ = auVar31._28_4_;
              auVar109._4_4_ = auVar145._4_4_ * fVar308;
              auVar109._0_4_ = auVar145._0_4_ * fVar253;
              auVar109._8_4_ = auVar145._8_4_ * fVar226;
              auVar109._12_4_ = auVar145._12_4_ * fVar309;
              auVar109._16_4_ = auVar145._16_4_ * fVar183;
              auVar109._20_4_ = auVar145._20_4_ * fVar311;
              auVar109._24_4_ = auVar145._24_4_ * fVar257;
              auVar109._28_4_ = auVar145._28_4_;
              auVar264._8_4_ = 0x3f800000;
              auVar264._0_8_ = 0x3f8000003f800000;
              auVar264._12_4_ = 0x3f800000;
              auVar264._16_4_ = 0x3f800000;
              auVar264._20_4_ = 0x3f800000;
              auVar264._24_4_ = 0x3f800000;
              auVar264._28_4_ = 0x3f800000;
              auVar142 = vsubps_avx(auVar264,auVar108);
              local_320 = vblendvps_avx(auVar142,auVar108,auVar304);
              auVar142 = vsubps_avx(auVar264,auVar109);
              _local_140 = vblendvps_avx(auVar142,auVar109,auVar304);
              auVar148 = ZEXT3264(_local_140);
              local_440 = auVar107;
            }
          }
          auVar142 = auVar215._0_32_;
          auVar175 = ZEXT3264(_local_7a0);
          fVar188 = (float)local_6c0._0_4_;
          fVar200 = (float)local_6c0._4_4_;
          fVar201 = fStack_6b8;
          fVar202 = fStack_6b4;
          fVar243 = fStack_6b0;
          fVar246 = fStack_6ac;
          fVar251 = fStack_6a8;
          fVar253 = fStack_6a4;
          if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar142 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar142 >> 0x7f,0) == '\0') &&
                (auVar215 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar142 >> 0xbf,0) == '\0') &&
              (auVar215 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar215[0x1f]) goto LAB_00fa3ffe;
          auVar31 = vsubps_avx(auVar280,_local_7a0);
          local_7a0._0_4_ = (float)local_7a0._0_4_ + local_320._0_4_ * auVar31._0_4_;
          local_7a0._4_4_ = (float)local_7a0._4_4_ + local_320._4_4_ * auVar31._4_4_;
          fStack_798 = fStack_798 + local_320._8_4_ * auVar31._8_4_;
          fStack_794 = fStack_794 + local_320._12_4_ * auVar31._12_4_;
          fStack_790 = fStack_790 + local_320._16_4_ * auVar31._16_4_;
          fStack_78c = fStack_78c + local_320._20_4_ * auVar31._20_4_;
          fStack_788 = fStack_788 + local_320._24_4_ * auVar31._24_4_;
          fStack_784 = fStack_784 + auVar31._28_4_;
          fVar308 = local_768->depth_scale;
          auVar175 = ZEXT3264(CONCAT428(fVar308,CONCAT424(fVar308,CONCAT420(fVar308,CONCAT416(
                                                  fVar308,CONCAT412(fVar308,CONCAT48(fVar308,
                                                  CONCAT44(fVar308,fVar308))))))));
          auVar110._4_4_ = ((float)local_7a0._4_4_ + (float)local_7a0._4_4_) * fVar308;
          auVar110._0_4_ = ((float)local_7a0._0_4_ + (float)local_7a0._0_4_) * fVar308;
          auVar110._8_4_ = (fStack_798 + fStack_798) * fVar308;
          auVar110._12_4_ = (fStack_794 + fStack_794) * fVar308;
          auVar110._16_4_ = (fStack_790 + fStack_790) * fVar308;
          auVar110._20_4_ = (fStack_78c + fStack_78c) * fVar308;
          auVar110._24_4_ = (fStack_788 + fStack_788) * fVar308;
          auVar110._28_4_ = fStack_784 + fStack_784;
          auVar31 = vcmpps_avx(local_440,auVar110,6);
          auVar148 = ZEXT3264(auVar31);
          auVar29 = auVar142 & auVar31;
          if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar29 >> 0x7f,0) == '\0') &&
                (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar29 >> 0xbf,0) == '\0') &&
              (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar29[0x1f]) goto LAB_00fa3ffe;
          local_260 = (float)local_140._0_4_ + (float)local_140._0_4_ + -1.0;
          fStack_25c = (float)local_140._4_4_ + (float)local_140._4_4_ + -1.0;
          fStack_258 = fStack_138 + fStack_138 + -1.0;
          fStack_254 = fStack_134 + fStack_134 + -1.0;
          fStack_250 = fStack_130 + fStack_130 + -1.0;
          fStack_24c = fStack_12c + fStack_12c + -1.0;
          fStack_248 = fStack_128 + fStack_128 + -1.0;
          fStack_244 = fStack_124 + fStack_124 + -1.0;
          local_280 = local_320;
          local_240 = local_440;
          local_21c = uVar15;
          local_210 = local_780;
          uStack_208 = uStack_778;
          local_200 = local_710;
          uStack_1f8 = uStack_708;
          local_1f0 = local_720;
          uStack_1e8 = uStack_718;
          auVar175 = ZEXT1664(_local_730);
          local_1e0 = _local_730;
          pGVar131 = (context->scene->geometries).items[local_7b0].ptr;
          local_140._4_4_ = fStack_25c;
          local_140._0_4_ = local_260;
          fStack_138 = fStack_258;
          fStack_134 = fStack_254;
          fStack_130 = fStack_250;
          fStack_12c = fStack_24c;
          fStack_128 = fStack_248;
          fStack_124 = fStack_244;
          if ((pGVar131->mask & (ray->super_RayK<1>).mask) != 0) {
            auVar142 = vandps_avx(auVar31,auVar142);
            local_4a0[0] = auVar142;
            auVar194._0_4_ = (float)(int)local_220;
            auVar194._4_8_ = SUB128(ZEXT812(0),4);
            auVar194._12_4_ = 0;
            auVar166 = vshufps_avx(auVar194,auVar194,0);
            local_1a0[0] = (auVar166._0_4_ + local_320._0_4_ + 0.0) * (float)local_e0._0_4_;
            local_1a0[1] = (auVar166._4_4_ + local_320._4_4_ + 1.0) * (float)local_e0._4_4_;
            local_1a0[2] = (auVar166._8_4_ + local_320._8_4_ + 2.0) * fStack_d8;
            local_1a0[3] = (auVar166._12_4_ + local_320._12_4_ + 3.0) * fStack_d4;
            fStack_190 = (auVar166._0_4_ + local_320._16_4_ + 4.0) * fStack_d0;
            fStack_18c = (auVar166._4_4_ + local_320._20_4_ + 5.0) * fStack_cc;
            fStack_188 = (auVar166._8_4_ + local_320._24_4_ + 6.0) * fStack_c8;
            fStack_184 = auVar166._12_4_ + local_320._28_4_ + 7.0;
            local_180 = CONCAT44(fStack_25c,local_260);
            uStack_178 = CONCAT44(fStack_254,fStack_258);
            uStack_170 = CONCAT44(fStack_24c,fStack_250);
            uStack_168 = CONCAT44(fStack_244,fStack_248);
            local_160 = local_440;
            auVar172._8_4_ = 0x7f800000;
            auVar172._0_8_ = 0x7f8000007f800000;
            auVar172._12_4_ = 0x7f800000;
            auVar172._16_4_ = 0x7f800000;
            auVar172._20_4_ = 0x7f800000;
            auVar172._24_4_ = 0x7f800000;
            auVar172._28_4_ = 0x7f800000;
            auVar31 = vblendvps_avx(auVar172,local_440,auVar142);
            auVar29 = vshufps_avx(auVar31,auVar31,0xb1);
            auVar29 = vminps_avx(auVar31,auVar29);
            auVar30 = vshufpd_avx(auVar29,auVar29,5);
            auVar29 = vminps_avx(auVar29,auVar30);
            auVar30 = vperm2f128_avx(auVar29,auVar29,1);
            auVar29 = vminps_avx(auVar29,auVar30);
            auVar31 = vcmpps_avx(auVar31,auVar29,0);
            auVar29 = auVar142 & auVar31;
            if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar29 >> 0x7f,0) != '\0') ||
                  (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar29 >> 0xbf,0) != '\0') ||
                (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar29[0x1f] < '\0') {
              auVar142 = vandps_avx(auVar31,auVar142);
            }
            uVar124 = vmovmskps_avx(auVar142);
            uVar126 = 0;
            if (uVar124 != 0) {
              for (; (uVar124 >> uVar126 & 1) == 0; uVar126 = uVar126 + 1) {
              }
            }
            uVar125 = (ulong)uVar126;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar131->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              _local_7a0 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
              auVar290 = ZEXT3264(local_440);
              local_6a0._0_8_ = pGVar131;
              do {
                local_664 = local_1a0[uVar125];
                local_660 = *(undefined4 *)((long)&local_180 + uVar125 * 4);
                (ray->super_RayK<1>).tfar = *(float *)(local_160 + uVar125 * 4);
                fVar176 = 1.0 - local_664;
                fVar272 = local_664 * 3.0;
                auVar166 = ZEXT416((uint)((fVar176 * -2.0 * local_664 + local_664 * local_664) * 0.5
                                         ));
                auVar166 = vshufps_avx(auVar166,auVar166,0);
                auVar195 = ZEXT416((uint)(((fVar176 + fVar176) * (fVar272 + 2.0) +
                                          fVar176 * fVar176 * -3.0) * 0.5));
                auVar195 = vshufps_avx(auVar195,auVar195,0);
                auVar196 = ZEXT416((uint)(((local_664 + local_664) * (fVar272 + -5.0) +
                                          local_664 * fVar272) * 0.5));
                auVar196 = vshufps_avx(auVar196,auVar196,0);
                auVar208 = ZEXT416((uint)((local_664 * (fVar176 + fVar176) - fVar176 * fVar176) *
                                         0.5));
                auVar208 = vshufps_avx(auVar208,auVar208,0);
                auVar209._0_4_ = auVar208._0_4_ * (float)local_780._0_4_;
                auVar209._4_4_ = auVar208._4_4_ * (float)local_780._4_4_;
                auVar209._8_4_ = auVar208._8_4_ * (float)uStack_778;
                auVar209._12_4_ = auVar208._12_4_ * uStack_778._4_4_;
                auVar215 = ZEXT1664(auVar209);
                auVar197._0_4_ =
                     auVar209._0_4_ +
                     auVar196._0_4_ * (float)local_710._0_4_ +
                     auVar166._0_4_ * (float)local_730._0_4_ +
                     auVar195._0_4_ * (float)local_720._0_4_;
                auVar197._4_4_ =
                     auVar209._4_4_ +
                     auVar196._4_4_ * (float)local_710._4_4_ +
                     auVar166._4_4_ * (float)local_730._4_4_ +
                     auVar195._4_4_ * (float)local_720._4_4_;
                auVar197._8_4_ =
                     auVar209._8_4_ +
                     auVar196._8_4_ * (float)uStack_708 +
                     auVar166._8_4_ * (float)uStack_728 + auVar195._8_4_ * (float)uStack_718;
                auVar197._12_4_ =
                     auVar209._12_4_ +
                     auVar196._12_4_ * uStack_708._4_4_ +
                     auVar166._12_4_ * uStack_728._4_4_ + auVar195._12_4_ * uStack_718._4_4_;
                local_760.context = context->user;
                local_670 = vmovlps_avx(auVar197);
                local_668 = vextractps_avx(auVar197,2);
                local_65c = (int)local_7a8;
                local_658 = (int)local_7b0;
                local_654 = (local_760.context)->instID[0];
                local_650 = (local_760.context)->instPrimID[0];
                local_7bc = -1;
                local_760.valid = &local_7bc;
                local_760.geometryUserPtr = pGVar131->userPtr;
                local_760.ray = (RTCRayN *)ray;
                local_760.hit = (RTCHitN *)&local_670;
                local_760.N = 1;
                if (pGVar131->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00fa44f7:
                  p_Var18 = context->args->filter;
                  if ((p_Var18 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((pGVar131->field_8).field_0x2 & 0x40) != 0)))) {
                    auVar215 = ZEXT1664(auVar215._0_16_);
                    (*p_Var18)(&local_760);
                    auVar290 = ZEXT3264(local_440);
                    ray = local_7b8;
                    pGVar131 = (Geometry *)local_6a0._0_8_;
                    if (*local_760.valid == 0) goto LAB_00fa45a0;
                  }
                  (((Vec3f *)((long)local_760.ray + 0x30))->field_0).components[0] =
                       *(float *)local_760.hit;
                  (((Vec3f *)((long)local_760.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_760.hit + 4);
                  (((Vec3f *)((long)local_760.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_760.hit + 8);
                  *(float *)((long)local_760.ray + 0x3c) = *(float *)(local_760.hit + 0xc);
                  *(float *)((long)local_760.ray + 0x40) = *(float *)(local_760.hit + 0x10);
                  *(float *)((long)local_760.ray + 0x44) = *(float *)(local_760.hit + 0x14);
                  *(float *)((long)local_760.ray + 0x48) = *(float *)(local_760.hit + 0x18);
                  *(float *)((long)local_760.ray + 0x4c) = *(float *)(local_760.hit + 0x1c);
                  *(float *)((long)local_760.ray + 0x50) = *(float *)(local_760.hit + 0x20);
                }
                else {
                  auVar215 = ZEXT1664(auVar209);
                  (*pGVar131->intersectionFilterN)(&local_760);
                  auVar290 = ZEXT3264(local_440);
                  ray = local_7b8;
                  pGVar131 = (Geometry *)local_6a0._0_8_;
                  if (*local_760.valid != 0) goto LAB_00fa44f7;
LAB_00fa45a0:
                  (local_7b8->super_RayK<1>).tfar = (float)local_7a0._0_4_;
                  ray = local_7b8;
                  pGVar131 = (Geometry *)local_6a0._0_8_;
                }
                *(undefined4 *)(local_4a0[0] + uVar125 * 4) = 0;
                auVar29 = local_4a0[0];
                fVar272 = (ray->super_RayK<1>).tfar;
                auVar146._4_4_ = fVar272;
                auVar146._0_4_ = fVar272;
                auVar146._8_4_ = fVar272;
                auVar146._12_4_ = fVar272;
                auVar146._16_4_ = fVar272;
                auVar146._20_4_ = fVar272;
                auVar146._24_4_ = fVar272;
                auVar146._28_4_ = fVar272;
                auVar31 = vcmpps_avx(auVar290._0_32_,auVar146,2);
                auVar175 = ZEXT3264(auVar31);
                auVar142 = vandps_avx(auVar31,local_4a0[0]);
                auVar148 = ZEXT3264(auVar142);
                local_4a0[0] = auVar142;
                auVar29 = auVar29 & auVar31;
                if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar29 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar29 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar29 >> 0x7f,0) == '\0') &&
                      (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar29 >> 0xbf,0) == '\0') &&
                    (auVar29 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar29[0x1f]) goto LAB_00fa4634;
                auVar173._8_4_ = 0x7f800000;
                auVar173._0_8_ = 0x7f8000007f800000;
                auVar173._12_4_ = 0x7f800000;
                auVar173._16_4_ = 0x7f800000;
                auVar173._20_4_ = 0x7f800000;
                auVar173._24_4_ = 0x7f800000;
                auVar173._28_4_ = 0x7f800000;
                auVar31 = vblendvps_avx(auVar173,auVar290._0_32_,auVar142);
                auVar29 = vshufps_avx(auVar31,auVar31,0xb1);
                auVar29 = vminps_avx(auVar31,auVar29);
                auVar30 = vshufpd_avx(auVar29,auVar29,5);
                auVar29 = vminps_avx(auVar29,auVar30);
                auVar30 = vperm2f128_avx(auVar29,auVar29,1);
                auVar29 = vminps_avx(auVar29,auVar30);
                auVar31 = vcmpps_avx(auVar31,auVar29,0);
                auVar29 = auVar142 & auVar31;
                if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar29 >> 0x7f,0) != '\0') ||
                      (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar29 >> 0xbf,0) != '\0') ||
                    (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar29[0x1f] < '\0') {
                  auVar142 = vandps_avx(auVar31,auVar142);
                }
                _local_7a0 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                uVar124 = vmovmskps_avx(auVar142);
                uVar126 = 0;
                if (uVar124 != 0) {
                  for (; (uVar124 >> uVar126 & 1) == 0; uVar126 = uVar126 + 1) {
                  }
                }
                uVar125 = (ulong)uVar126;
              } while( true );
            }
            fVar176 = local_1a0[uVar125];
            auVar148 = ZEXT464((uint)fVar176);
            fVar204 = 1.0 - fVar176;
            fVar178 = fVar176 * 3.0;
            auVar166 = ZEXT416((uint)((fVar204 * -2.0 * fVar176 + fVar176 * fVar176) * 0.5));
            auVar166 = vshufps_avx(auVar166,auVar166,0);
            auVar195 = ZEXT416((uint)(((fVar204 + fVar204) * (fVar178 + 2.0) +
                                      fVar204 * fVar204 * -3.0) * 0.5));
            auVar195 = vshufps_avx(auVar195,auVar195,0);
            auVar196 = ZEXT416((uint)(((fVar176 + fVar176) * (fVar178 + -5.0) + fVar176 * fVar178) *
                                     0.5));
            auVar196 = vshufps_avx(auVar196,auVar196,0);
            fVar178 = *(float *)((long)&local_180 + uVar125 * 4);
            auVar208 = ZEXT416((uint)((fVar176 * (fVar204 + fVar204) - fVar204 * fVar204) * 0.5));
            auVar208 = vshufps_avx(auVar208,auVar208,0);
            auVar167._0_4_ =
                 auVar208._0_4_ * (float)local_780._0_4_ +
                 auVar196._0_4_ * (float)local_710._0_4_ +
                 auVar166._0_4_ * (float)local_730._0_4_ + auVar195._0_4_ * (float)local_720._0_4_;
            auVar167._4_4_ =
                 auVar208._4_4_ * (float)local_780._4_4_ +
                 auVar196._4_4_ * (float)local_710._4_4_ +
                 auVar166._4_4_ * (float)local_730._4_4_ + auVar195._4_4_ * (float)local_720._4_4_;
            auVar167._8_4_ =
                 auVar208._8_4_ * (float)uStack_778 +
                 auVar196._8_4_ * (float)uStack_708 +
                 auVar166._8_4_ * (float)uStack_728 + auVar195._8_4_ * (float)uStack_718;
            auVar167._12_4_ =
                 auVar208._12_4_ * uStack_778._4_4_ +
                 auVar196._12_4_ * uStack_708._4_4_ +
                 auVar166._12_4_ * uStack_728._4_4_ + auVar195._12_4_ * uStack_718._4_4_;
            auVar175 = ZEXT1664(auVar167);
            auVar215 = ZEXT464((uint)*(float *)(local_160 + uVar125 * 4));
            (ray->super_RayK<1>).tfar = *(float *)(local_160 + uVar125 * 4);
            uVar12 = vmovlps_avx(auVar167);
            *(undefined8 *)&(ray->Ng).field_0 = uVar12;
            fVar204 = (float)vextractps_avx(auVar167,2);
            (ray->Ng).field_0.field_0.z = fVar204;
            ray->u = fVar176;
            ray->v = fVar178;
            ray->primID = (uint)local_7a8;
            ray->geomID = (uint)local_7b0;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
            goto LAB_00fa42bd;
          }
          goto LAB_00fa42d9;
        }
        goto LAB_00fa3ffe;
      }
LAB_00fa3650:
      fVar272 = (ray->super_RayK<1>).tfar;
      auVar136._4_4_ = fVar272;
      auVar136._0_4_ = fVar272;
      auVar136._8_4_ = fVar272;
      auVar136._12_4_ = fVar272;
      auVar166 = vcmpps_avx(local_290,auVar136,2);
      uVar126 = vmovmskps_avx(auVar166);
      uVar122 = uVar122 & uVar122 + 0xf & uVar126;
    } while (uVar122 != 0);
  }
  return;
LAB_00fa4634:
  fVar272 = (float)local_5a0._0_4_;
  fVar322 = (float)local_5a0._4_4_;
  fVar219 = fStack_598;
  fVar240 = fStack_594;
  fVar255 = fStack_590;
  fVar323 = fStack_58c;
  fVar203 = fStack_588;
  fVar218 = fStack_584;
  fVar326 = (float)local_700._0_4_;
  fVar330 = (float)local_700._4_4_;
  fVar332 = fStack_6f8;
  fVar334 = fStack_6f4;
  fVar216 = fStack_6f0;
  fVar222 = fStack_6ec;
  fVar228 = fStack_6e8;
  fVar242 = fStack_6e4;
LAB_00fa42bd:
  prim = local_770;
  fVar188 = (float)local_6c0._0_4_;
  fVar200 = (float)local_6c0._4_4_;
  fVar201 = fStack_6b8;
  fVar202 = fStack_6b4;
  fVar243 = fStack_6b0;
  fVar246 = fStack_6ac;
  fVar251 = fStack_6a8;
  fVar253 = fStack_6a4;
LAB_00fa42d9:
  fVar247 = (float)local_6e0._0_4_;
  fVar252 = (float)local_6e0._4_4_;
  fVar254 = fStack_6d8;
  fVar256 = fStack_6d4;
  fVar176 = fStack_6d0;
  fVar178 = fStack_6cc;
  fVar204 = fStack_6c8;
  fVar281 = (float)local_5e0._0_4_;
  fVar324 = (float)local_5e0._4_4_;
  fVar184 = fStack_5d8;
  fVar221 = fStack_5d4;
  fVar282 = fStack_5d0;
  fVar186 = fStack_5cc;
  fVar325 = fStack_5c8;
LAB_00fa3ffe:
  lVar127 = lVar127 + 8;
  if ((int)uVar15 <= (int)lVar127) goto LAB_00fa3650;
  goto LAB_00fa3715;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }